

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::avx512::InstanceArrayIntersectorKMB<8>::intersect
               (vbool<8>_conflict *valid_i,Precalculations *pre,RayHitK<8> *ray,
               RayQueryContext *context,Primitive_conflict4 *prim)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  ulong uVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [12];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  ulong uVar155;
  byte bVar156;
  ulong uVar157;
  uint uVar158;
  ulong uVar159;
  long lVar160;
  long lVar161;
  byte bVar162;
  long lVar163;
  ulong uVar164;
  float fVar165;
  undefined1 auVar166 [16];
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar174 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar206 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar249;
  undefined1 auVar246 [32];
  float fVar259;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined4 uVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  float fVar283;
  undefined1 auVar284 [16];
  float fVar292;
  float fVar293;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar287 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar288 [32];
  float fVar294;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [64];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [64];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar321 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar330 [16];
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 in_ZMM8 [64];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar344 [16];
  undefined1 auVar348 [32];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 in_ZMM10 [64];
  float fVar351;
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar359;
  undefined1 auVar356 [32];
  float fVar357;
  float fVar358;
  float fVar360;
  float fVar361;
  float fVar362;
  undefined1 in_ZMM11 [64];
  undefined1 auVar363 [16];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 in_ZMM13 [64];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar376 [64];
  undefined1 auVar377 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar378 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar379 [16];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar392 [16];
  undefined1 in_ZMM31 [64];
  undefined1 auVar393 [64];
  vint<8> itime_k;
  RayQueryContext newcontext;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  uint uStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  uint uStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  uint uStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  uint uStack_84;
  _func_int *local_68;
  RTCRayQueryContext *local_60;
  RTCIntersectArguments *local_58;
  undefined1 auVar226 [32];
  undefined1 auVar175 [32];
  undefined1 auVar205 [32];
  undefined1 auVar207 [32];
  undefined1 auVar216 [32];
  
  auVar189 = in_ZMM10._0_32_;
  auVar173 = in_ZMM22._0_32_;
  auVar193 = in_ZMM21._0_32_;
  auVar195 = in_ZMM23._0_32_;
  auVar200 = in_ZMM20._0_32_;
  auVar172 = in_ZMM6._0_32_;
  auVar194 = in_ZMM26._0_32_;
  auVar196 = in_ZMM27._0_32_;
  auVar192 = in_ZMM16._0_32_;
  auVar191 = in_ZMM15._0_32_;
  auVar190 = in_ZMM13._0_32_;
  uVar4 = prim->primID_;
  pGVar6 = (context->scene->geometries).items[prim->instID_].ptr;
  local_68 = *(_func_int **)&pGVar6->field_0x58;
  if (local_68 == (_func_int *)0x0) {
    uVar155 = (ulong)*(uint *)(*(long *)&pGVar6[1].time_range.upper +
                              (long)pGVar6[1].intersectionFilterN * (ulong)uVar4);
    if (uVar155 == 0xffffffff) {
      local_68 = (_func_int *)0x0;
    }
    else {
      local_68 = pGVar6[1].super_RefCount._vptr_RefCount[uVar155];
    }
  }
  if (local_68 != (_func_int *)0x0) {
    uVar158 = pGVar6->mask;
    auVar197._4_4_ = uVar158;
    auVar197._0_4_ = uVar158;
    auVar197._8_4_ = uVar158;
    auVar197._12_4_ = uVar158;
    auVar197._16_4_ = uVar158;
    auVar197._20_4_ = uVar158;
    auVar197._24_4_ = uVar158;
    auVar197._28_4_ = uVar158;
    uVar18 = vptestmd_avx512vl(auVar197,*(undefined1 (*) [32])(ray + 0x120));
    bVar156 = (byte)uVar18 & valid_i->v;
    uVar155 = (ulong)bVar156;
    if ((bVar156 != 0) && (pRVar7 = context->user, pRVar7->instID[0] == 0xffffffff)) {
      pRVar7->instID[0] = prim->instID_;
      pRVar7->instPrimID[0] = uVar4;
      uVar157 = (ulong)prim->primID_;
      if ((pGVar6->field_8).field_0x1 == '\x01') {
        fVar259 = (pGVar6->time_range).lower;
        auVar190._4_4_ = fVar259;
        auVar190._0_4_ = fVar259;
        auVar190._8_4_ = fVar259;
        auVar190._12_4_ = fVar259;
        auVar190._16_4_ = fVar259;
        auVar190._20_4_ = fVar259;
        auVar190._24_4_ = fVar259;
        auVar190._28_4_ = fVar259;
        fVar267 = pGVar6->fnumTimeSegments;
        auVar190 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar190);
        fVar259 = (pGVar6->time_range).upper - fVar259;
        auVar192._4_4_ = fVar259;
        auVar192._0_4_ = fVar259;
        auVar192._8_4_ = fVar259;
        auVar192._12_4_ = fVar259;
        auVar192._16_4_ = fVar259;
        auVar192._20_4_ = fVar259;
        auVar192._24_4_ = fVar259;
        auVar192._28_4_ = fVar259;
        auVar190 = vdivps_avx(auVar190,auVar192);
        auVar191._4_4_ = fVar267 * auVar190._4_4_;
        auVar191._0_4_ = fVar267 * auVar190._0_4_;
        auVar191._8_4_ = fVar267 * auVar190._8_4_;
        auVar191._12_4_ = fVar267 * auVar190._12_4_;
        auVar191._16_4_ = fVar267 * auVar190._16_4_;
        auVar191._20_4_ = fVar267 * auVar190._20_4_;
        auVar191._24_4_ = fVar267 * auVar190._24_4_;
        auVar191._28_4_ = auVar190._28_4_;
        auVar190 = vroundps_avx(auVar191,1);
        fVar267 = fVar267 + -1.0;
        auVar194._4_4_ = fVar267;
        auVar194._0_4_ = fVar267;
        auVar194._8_4_ = fVar267;
        auVar194._12_4_ = fVar267;
        auVar194._16_4_ = fVar267;
        auVar194._20_4_ = fVar267;
        auVar194._24_4_ = fVar267;
        auVar194._28_4_ = fVar267;
        auVar190 = vminps_avx(auVar190,auVar194);
        auVar291 = ZEXT1264(ZEXT412(0)) << 0x20;
        auVar190 = vmaxps_avx(auVar190,ZEXT1232(ZEXT412(0)) << 0x20);
        auVar191 = vsubps_avx(auVar191,auVar190);
        local_180 = vcvtps2dq_avx(auVar190);
        uVar4 = 0;
        for (uVar158 = (uint)bVar156; (uVar158 & 1) == 0; uVar158 = uVar158 >> 1 | 0x80000000) {
          uVar4 = uVar4 + 1;
        }
        auVar190 = vpbroadcastd_avx512vl();
        auVar303 = ZEXT3264(auVar190);
        uVar18 = vpcmpeqd_avx512vl(local_180,auVar190);
        fVar259 = auVar191._0_4_;
        fVar267 = auVar191._4_4_;
        fVar268 = auVar191._8_4_;
        fVar269 = auVar191._12_4_;
        fVar270 = auVar191._16_4_;
        fVar271 = auVar191._20_4_;
        fVar272 = auVar191._24_4_;
        if ((byte)(~bVar156 | (byte)uVar18) == 0xff) {
          lVar8 = *(long *)&pGVar6[1].fnumTimeSegments;
          lVar160 = (long)*(int *)(local_180 + (ulong)uVar4 * 4) * 0x38;
          plVar1 = (long *)(lVar8 + lVar160);
          iVar5 = *(int *)(lVar8 + 0x20 + lVar160);
          if (iVar5 == 0x9134) {
            lVar161 = *plVar1;
            lVar163 = plVar1[2] * uVar157;
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 0x10 + lVar163)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x20 + lVar163)),0x28);
            auVar190 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 4 + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 0x14 + lVar163)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x24 + lVar163)),0x28);
            local_180 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 8 + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x28 + lVar163)),0x28);
            auVar172 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 0x1c + lVar163)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x2c + lVar163)),0x28);
            auVar189 = ZEXT1632(auVar166);
          }
          else if (iVar5 == 0x9234) {
            lVar161 = *plVar1;
            lVar163 = plVar1[2] * uVar157;
            auVar284._8_8_ = 0;
            auVar284._0_8_ = *(ulong *)(lVar161 + 4 + lVar163);
            auVar315._8_8_ = 0;
            auVar315._0_8_ = *(ulong *)(lVar161 + 0x10 + lVar163);
            auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + lVar163)),_DAT_02060e80,
                                          auVar284);
            auVar190 = ZEXT1632(auVar166);
            auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),_DAT_02060e80,
                                          auVar315);
            local_180 = ZEXT1632(auVar166);
            auVar285._8_8_ = 0;
            auVar285._0_8_ = *(ulong *)(lVar161 + 0x1c + lVar163);
            auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)),_DAT_02060e80
                                          ,auVar285);
            auVar172 = ZEXT1632(auVar166);
            auVar286._8_8_ = 0;
            auVar286._0_8_ = *(ulong *)(lVar161 + 0x28 + lVar163);
            auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0x24 + lVar163)),_DAT_02060e80
                                          ,auVar286);
            auVar189 = ZEXT1632(auVar166);
          }
          else if (iVar5 == 0xb001) {
            lVar161 = *plVar1;
            lVar163 = plVar1[2] * uVar157;
            auVar276._8_8_ = 0;
            auVar276._0_8_ = *(ulong *)(lVar161 + 0x10 + lVar163);
            auVar166 = vinsertps_avx(auVar276,ZEXT416(*(uint *)(lVar161 + 8 + lVar163)),0x20);
            auVar277._8_8_ = 0;
            auVar277._0_8_ = *(ulong *)(lVar161 + 0x34 + lVar163);
            auVar167 = vpermt2ps_avx512vl(auVar277,_DAT_02060e90,
                                          ZEXT416(*(uint *)(lVar161 + lVar163)));
            auVar320._8_8_ = 0;
            auVar320._0_8_ = *(ulong *)(lVar161 + 0x1c + lVar163);
            fVar283 = *(float *)(lVar161 + 0x24 + lVar163);
            fVar292 = *(float *)(lVar161 + 0x28 + lVar163);
            fVar293 = *(float *)(lVar161 + 0x2c + lVar163);
            auVar168 = vpermt2ps_avx512vl(auVar320,_DAT_02060e90,
                                          ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)));
            fVar294 = *(float *)(lVar161 + 0x30 + lVar163);
            auVar171 = vfmadd231ss_fma(ZEXT416((uint)(fVar292 * fVar292)),ZEXT416((uint)fVar283),
                                       ZEXT416((uint)fVar283));
            auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar293),ZEXT416((uint)fVar293));
            auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar294),ZEXT416((uint)fVar294));
            auVar169 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar171._0_4_));
            fVar295 = auVar169._0_4_;
            fVar295 = fVar295 * 1.5 + fVar295 * fVar295 * fVar295 * auVar171._0_4_ * -0.5;
            auVar171 = vinsertps_avx(auVar168,ZEXT416((uint)(fVar283 * fVar295)),0x30);
            auVar189 = ZEXT1632(auVar171);
            auVar171 = vinsertps_avx(auVar167,ZEXT416((uint)(fVar292 * fVar295)),0x30);
            auVar190 = ZEXT1632(auVar171);
            auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)(fVar294 * fVar295)),0x30);
            auVar172 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 4 + lVar163)),0x10);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x3c + lVar163)),0x20);
            auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)(fVar293 * fVar295)),0x30);
            local_180 = ZEXT1632(auVar166);
          }
          else if (iVar5 == 0x9244) {
            lVar161 = *plVar1;
            lVar163 = plVar1[2] * uVar157;
            auVar190 = ZEXT1632(*(undefined1 (*) [16])(lVar161 + lVar163));
            local_180 = ZEXT1632(*(undefined1 (*) [16])(lVar161 + 0x10 + lVar163));
            auVar172 = ZEXT1632(*(undefined1 (*) [16])(lVar161 + 0x20 + lVar163));
            auVar189 = ZEXT1632(*(undefined1 (*) [16])(lVar161 + 0x30 + lVar163));
          }
          local_260._4_4_ = auVar190._0_4_;
          auVar367._8_4_ = 1;
          auVar367._0_8_ = 0x100000001;
          auVar367._12_4_ = 1;
          auVar367._16_4_ = 1;
          auVar367._20_4_ = 1;
          auVar367._24_4_ = 1;
          auVar367._28_4_ = 1;
          auVar192 = vpermps_avx2(auVar367,auVar190);
          auVar374._8_4_ = 2;
          auVar374._0_8_ = 0x200000002;
          auVar374._12_4_ = 2;
          auVar374._16_4_ = 2;
          auVar374._20_4_ = 2;
          auVar374._24_4_ = 2;
          auVar374._28_4_ = 2;
          auVar194 = vpermps_avx2(auVar374,auVar190);
          auVar201 = vbroadcastss_avx512vl(ZEXT416(3));
          auVar202 = vpermps_avx512vl(auVar201,auVar190);
          local_2a0._4_4_ = local_180._0_4_;
          auVar190 = vpermps_avx2(auVar367,local_180);
          auVar196 = vpermps_avx2(auVar374,local_180);
          auVar203 = vpermps_avx512vl(auVar201,local_180);
          local_240._4_4_ = auVar172._0_4_;
          auVar197 = vpermps_avx2(auVar367,auVar172);
          auVar198 = vpermps_avx2(auVar374,auVar172);
          auVar214 = vpermps_avx512vl(auVar201,auVar172);
          local_280._4_4_ = auVar189._0_4_;
          auVar172 = vpermps_avx2(auVar367,auVar189);
          auVar199 = vpermps_avx2(auVar374,auVar189);
          auVar189 = vpermps_avx512vl(auVar201,auVar189);
          iVar5 = *(int *)(lVar8 + 0x58 + lVar160);
          local_260._0_4_ = local_260._4_4_;
          local_260._8_4_ = local_260._4_4_;
          local_260._12_4_ = local_260._4_4_;
          local_260._16_4_ = local_260._4_4_;
          local_260._20_4_ = local_260._4_4_;
          local_260._24_4_ = local_260._4_4_;
          local_260._28_4_ = local_260._4_4_;
          local_280._0_4_ = local_280._4_4_;
          local_280._8_4_ = local_280._4_4_;
          local_280._12_4_ = local_280._4_4_;
          local_280._16_4_ = local_280._4_4_;
          local_280._20_4_ = local_280._4_4_;
          local_280._24_4_ = local_280._4_4_;
          local_280._28_4_ = local_280._4_4_;
          local_2a0._0_4_ = local_2a0._4_4_;
          local_2a0._8_4_ = local_2a0._4_4_;
          local_2a0._12_4_ = local_2a0._4_4_;
          local_2a0._16_4_ = local_2a0._4_4_;
          local_2a0._20_4_ = local_2a0._4_4_;
          local_2a0._24_4_ = local_2a0._4_4_;
          local_2a0._28_4_ = local_2a0._4_4_;
          local_240._0_4_ = local_240._4_4_;
          local_240._8_4_ = local_240._4_4_;
          local_240._12_4_ = local_240._4_4_;
          local_240._16_4_ = local_240._4_4_;
          local_240._20_4_ = local_240._4_4_;
          local_240._24_4_ = local_240._4_4_;
          local_240._28_4_ = local_240._4_4_;
          if (iVar5 == 0x9134) {
            lVar8 = plVar1[7];
            lVar160 = uVar157 * plVar1[9];
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + lVar160)),
                                     ZEXT416(*(uint *)(lVar8 + 0x10 + lVar160)),0x1c);
            auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar8 + 0x20 + lVar160)),0x28);
            auVar200 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 4 + lVar160)),
                                     ZEXT416(*(uint *)(lVar8 + 0x14 + lVar160)),0x1c);
            auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar8 + 0x24 + lVar160)),0x28);
            auVar195 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 8 + lVar160)),
                                     ZEXT416(*(uint *)(lVar8 + 0x18 + lVar160)),0x1c);
            auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar8 + 0x28 + lVar160)),0x28);
            auVar193 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 0xc + lVar160)),
                                     ZEXT416(*(uint *)(lVar8 + 0x1c + lVar160)),0x1c);
            auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar8 + 0x2c + lVar160)),0x28);
            auVar173 = ZEXT1632(auVar166);
          }
          else {
            auVar216._16_16_ = auVar189._16_16_;
            if (iVar5 == 0x9234) {
              lVar8 = plVar1[7];
              lVar160 = uVar157 * plVar1[9];
              auVar344._8_8_ = 0;
              auVar344._0_8_ = *(ulong *)(lVar8 + 4 + lVar160);
              auVar363._8_8_ = 0;
              auVar363._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar160);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar8 + lVar160)),_DAT_02060e80,
                                            auVar344);
              auVar200 = ZEXT1632(auVar166);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar8 + 0xc + lVar160)),_DAT_02060e80,
                                            auVar363);
              auVar195 = ZEXT1632(auVar166);
              auVar345._8_8_ = 0;
              auVar345._0_8_ = *(ulong *)(lVar8 + 0x1c + lVar160);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar8 + 0x18 + lVar160)),_DAT_02060e80
                                            ,auVar345);
              auVar193 = ZEXT1632(auVar166);
              auVar346._8_8_ = 0;
              auVar346._0_8_ = *(ulong *)(lVar8 + 0x28 + lVar160);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar8 + 0x24 + lVar160)),_DAT_02060e80
                                            ,auVar346);
              auVar173 = ZEXT1632(auVar166);
            }
            else if (iVar5 == 0xb001) {
              lVar8 = plVar1[7];
              lVar160 = uVar157 * plVar1[9];
              auVar347._8_8_ = 0;
              auVar347._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar160);
              auVar166 = vinsertps_avx(auVar347,ZEXT416(*(uint *)(lVar8 + 8 + lVar160)),0x20);
              auVar352._8_8_ = 0;
              auVar352._0_8_ = *(ulong *)(lVar8 + 0x34 + lVar160);
              auVar167 = vpermt2ps_avx512vl(auVar352,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar8 + lVar160)));
              uVar4 = *(uint *)(lVar8 + 0x24 + lVar160);
              uVar158 = *(uint *)(lVar8 + 0x28 + lVar160);
              uVar2 = *(uint *)(lVar8 + 0x2c + lVar160);
              auVar379._8_8_ = 0;
              auVar379._0_8_ = *(ulong *)(lVar8 + 0x1c + lVar160);
              auVar168 = vpermt2ps_avx512vl(auVar379,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar8 + 0x18 + lVar160)));
              fVar283 = *(float *)(lVar8 + 0x30 + lVar160);
              auVar171 = vmulss_avx512f(ZEXT416(uVar158),ZEXT416(uVar158));
              auVar171 = vfmadd231ss_avx512f(auVar171,ZEXT416(uVar4),ZEXT416(uVar4));
              auVar171 = vfmadd231ss_avx512f(auVar171,ZEXT416(uVar2),ZEXT416(uVar2));
              auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar283),ZEXT416((uint)fVar283));
              auVar216._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              auVar215._4_28_ = auVar216._4_28_;
              auVar215._0_4_ = auVar171._0_4_;
              auVar169 = vrsqrt14ss_avx512f(auVar216._0_16_,auVar215._0_16_);
              auVar170 = vmulss_avx512f(auVar169,ZEXT416(0x3fc00000));
              auVar171 = vmulss_avx512f(auVar169,ZEXT416((uint)(auVar171._0_4_ * -0.5)));
              auVar169 = vmulss_avx512f(auVar169,auVar169);
              auVar171 = vmulss_avx512f(auVar169,auVar171);
              auVar169 = vaddss_avx512f(auVar170,auVar171);
              auVar171 = vmulss_avx512f(ZEXT416(uVar4),auVar169);
              auVar171 = vinsertps_avx512f(auVar168,auVar171,0x30);
              auVar173 = ZEXT1632(auVar171);
              auVar171 = vmulss_avx512f(ZEXT416(uVar158),auVar169);
              auVar171 = vinsertps_avx512f(auVar167,auVar171,0x30);
              auVar200 = ZEXT1632(auVar171);
              auVar171 = vmulss_avx512f(ZEXT416(uVar2),auVar169);
              auVar166 = vinsertps_avx512f(auVar166,ZEXT416((uint)(fVar283 * auVar169._0_4_)),0x30);
              auVar193 = ZEXT1632(auVar166);
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar8 + 0xc + lVar160)),
                                           ZEXT416(*(uint *)(lVar8 + 4 + lVar160)),0x10);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar8 + 0x3c + lVar160)),0x20);
              auVar166 = vinsertps_avx512f(auVar166,auVar171,0x30);
              auVar195 = ZEXT1632(auVar166);
            }
            else if (iVar5 == 0x9244) {
              lVar8 = plVar1[7];
              lVar160 = uVar157 * plVar1[9];
              auVar200 = ZEXT1632(*(undefined1 (*) [16])(lVar8 + lVar160));
              auVar195 = ZEXT1632(*(undefined1 (*) [16])(lVar8 + 0x10 + lVar160));
              auVar193 = ZEXT1632(*(undefined1 (*) [16])(lVar8 + 0x20 + lVar160));
              auVar173 = ZEXT1632(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar160));
            }
          }
          auVar217 = vpermps_avx512vl(auVar201,auVar200);
          auVar218 = vpermps_avx512vl(auVar201,auVar195);
          auVar219 = vpermps_avx512vl(auVar201,auVar193);
          auVar220 = vpermps_avx512vl(auVar201,auVar173);
          auVar221 = vmulps_avx512vl(auVar189,auVar220);
          auVar222 = vmulps_avx512vl(auVar202,auVar217);
          auVar223 = vmulps_avx512vl(auVar203,auVar218);
          auVar224 = vmulps_avx512vl(auVar214,auVar219);
          fVar283 = auVar224._0_4_;
          auVar355._0_4_ = fVar283 + auVar223._0_4_ + auVar222._0_4_ + auVar221._0_4_;
          fVar292 = auVar224._4_4_;
          auVar355._4_4_ = fVar292 + auVar223._4_4_ + auVar222._4_4_ + auVar221._4_4_;
          fVar293 = auVar224._8_4_;
          auVar355._8_4_ = fVar293 + auVar223._8_4_ + auVar222._8_4_ + auVar221._8_4_;
          fVar294 = auVar224._12_4_;
          auVar355._12_4_ = fVar294 + auVar223._12_4_ + auVar222._12_4_ + auVar221._12_4_;
          fVar295 = auVar224._16_4_;
          auVar355._16_4_ = fVar295 + auVar223._16_4_ + auVar222._16_4_ + auVar221._16_4_;
          fVar296 = auVar224._20_4_;
          auVar355._20_4_ = fVar296 + auVar223._20_4_ + auVar222._20_4_ + auVar221._20_4_;
          fVar297 = auVar224._24_4_;
          auVar355._24_4_ = fVar297 + auVar223._24_4_ + auVar222._24_4_ + auVar221._24_4_;
          auVar355._28_4_ = auVar224._28_4_ + auVar223._28_4_ + auVar222._28_4_ + auVar221._28_4_;
          auVar20._8_4_ = 0x7fffffff;
          auVar20._0_8_ = 0x7fffffff7fffffff;
          auVar20._12_4_ = 0x7fffffff;
          auVar20._16_4_ = 0x7fffffff;
          auVar20._20_4_ = 0x7fffffff;
          auVar20._24_4_ = 0x7fffffff;
          auVar20._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar355,auVar20);
          auVar223 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar21._8_4_ = 0xbb8d3753;
          auVar21._0_8_ = 0xbb8d3753bb8d3753;
          auVar21._12_4_ = 0xbb8d3753;
          auVar21._16_4_ = 0xbb8d3753;
          auVar21._20_4_ = 0xbb8d3753;
          auVar21._24_4_ = 0xbb8d3753;
          auVar21._28_4_ = 0xbb8d3753;
          auVar221 = vmulps_avx512vl(auVar224,auVar21);
          auVar22._8_4_ = 0x3c9df1b8;
          auVar22._0_8_ = 0x3c9df1b83c9df1b8;
          auVar22._12_4_ = 0x3c9df1b8;
          auVar22._16_4_ = 0x3c9df1b8;
          auVar22._20_4_ = 0x3c9df1b8;
          auVar22._24_4_ = 0x3c9df1b8;
          auVar22._28_4_ = 0x3c9df1b8;
          auVar221 = vaddps_avx512vl(auVar221,auVar22);
          auVar62._4_4_ = fVar292 * auVar221._4_4_;
          auVar62._0_4_ = fVar283 * auVar221._0_4_;
          auVar62._8_4_ = fVar293 * auVar221._8_4_;
          auVar62._12_4_ = fVar294 * auVar221._12_4_;
          auVar62._16_4_ = fVar295 * auVar221._16_4_;
          auVar62._20_4_ = fVar296 * auVar221._20_4_;
          auVar62._24_4_ = fVar297 * auVar221._24_4_;
          auVar62._28_4_ = auVar221._28_4_;
          auVar23._8_4_ = 0xbd37e81c;
          auVar23._0_8_ = 0xbd37e81cbd37e81c;
          auVar23._12_4_ = 0xbd37e81c;
          auVar23._16_4_ = 0xbd37e81c;
          auVar23._20_4_ = 0xbd37e81c;
          auVar23._24_4_ = 0xbd37e81c;
          auVar23._28_4_ = 0xbd37e81c;
          auVar221 = vaddps_avx512vl(auVar62,auVar23);
          auVar63._4_4_ = fVar292 * auVar221._4_4_;
          auVar63._0_4_ = fVar283 * auVar221._0_4_;
          auVar63._8_4_ = fVar293 * auVar221._8_4_;
          auVar63._12_4_ = fVar294 * auVar221._12_4_;
          auVar63._16_4_ = fVar295 * auVar221._16_4_;
          auVar63._20_4_ = fVar296 * auVar221._20_4_;
          auVar63._24_4_ = fVar297 * auVar221._24_4_;
          auVar63._28_4_ = auVar221._28_4_;
          auVar24._8_4_ = 0x3db3edac;
          auVar24._0_8_ = 0x3db3edac3db3edac;
          auVar24._12_4_ = 0x3db3edac;
          auVar24._16_4_ = 0x3db3edac;
          auVar24._20_4_ = 0x3db3edac;
          auVar24._24_4_ = 0x3db3edac;
          auVar24._28_4_ = 0x3db3edac;
          auVar221 = vaddps_avx512vl(auVar63,auVar24);
          auVar64._4_4_ = fVar292 * auVar221._4_4_;
          auVar64._0_4_ = fVar283 * auVar221._0_4_;
          auVar64._8_4_ = fVar293 * auVar221._8_4_;
          auVar64._12_4_ = fVar294 * auVar221._12_4_;
          auVar64._16_4_ = fVar295 * auVar221._16_4_;
          auVar64._20_4_ = fVar296 * auVar221._20_4_;
          auVar64._24_4_ = fVar297 * auVar221._24_4_;
          auVar64._28_4_ = auVar221._28_4_;
          auVar25._8_4_ = 0xbe5ba881;
          auVar25._0_8_ = 0xbe5ba881be5ba881;
          auVar25._12_4_ = 0xbe5ba881;
          auVar25._16_4_ = 0xbe5ba881;
          auVar25._20_4_ = 0xbe5ba881;
          auVar25._24_4_ = 0xbe5ba881;
          auVar25._28_4_ = 0xbe5ba881;
          auVar221 = vaddps_avx512vl(auVar64,auVar25);
          auVar65._4_4_ = fVar292 * auVar221._4_4_;
          auVar65._0_4_ = fVar283 * auVar221._0_4_;
          auVar65._8_4_ = fVar293 * auVar221._8_4_;
          auVar65._12_4_ = fVar294 * auVar221._12_4_;
          auVar65._16_4_ = fVar295 * auVar221._16_4_;
          auVar65._20_4_ = fVar296 * auVar221._20_4_;
          auVar65._24_4_ = fVar297 * auVar221._24_4_;
          auVar65._28_4_ = auVar221._28_4_;
          auVar26._8_4_ = 0x3fc90fd1;
          auVar26._0_8_ = 0x3fc90fd13fc90fd1;
          auVar26._12_4_ = 0x3fc90fd1;
          auVar26._16_4_ = 0x3fc90fd1;
          auVar26._20_4_ = 0x3fc90fd1;
          auVar26._24_4_ = 0x3fc90fd1;
          auVar26._28_4_ = 0x3fc90fd1;
          auVar222 = vaddps_avx512vl(auVar65,auVar26);
          uVar157 = vcmpps_avx512vl(auVar224,auVar223,6);
          auVar221 = vsubps_avx512vl(auVar223,auVar224);
          auVar221 = vsqrtps_avx(auVar221);
          auVar66._4_4_ = auVar221._4_4_ * auVar222._4_4_;
          auVar66._0_4_ = auVar221._0_4_ * auVar222._0_4_;
          auVar66._8_4_ = auVar221._8_4_ * auVar222._8_4_;
          auVar66._12_4_ = auVar221._12_4_ * auVar222._12_4_;
          auVar66._16_4_ = auVar221._16_4_ * auVar222._16_4_;
          auVar66._20_4_ = auVar221._20_4_ * auVar222._20_4_;
          auVar66._24_4_ = auVar221._24_4_ * auVar222._24_4_;
          auVar66._28_4_ = auVar222._28_4_;
          auVar349._8_4_ = 0x80000000;
          auVar349._0_8_ = 0x8000000080000000;
          auVar349._12_4_ = 0x80000000;
          auVar349._16_4_ = 0x80000000;
          auVar349._20_4_ = 0x80000000;
          auVar349._24_4_ = 0x80000000;
          auVar349._28_4_ = 0x80000000;
          auVar222 = vxorps_avx512vl(auVar355,auVar349);
          auVar170 = ZEXT816(0) << 0x40;
          auVar224 = vmaxps_avx512vl(auVar222,auVar355);
          uVar159 = vcmpps_avx512vl(auVar224,ZEXT1632(auVar170),1);
          auVar288._8_4_ = 0x3fc90fdb;
          auVar288._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar288._12_4_ = 0x3fc90fdb;
          auVar288._16_4_ = 0x3fc90fdb;
          auVar288._20_4_ = 0x3fc90fdb;
          auVar288._24_4_ = 0x3fc90fdb;
          auVar288._28_4_ = 0x3fc90fdb;
          auVar221 = vsubps_avx(auVar288,auVar66);
          auVar221 = vmaxps_avx(ZEXT1632(auVar170),auVar221);
          auVar225 = vxorps_avx512vl(auVar221,auVar349);
          bVar9 = (bool)((byte)uVar159 & 1);
          auVar226._0_4_ = (uint)bVar9 * auVar225._0_4_ | (uint)!bVar9 * auVar221._0_4_;
          bVar9 = (bool)((byte)(uVar159 >> 1) & 1);
          auVar226._4_4_ = (uint)bVar9 * auVar225._4_4_ | (uint)!bVar9 * auVar221._4_4_;
          bVar9 = (bool)((byte)(uVar159 >> 2) & 1);
          auVar226._8_4_ = (uint)bVar9 * auVar225._8_4_ | (uint)!bVar9 * auVar221._8_4_;
          bVar9 = (bool)((byte)(uVar159 >> 3) & 1);
          auVar226._12_4_ = (uint)bVar9 * auVar225._12_4_ | (uint)!bVar9 * auVar221._12_4_;
          bVar9 = (bool)((byte)(uVar159 >> 4) & 1);
          auVar226._16_4_ = (uint)bVar9 * auVar225._16_4_ | (uint)!bVar9 * auVar221._16_4_;
          bVar9 = (bool)((byte)(uVar159 >> 5) & 1);
          auVar226._20_4_ = (uint)bVar9 * auVar225._20_4_ | (uint)!bVar9 * auVar221._20_4_;
          bVar9 = (bool)((byte)(uVar159 >> 6) & 1);
          auVar226._24_4_ = (uint)bVar9 * auVar225._24_4_ | (uint)!bVar9 * auVar221._24_4_;
          bVar9 = SUB81(uVar159 >> 7,0);
          auVar226._28_4_ = (uint)bVar9 * auVar225._28_4_ | (uint)!bVar9 * auVar221._28_4_;
          auVar221 = vsubps_avx(auVar288,auVar226);
          auVar225 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar9 = (bool)((byte)uVar157 & 1);
          bVar10 = (bool)((byte)(uVar157 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar157 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar157 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar157 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar157 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar157 >> 6) & 1);
          bVar16 = SUB81(uVar157 >> 7,0);
          auVar67._4_4_ =
               (float)((uint)bVar10 * auVar225._4_4_ | (uint)!bVar10 * auVar221._4_4_) * fVar267;
          auVar67._0_4_ =
               (float)((uint)bVar9 * auVar225._0_4_ | (uint)!bVar9 * auVar221._0_4_) * fVar259;
          auVar67._8_4_ =
               (float)((uint)bVar11 * auVar225._8_4_ | (uint)!bVar11 * auVar221._8_4_) * fVar268;
          auVar67._12_4_ =
               (float)((uint)bVar12 * auVar225._12_4_ | (uint)!bVar12 * auVar221._12_4_) * fVar269;
          auVar67._16_4_ =
               (float)((uint)bVar13 * auVar225._16_4_ | (uint)!bVar13 * auVar221._16_4_) * fVar270;
          auVar67._20_4_ =
               (float)((uint)bVar14 * auVar225._20_4_ | (uint)!bVar14 * auVar221._20_4_) * fVar271;
          auVar67._24_4_ =
               (float)((uint)bVar15 * auVar225._24_4_ | (uint)!bVar15 * auVar221._24_4_) * fVar272;
          auVar67._28_4_ = (uint)bVar16 * auVar225._28_4_ | (uint)!bVar16 * auVar221._28_4_;
          auVar27._8_4_ = 0x3f22f983;
          auVar27._0_8_ = 0x3f22f9833f22f983;
          auVar27._12_4_ = 0x3f22f983;
          auVar27._16_4_ = 0x3f22f983;
          auVar27._20_4_ = 0x3f22f983;
          auVar27._24_4_ = 0x3f22f983;
          auVar27._28_4_ = 0x3f22f983;
          auVar225 = vmulps_avx512vl(auVar67,auVar27);
          auVar221 = vroundps_avx(auVar225,1);
          uVar157 = vcmpps_avx512vl(auVar355,auVar222,1);
          auVar68._4_4_ = auVar221._4_4_ * 1.5707964;
          auVar68._0_4_ = auVar221._0_4_ * 1.5707964;
          auVar68._8_4_ = auVar221._8_4_ * 1.5707964;
          auVar68._12_4_ = auVar221._12_4_ * 1.5707964;
          auVar68._16_4_ = auVar221._16_4_ * 1.5707964;
          auVar68._20_4_ = auVar221._20_4_ * 1.5707964;
          auVar68._24_4_ = auVar221._24_4_ * 1.5707964;
          auVar68._28_4_ = 0x3fc90fdb;
          auVar222 = vsubps_avx(auVar67,auVar68);
          auVar221 = vcvtps2dq_avx(auVar221);
          vandps_avx512vl(auVar221,auVar201);
          uVar19 = vptestnmd_avx512vl(auVar221,auVar367);
          auVar201 = vpslld_avx2(auVar221,0x1f);
          uVar164 = vpmovd2m_avx512vl(auVar201);
          uVar159 = vpcmpgtd_avx512vl(auVar225,auVar367);
          auVar201 = vpcmpeqd_avx2(auVar201,auVar201);
          auVar201 = vpaddd_avx2(auVar225,auVar201);
          fVar283 = auVar222._0_4_;
          fVar351 = fVar283 * fVar283;
          fVar292 = auVar222._4_4_;
          fVar357 = fVar292 * fVar292;
          auVar69._4_4_ = fVar357;
          auVar69._0_4_ = fVar351;
          fVar293 = auVar222._8_4_;
          fVar358 = fVar293 * fVar293;
          auVar69._8_4_ = fVar358;
          fVar294 = auVar222._12_4_;
          fVar359 = fVar294 * fVar294;
          auVar69._12_4_ = fVar359;
          fVar295 = auVar222._16_4_;
          fVar360 = fVar295 * fVar295;
          auVar69._16_4_ = fVar360;
          fVar296 = auVar222._20_4_;
          fVar361 = fVar296 * fVar296;
          auVar69._20_4_ = fVar361;
          fVar297 = auVar222._24_4_;
          fVar362 = fVar297 * fVar297;
          auVar69._24_4_ = fVar362;
          auVar69._28_4_ = auVar225._28_4_;
          auVar28._8_4_ = 0xb2d70013;
          auVar28._0_8_ = 0xb2d70013b2d70013;
          auVar28._12_4_ = 0xb2d70013;
          auVar28._16_4_ = 0xb2d70013;
          auVar28._20_4_ = 0xb2d70013;
          auVar28._24_4_ = 0xb2d70013;
          auVar28._28_4_ = 0xb2d70013;
          auVar221 = vmulps_avx512vl(auVar69,auVar28);
          auVar29._8_4_ = 0x363938a8;
          auVar29._0_8_ = 0x363938a8363938a8;
          auVar29._12_4_ = 0x363938a8;
          auVar29._16_4_ = 0x363938a8;
          auVar29._20_4_ = 0x363938a8;
          auVar29._24_4_ = 0x363938a8;
          auVar29._28_4_ = 0x363938a8;
          auVar221 = vaddps_avx512vl(auVar221,auVar29);
          auVar30._8_4_ = 0xb48b634d;
          auVar30._0_8_ = 0xb48b634db48b634d;
          auVar30._12_4_ = 0xb48b634d;
          auVar30._16_4_ = 0xb48b634d;
          auVar30._20_4_ = 0xb48b634d;
          auVar30._24_4_ = 0xb48b634d;
          auVar30._28_4_ = 0xb48b634d;
          auVar225 = vmulps_avx512vl(auVar69,auVar30);
          uVar17 = vpcmpud_avx512vl(auVar201,auVar374,1);
          auVar31._8_4_ = 0x37cfab9c;
          auVar31._0_8_ = 0x37cfab9c37cfab9c;
          auVar31._12_4_ = 0x37cfab9c;
          auVar31._16_4_ = 0x37cfab9c;
          auVar31._20_4_ = 0x37cfab9c;
          auVar31._24_4_ = 0x37cfab9c;
          auVar31._28_4_ = 0x37cfab9c;
          auVar201 = vaddps_avx512vl(auVar225,auVar31);
          auVar70._4_4_ = fVar357 * auVar221._4_4_;
          auVar70._0_4_ = fVar351 * auVar221._0_4_;
          auVar70._8_4_ = fVar358 * auVar221._8_4_;
          auVar70._12_4_ = fVar359 * auVar221._12_4_;
          auVar70._16_4_ = fVar360 * auVar221._16_4_;
          auVar70._20_4_ = fVar361 * auVar221._20_4_;
          auVar70._24_4_ = fVar362 * auVar221._24_4_;
          auVar70._28_4_ = auVar221._28_4_;
          auVar32._8_4_ = 0xb9501096;
          auVar32._0_8_ = 0xb9501096b9501096;
          auVar32._12_4_ = 0xb9501096;
          auVar32._16_4_ = 0xb9501096;
          auVar32._20_4_ = 0xb9501096;
          auVar32._24_4_ = 0xb9501096;
          auVar32._28_4_ = 0xb9501096;
          auVar221 = vaddps_avx512vl(auVar70,auVar32);
          auVar71._4_4_ = fVar357 * auVar201._4_4_;
          auVar71._0_4_ = fVar351 * auVar201._0_4_;
          auVar71._8_4_ = fVar358 * auVar201._8_4_;
          auVar71._12_4_ = fVar359 * auVar201._12_4_;
          auVar71._16_4_ = fVar360 * auVar201._16_4_;
          auVar71._20_4_ = fVar361 * auVar201._20_4_;
          auVar71._24_4_ = fVar362 * auVar201._24_4_;
          auVar71._28_4_ = auVar201._28_4_;
          auVar33._8_4_ = 0xbab60981;
          auVar33._0_8_ = 0xbab60981bab60981;
          auVar33._12_4_ = 0xbab60981;
          auVar33._16_4_ = 0xbab60981;
          auVar33._20_4_ = 0xbab60981;
          auVar33._24_4_ = 0xbab60981;
          auVar33._28_4_ = 0xbab60981;
          auVar201 = vaddps_avx512vl(auVar71,auVar33);
          auVar72._4_4_ = fVar357 * auVar221._4_4_;
          auVar72._0_4_ = fVar351 * auVar221._0_4_;
          auVar72._8_4_ = fVar358 * auVar221._8_4_;
          auVar72._12_4_ = fVar359 * auVar221._12_4_;
          auVar72._16_4_ = fVar360 * auVar221._16_4_;
          auVar72._20_4_ = fVar361 * auVar221._20_4_;
          auVar72._24_4_ = fVar362 * auVar221._24_4_;
          auVar72._28_4_ = auVar221._28_4_;
          auVar34._8_4_ = 0x3c088898;
          auVar34._0_8_ = 0x3c0888983c088898;
          auVar34._12_4_ = 0x3c088898;
          auVar34._16_4_ = 0x3c088898;
          auVar34._20_4_ = 0x3c088898;
          auVar34._24_4_ = 0x3c088898;
          auVar34._28_4_ = 0x3c088898;
          auVar221 = vaddps_avx512vl(auVar72,auVar34);
          auVar73._4_4_ = fVar357 * auVar201._4_4_;
          auVar73._0_4_ = fVar351 * auVar201._0_4_;
          auVar73._8_4_ = fVar358 * auVar201._8_4_;
          auVar73._12_4_ = fVar359 * auVar201._12_4_;
          auVar73._16_4_ = fVar360 * auVar201._16_4_;
          auVar73._20_4_ = fVar361 * auVar201._20_4_;
          auVar73._24_4_ = fVar362 * auVar201._24_4_;
          auVar73._28_4_ = auVar201._28_4_;
          auVar35._8_4_ = 0x3d2aaaa4;
          auVar35._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar35._12_4_ = 0x3d2aaaa4;
          auVar35._16_4_ = 0x3d2aaaa4;
          auVar35._20_4_ = 0x3d2aaaa4;
          auVar35._24_4_ = 0x3d2aaaa4;
          auVar35._28_4_ = 0x3d2aaaa4;
          auVar201 = vaddps_avx512vl(auVar73,auVar35);
          auVar74._4_4_ = fVar357 * auVar221._4_4_;
          auVar74._0_4_ = fVar351 * auVar221._0_4_;
          auVar74._8_4_ = fVar358 * auVar221._8_4_;
          auVar74._12_4_ = fVar359 * auVar221._12_4_;
          auVar74._16_4_ = fVar360 * auVar221._16_4_;
          auVar74._20_4_ = fVar361 * auVar221._20_4_;
          auVar74._24_4_ = fVar362 * auVar221._24_4_;
          auVar74._28_4_ = auVar221._28_4_;
          auVar36._8_4_ = 0xbe2aaaab;
          auVar36._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar36._12_4_ = 0xbe2aaaab;
          auVar36._16_4_ = 0xbe2aaaab;
          auVar36._20_4_ = 0xbe2aaaab;
          auVar36._24_4_ = 0xbe2aaaab;
          auVar36._28_4_ = 0xbe2aaaab;
          auVar221 = vaddps_avx512vl(auVar74,auVar36);
          auVar364._8_4_ = 0xbf000000;
          auVar364._0_8_ = 0xbf000000bf000000;
          auVar364._12_4_ = 0xbf000000;
          auVar364._16_4_ = 0xbf000000;
          auVar364._20_4_ = 0xbf000000;
          auVar364._24_4_ = 0xbf000000;
          auVar364._28_4_ = 0xbf000000;
          auVar221 = vmulps_avx512vl(auVar69,auVar221);
          auVar75._4_4_ = fVar357 * (fVar357 * auVar201._4_4_ + -0.5);
          auVar75._0_4_ = fVar351 * (fVar351 * auVar201._0_4_ + -0.5);
          auVar75._8_4_ = fVar358 * (fVar358 * auVar201._8_4_ + -0.5);
          auVar75._12_4_ = fVar359 * (fVar359 * auVar201._12_4_ + -0.5);
          auVar75._16_4_ = fVar360 * (fVar360 * auVar201._16_4_ + -0.5);
          auVar75._20_4_ = fVar361 * (fVar361 * auVar201._20_4_ + -0.5);
          auVar75._24_4_ = fVar362 * (fVar362 * auVar201._24_4_ + -0.5);
          auVar75._28_4_ = auVar201._28_4_ + -0.5;
          auVar201 = vaddps_avx512vl(auVar221,auVar223);
          fVar283 = auVar201._0_4_ * fVar283;
          fVar292 = auVar201._4_4_ * fVar292;
          auVar76._4_4_ = fVar292;
          auVar76._0_4_ = fVar283;
          fVar293 = auVar201._8_4_ * fVar293;
          auVar76._8_4_ = fVar293;
          fVar294 = auVar201._12_4_ * fVar294;
          auVar76._12_4_ = fVar294;
          fVar295 = auVar201._16_4_ * fVar295;
          auVar76._16_4_ = fVar295;
          fVar296 = auVar201._20_4_ * fVar296;
          auVar76._20_4_ = fVar296;
          fVar297 = auVar201._24_4_ * fVar297;
          auVar76._24_4_ = fVar297;
          auVar76._28_4_ = auVar222._28_4_;
          auVar221 = vaddps_avx512vl(auVar75,auVar223);
          auVar225 = vblendmps_avx512vl(auVar76,auVar221);
          bVar9 = (bool)((byte)uVar164 & 1);
          auVar227._0_4_ = (uint)bVar9 * auVar225._0_4_ | (uint)!bVar9 * (int)auVar201._0_4_;
          bVar9 = (bool)((byte)(uVar164 >> 1) & 1);
          auVar227._4_4_ = (uint)bVar9 * auVar225._4_4_ | (uint)!bVar9 * (int)auVar201._4_4_;
          bVar9 = (bool)((byte)(uVar164 >> 2) & 1);
          auVar227._8_4_ = (uint)bVar9 * auVar225._8_4_ | (uint)!bVar9 * (int)auVar201._8_4_;
          bVar9 = (bool)((byte)(uVar164 >> 3) & 1);
          auVar227._12_4_ = (uint)bVar9 * auVar225._12_4_ | (uint)!bVar9 * (int)auVar201._12_4_;
          bVar9 = (bool)((byte)(uVar164 >> 4) & 1);
          auVar227._16_4_ = (uint)bVar9 * auVar225._16_4_ | (uint)!bVar9 * (int)auVar201._16_4_;
          bVar9 = (bool)((byte)(uVar164 >> 5) & 1);
          auVar227._20_4_ = (uint)bVar9 * auVar225._20_4_ | (uint)!bVar9 * (int)auVar201._20_4_;
          bVar9 = (bool)((byte)(uVar164 >> 6) & 1);
          auVar227._24_4_ = (uint)bVar9 * auVar225._24_4_ | (uint)!bVar9 * (int)auVar201._24_4_;
          bVar9 = (bool)((byte)(uVar164 >> 7) & 1);
          auVar227._28_4_ = (uint)bVar9 * auVar225._28_4_ | (uint)!bVar9 * auVar201._28_4_;
          bVar9 = (bool)((byte)uVar19 & 1);
          auVar228._0_4_ = (uint)bVar9 * auVar221._0_4_ | (uint)!bVar9 * (int)fVar283;
          bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
          auVar228._4_4_ = (uint)bVar9 * auVar221._4_4_ | (uint)!bVar9 * (int)fVar292;
          bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
          auVar228._8_4_ = (uint)bVar9 * auVar221._8_4_ | (uint)!bVar9 * (int)fVar293;
          bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
          auVar228._12_4_ = (uint)bVar9 * auVar221._12_4_ | (uint)!bVar9 * (int)fVar294;
          bVar9 = (bool)((byte)(uVar19 >> 4) & 1);
          auVar228._16_4_ = (uint)bVar9 * auVar221._16_4_ | (uint)!bVar9 * (int)fVar295;
          bVar9 = (bool)((byte)(uVar19 >> 5) & 1);
          auVar228._20_4_ = (uint)bVar9 * auVar221._20_4_ | (uint)!bVar9 * (int)fVar296;
          bVar9 = (bool)((byte)(uVar19 >> 6) & 1);
          auVar228._24_4_ = (uint)bVar9 * auVar221._24_4_ | (uint)!bVar9 * (int)fVar297;
          bVar9 = SUB81(uVar19 >> 7,0);
          auVar228._28_4_ = (uint)bVar9 * auVar221._28_4_ | (uint)!bVar9 * auVar222._28_4_;
          auVar201 = vxorps_avx512vl(auVar220,auVar349);
          bVar156 = (byte)uVar157;
          auVar229._0_4_ =
               (uint)(bVar156 & 1) * auVar201._0_4_ | (uint)!(bool)(bVar156 & 1) * auVar220._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar229._4_4_ = (uint)bVar9 * auVar201._4_4_ | (uint)!bVar9 * auVar220._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar229._8_4_ = (uint)bVar9 * auVar201._8_4_ | (uint)!bVar9 * auVar220._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar229._12_4_ = (uint)bVar9 * auVar201._12_4_ | (uint)!bVar9 * auVar220._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar229._16_4_ = (uint)bVar9 * auVar201._16_4_ | (uint)!bVar9 * auVar220._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar229._20_4_ = (uint)bVar9 * auVar201._20_4_ | (uint)!bVar9 * auVar220._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar229._24_4_ = (uint)bVar9 * auVar201._24_4_ | (uint)!bVar9 * auVar220._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar229._28_4_ = (uint)bVar9 * auVar201._28_4_ | (uint)!bVar9 * auVar220._28_4_;
          auVar201 = vxorps_avx512vl(auVar217,auVar349);
          auVar230._0_4_ =
               (uint)(bVar156 & 1) * auVar201._0_4_ | (uint)!(bool)(bVar156 & 1) * auVar217._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar230._4_4_ = (uint)bVar9 * auVar201._4_4_ | (uint)!bVar9 * auVar217._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar230._8_4_ = (uint)bVar9 * auVar201._8_4_ | (uint)!bVar9 * auVar217._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar230._12_4_ = (uint)bVar9 * auVar201._12_4_ | (uint)!bVar9 * auVar217._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar230._16_4_ = (uint)bVar9 * auVar201._16_4_ | (uint)!bVar9 * auVar217._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar230._20_4_ = (uint)bVar9 * auVar201._20_4_ | (uint)!bVar9 * auVar217._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar230._24_4_ = (uint)bVar9 * auVar201._24_4_ | (uint)!bVar9 * auVar217._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar230._28_4_ = (uint)bVar9 * auVar201._28_4_ | (uint)!bVar9 * auVar217._28_4_;
          auVar201 = vxorps_avx512vl(auVar218,auVar349);
          auVar231._0_4_ =
               (uint)(bVar156 & 1) * auVar201._0_4_ | (uint)!(bool)(bVar156 & 1) * auVar218._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar231._4_4_ = (uint)bVar9 * auVar201._4_4_ | (uint)!bVar9 * auVar218._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar231._8_4_ = (uint)bVar9 * auVar201._8_4_ | (uint)!bVar9 * auVar218._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar231._12_4_ = (uint)bVar9 * auVar201._12_4_ | (uint)!bVar9 * auVar218._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar231._16_4_ = (uint)bVar9 * auVar201._16_4_ | (uint)!bVar9 * auVar218._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar231._20_4_ = (uint)bVar9 * auVar201._20_4_ | (uint)!bVar9 * auVar218._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar231._24_4_ = (uint)bVar9 * auVar201._24_4_ | (uint)!bVar9 * auVar218._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar231._28_4_ = (uint)bVar9 * auVar201._28_4_ | (uint)!bVar9 * auVar218._28_4_;
          auVar201 = vxorps_avx512vl(auVar219,auVar349);
          auVar232._0_4_ =
               (uint)(bVar156 & 1) * auVar201._0_4_ | (uint)!(bool)(bVar156 & 1) * auVar219._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar232._4_4_ = (uint)bVar9 * auVar201._4_4_ | (uint)!bVar9 * auVar219._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar232._8_4_ = (uint)bVar9 * auVar201._8_4_ | (uint)!bVar9 * auVar219._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar232._12_4_ = (uint)bVar9 * auVar201._12_4_ | (uint)!bVar9 * auVar219._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar232._16_4_ = (uint)bVar9 * auVar201._16_4_ | (uint)!bVar9 * auVar219._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar232._20_4_ = (uint)bVar9 * auVar201._20_4_ | (uint)!bVar9 * auVar219._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar232._24_4_ = (uint)bVar9 * auVar201._24_4_ | (uint)!bVar9 * auVar219._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar232._28_4_ = (uint)bVar9 * auVar201._28_4_ | (uint)!bVar9 * auVar219._28_4_;
          auVar201 = vxorps_avx512vl(auVar227,auVar349);
          bVar9 = (bool)((byte)uVar159 & 1);
          auVar233._0_4_ = (float)((uint)bVar9 * auVar201._0_4_ | !bVar9 * auVar227._0_4_);
          bVar9 = (bool)((byte)(uVar159 >> 1) & 1);
          auVar233._4_4_ = (float)((uint)bVar9 * auVar201._4_4_ | !bVar9 * auVar227._4_4_);
          bVar9 = (bool)((byte)(uVar159 >> 2) & 1);
          auVar233._8_4_ = (float)((uint)bVar9 * auVar201._8_4_ | !bVar9 * auVar227._8_4_);
          bVar9 = (bool)((byte)(uVar159 >> 3) & 1);
          auVar233._12_4_ = (float)((uint)bVar9 * auVar201._12_4_ | !bVar9 * auVar227._12_4_);
          bVar9 = (bool)((byte)(uVar159 >> 4) & 1);
          auVar233._16_4_ = (float)((uint)bVar9 * auVar201._16_4_ | !bVar9 * auVar227._16_4_);
          bVar9 = (bool)((byte)(uVar159 >> 5) & 1);
          auVar233._20_4_ = (float)((uint)bVar9 * auVar201._20_4_ | !bVar9 * auVar227._20_4_);
          bVar9 = (bool)((byte)(uVar159 >> 6) & 1);
          auVar233._24_4_ = (float)((uint)bVar9 * auVar201._24_4_ | !bVar9 * auVar227._24_4_);
          bVar9 = SUB81(uVar159 >> 7,0);
          auVar233._28_4_ = (uint)bVar9 * auVar201._28_4_ | !bVar9 * auVar227._28_4_;
          auVar201 = vxorps_avx512vl(auVar228,auVar349);
          bVar9 = (bool)((byte)uVar17 & 1);
          auVar234._0_4_ = (uint)bVar9 * auVar201._0_4_ | !bVar9 * auVar228._0_4_;
          bVar9 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar234._4_4_ = (uint)bVar9 * auVar201._4_4_ | !bVar9 * auVar228._4_4_;
          bVar9 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar234._8_4_ = (uint)bVar9 * auVar201._8_4_ | !bVar9 * auVar228._8_4_;
          bVar9 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar234._12_4_ = (uint)bVar9 * auVar201._12_4_ | !bVar9 * auVar228._12_4_;
          bVar9 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar234._16_4_ = (uint)bVar9 * auVar201._16_4_ | !bVar9 * auVar228._16_4_;
          bVar9 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar234._20_4_ = (uint)bVar9 * auVar201._20_4_ | !bVar9 * auVar228._20_4_;
          bVar9 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar234._24_4_ = (uint)bVar9 * auVar201._24_4_ | !bVar9 * auVar228._24_4_;
          bVar9 = SUB81(uVar17 >> 7,0);
          auVar234._28_4_ = (uint)bVar9 * auVar201._28_4_ | !bVar9 * auVar228._28_4_;
          auVar201 = vfmsub213ps_avx512vl(auVar189,auVar224,auVar229);
          auVar221 = vfmsub213ps_avx512vl(auVar202,auVar224,auVar230);
          auVar222 = vmulps_avx512vl(auVar201,auVar201);
          auVar217 = vmulps_avx512vl(auVar221,auVar221);
          auVar222 = vaddps_avx512vl(auVar222,auVar217);
          auVar217 = vfmsub213ps_avx512vl(auVar203,auVar224,auVar231);
          auVar218 = vmulps_avx512vl(auVar217,auVar217);
          auVar222 = vaddps_avx512vl(auVar218,auVar222);
          auVar218 = vfmsub213ps_avx512vl(auVar214,auVar224,auVar232);
          auVar219 = vmulps_avx512vl(auVar218,auVar218);
          auVar308._0_4_ = auVar219._0_4_ + auVar222._0_4_;
          auVar308._4_4_ = auVar219._4_4_ + auVar222._4_4_;
          auVar308._8_4_ = auVar219._8_4_ + auVar222._8_4_;
          auVar308._12_4_ = auVar219._12_4_ + auVar222._12_4_;
          auVar308._16_4_ = auVar219._16_4_ + auVar222._16_4_;
          auVar308._20_4_ = auVar219._20_4_ + auVar222._20_4_;
          auVar308._24_4_ = auVar219._24_4_ + auVar222._24_4_;
          auVar308._28_4_ = auVar219._28_4_ + auVar222._28_4_;
          auVar222 = vrsqrt14ps_avx512vl(auVar308);
          fVar283 = auVar222._0_4_;
          fVar292 = auVar222._4_4_;
          fVar293 = auVar222._8_4_;
          fVar294 = auVar222._12_4_;
          fVar295 = auVar222._16_4_;
          fVar296 = auVar222._20_4_;
          fVar297 = auVar222._24_4_;
          auVar77._4_4_ = fVar292 * fVar292 * fVar292 * auVar308._4_4_ * -0.5;
          auVar77._0_4_ = fVar283 * fVar283 * fVar283 * auVar308._0_4_ * -0.5;
          auVar77._8_4_ = fVar293 * fVar293 * fVar293 * auVar308._8_4_ * -0.5;
          auVar77._12_4_ = fVar294 * fVar294 * fVar294 * auVar308._12_4_ * -0.5;
          auVar77._16_4_ = fVar295 * fVar295 * fVar295 * auVar308._16_4_ * -0.5;
          auVar77._20_4_ = fVar296 * fVar296 * fVar296 * auVar308._20_4_ * -0.5;
          auVar77._24_4_ = fVar297 * fVar297 * fVar297 * auVar308._24_4_ * -0.5;
          auVar77._28_4_ = auVar308._28_4_;
          auVar322._8_4_ = 0x3fc00000;
          auVar322._0_8_ = 0x3fc000003fc00000;
          auVar322._12_4_ = 0x3fc00000;
          auVar322._16_4_ = 0x3fc00000;
          auVar322._20_4_ = 0x3fc00000;
          auVar322._24_4_ = 0x3fc00000;
          auVar322._28_4_ = 0x3fc00000;
          auVar166 = vfmadd231ps_fma(auVar77,auVar322,auVar222);
          auVar78._4_4_ = auVar201._4_4_ * auVar166._4_4_;
          auVar78._0_4_ = auVar201._0_4_ * auVar166._0_4_;
          auVar78._8_4_ = auVar201._8_4_ * auVar166._8_4_;
          auVar78._12_4_ = auVar201._12_4_ * auVar166._12_4_;
          auVar78._16_4_ = auVar201._16_4_ * 0.0;
          auVar78._20_4_ = auVar201._20_4_ * 0.0;
          auVar78._24_4_ = auVar201._24_4_ * 0.0;
          auVar78._28_4_ = auVar201._28_4_;
          auVar79._4_4_ = auVar221._4_4_ * auVar166._4_4_;
          auVar79._0_4_ = auVar221._0_4_ * auVar166._0_4_;
          auVar79._8_4_ = auVar221._8_4_ * auVar166._8_4_;
          auVar79._12_4_ = auVar221._12_4_ * auVar166._12_4_;
          auVar79._16_4_ = auVar221._16_4_ * 0.0;
          auVar79._20_4_ = auVar221._20_4_ * 0.0;
          auVar79._24_4_ = auVar221._24_4_ * 0.0;
          auVar79._28_4_ = auVar222._28_4_;
          auVar201 = vmulps_avx512vl(auVar217,ZEXT1632(auVar166));
          auVar221 = vmulps_avx512vl(auVar218,ZEXT1632(auVar166));
          auVar222 = vmulps_avx512vl(auVar78,auVar233);
          auVar217 = vmulps_avx512vl(auVar79,auVar233);
          auVar80._4_4_ = auVar201._4_4_ * auVar233._4_4_;
          auVar80._0_4_ = auVar201._0_4_ * auVar233._0_4_;
          auVar80._8_4_ = auVar201._8_4_ * auVar233._8_4_;
          auVar80._12_4_ = auVar201._12_4_ * auVar233._12_4_;
          auVar80._16_4_ = auVar201._16_4_ * auVar233._16_4_;
          auVar80._20_4_ = auVar201._20_4_ * auVar233._20_4_;
          auVar80._24_4_ = auVar201._24_4_ * auVar233._24_4_;
          auVar80._28_4_ = auVar201._28_4_;
          auVar81._4_4_ = auVar233._4_4_ * auVar221._4_4_;
          auVar81._0_4_ = auVar233._0_4_ * auVar221._0_4_;
          auVar81._8_4_ = auVar233._8_4_ * auVar221._8_4_;
          auVar81._12_4_ = auVar233._12_4_ * auVar221._12_4_;
          auVar81._16_4_ = auVar233._16_4_ * auVar221._16_4_;
          auVar81._20_4_ = auVar233._20_4_ * auVar221._20_4_;
          auVar81._24_4_ = auVar233._24_4_ * auVar221._24_4_;
          auVar81._28_4_ = auVar233._28_4_;
          auVar201 = vfmsub231ps_avx512vl(auVar222,auVar234,auVar189);
          auVar221 = vfmsub231ps_avx512vl(auVar217,auVar234,auVar202);
          auVar222 = vfmsub231ps_avx512vl(auVar80,auVar234,auVar203);
          auVar217 = vfmsub231ps_avx512vl(auVar81,auVar214,auVar234);
          auVar218 = vsubps_avx512vl(auVar229,auVar189);
          auVar189 = vfmadd213ps_avx512vl(auVar218,auVar191,auVar189);
          auVar218 = vsubps_avx512vl(auVar230,auVar202);
          auVar202 = vfmadd213ps_avx512vl(auVar218,auVar191,auVar202);
          auVar218 = vsubps_avx512vl(auVar231,auVar203);
          auVar203 = vfmadd213ps_avx512vl(auVar218,auVar191,auVar203);
          auVar218 = vsubps_avx512vl(auVar232,auVar214);
          auVar214 = vfmadd213ps_avx512vl(auVar218,auVar191,auVar214);
          auVar218 = vmulps_avx512vl(auVar189,auVar189);
          auVar219 = vmulps_avx512vl(auVar202,auVar202);
          auVar218 = vaddps_avx512vl(auVar218,auVar219);
          auVar219 = vmulps_avx512vl(auVar203,auVar203);
          auVar218 = vaddps_avx512vl(auVar219,auVar218);
          auVar219 = vmulps_avx512vl(auVar214,auVar214);
          auVar218 = vaddps_avx512vl(auVar219,auVar218);
          auVar219 = vmulps_avx512vl(auVar218,auVar364);
          auVar218 = vrsqrt14ps_avx512vl(auVar218);
          auVar219 = vmulps_avx512vl(auVar218,auVar219);
          auVar220 = vmulps_avx512vl(auVar218,auVar218);
          auVar219 = vmulps_avx512vl(auVar220,auVar219);
          auVar218 = vfmadd231ps_avx512vl(auVar219,auVar218,auVar322);
          auVar37._8_4_ = 0x3f7fdf3b;
          auVar37._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar37._12_4_ = 0x3f7fdf3b;
          auVar37._16_4_ = 0x3f7fdf3b;
          auVar37._20_4_ = 0x3f7fdf3b;
          auVar37._24_4_ = 0x3f7fdf3b;
          auVar37._28_4_ = 0x3f7fdf3b;
          uVar157 = vcmpps_avx512vl(auVar224,auVar37,6);
          auVar189 = vmulps_avx512vl(auVar189,auVar218);
          bVar156 = (byte)uVar157;
          auVar235._0_4_ =
               (uint)(bVar156 & 1) * auVar189._0_4_ | (uint)!(bool)(bVar156 & 1) * auVar201._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar235._4_4_ = (uint)bVar9 * auVar189._4_4_ | (uint)!bVar9 * auVar201._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar235._8_4_ = (uint)bVar9 * auVar189._8_4_ | (uint)!bVar9 * auVar201._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar235._12_4_ = (uint)bVar9 * auVar189._12_4_ | (uint)!bVar9 * auVar201._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar235._16_4_ = (uint)bVar9 * auVar189._16_4_ | (uint)!bVar9 * auVar201._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar235._20_4_ = (uint)bVar9 * auVar189._20_4_ | (uint)!bVar9 * auVar201._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar235._24_4_ = (uint)bVar9 * auVar189._24_4_ | (uint)!bVar9 * auVar201._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar235._28_4_ = (uint)bVar9 * auVar189._28_4_ | (uint)!bVar9 * auVar201._28_4_;
          auVar189 = vmulps_avx512vl(auVar202,auVar218);
          auVar236._0_4_ =
               (uint)(bVar156 & 1) * auVar189._0_4_ | (uint)!(bool)(bVar156 & 1) * auVar221._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar236._4_4_ = (uint)bVar9 * auVar189._4_4_ | (uint)!bVar9 * auVar221._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar236._8_4_ = (uint)bVar9 * auVar189._8_4_ | (uint)!bVar9 * auVar221._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar236._12_4_ = (uint)bVar9 * auVar189._12_4_ | (uint)!bVar9 * auVar221._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar236._16_4_ = (uint)bVar9 * auVar189._16_4_ | (uint)!bVar9 * auVar221._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar236._20_4_ = (uint)bVar9 * auVar189._20_4_ | (uint)!bVar9 * auVar221._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar236._24_4_ = (uint)bVar9 * auVar189._24_4_ | (uint)!bVar9 * auVar221._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar236._28_4_ = (uint)bVar9 * auVar189._28_4_ | (uint)!bVar9 * auVar221._28_4_;
          auVar189 = vbroadcastss_avx512vl(auVar200._0_16_);
          auVar201 = vmulps_avx512vl(auVar203,auVar218);
          auVar237._0_4_ =
               (float)((uint)(bVar156 & 1) * auVar201._0_4_ |
                      (uint)!(bool)(bVar156 & 1) * auVar222._0_4_);
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar237._4_4_ = (float)((uint)bVar9 * auVar201._4_4_ | (uint)!bVar9 * auVar222._4_4_);
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar237._8_4_ = (float)((uint)bVar9 * auVar201._8_4_ | (uint)!bVar9 * auVar222._8_4_);
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar237._12_4_ = (float)((uint)bVar9 * auVar201._12_4_ | (uint)!bVar9 * auVar222._12_4_);
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar237._16_4_ = (float)((uint)bVar9 * auVar201._16_4_ | (uint)!bVar9 * auVar222._16_4_);
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar237._20_4_ = (float)((uint)bVar9 * auVar201._20_4_ | (uint)!bVar9 * auVar222._20_4_);
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar237._24_4_ = (float)((uint)bVar9 * auVar201._24_4_ | (uint)!bVar9 * auVar222._24_4_);
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar237._28_4_ = (uint)bVar9 * auVar201._28_4_ | (uint)!bVar9 * auVar222._28_4_;
          auVar201 = vpermps_avx512vl(auVar367,auVar200);
          auVar200 = vpermps_avx512vl(auVar374,auVar200);
          auVar202 = vmulps_avx512vl(auVar214,auVar218);
          auVar238._0_4_ =
               (float)((uint)(bVar156 & 1) * auVar202._0_4_ |
                      (uint)!(bool)(bVar156 & 1) * auVar217._0_4_);
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar238._4_4_ = (float)((uint)bVar9 * auVar202._4_4_ | (uint)!bVar9 * auVar217._4_4_);
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar238._8_4_ = (float)((uint)bVar9 * auVar202._8_4_ | (uint)!bVar9 * auVar217._8_4_);
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar238._12_4_ = (float)((uint)bVar9 * auVar202._12_4_ | (uint)!bVar9 * auVar217._12_4_);
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar238._16_4_ = (float)((uint)bVar9 * auVar202._16_4_ | (uint)!bVar9 * auVar217._16_4_);
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar238._20_4_ = (float)((uint)bVar9 * auVar202._20_4_ | (uint)!bVar9 * auVar217._20_4_);
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar238._24_4_ = (float)((uint)bVar9 * auVar202._24_4_ | (uint)!bVar9 * auVar217._24_4_);
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar238._28_4_ = (uint)bVar9 * auVar202._28_4_ | (uint)!bVar9 * auVar217._28_4_;
          auVar202 = vbroadcastss_avx512vl(auVar195._0_16_);
          auVar203 = vpermps_avx512vl(auVar367,auVar195);
          auVar195 = vpermps_avx512vl(auVar374,auVar195);
          auVar214 = vsubps_avx512vl(auVar223,auVar191);
          auVar82._4_4_ = fVar267 * auVar189._4_4_;
          auVar82._0_4_ = fVar259 * auVar189._0_4_;
          auVar82._8_4_ = fVar268 * auVar189._8_4_;
          auVar82._12_4_ = fVar269 * auVar189._12_4_;
          auVar82._16_4_ = fVar270 * auVar189._16_4_;
          auVar82._20_4_ = fVar271 * auVar189._20_4_;
          auVar82._24_4_ = fVar272 * auVar189._24_4_;
          auVar82._28_4_ = auVar189._28_4_;
          auVar221 = vfmadd213ps_avx512vl(local_260,auVar214,auVar82);
          auVar189 = vbroadcastss_avx512vl(auVar193._0_16_);
          auVar83._4_4_ = fVar267 * auVar201._4_4_;
          auVar83._0_4_ = fVar259 * auVar201._0_4_;
          auVar83._8_4_ = fVar268 * auVar201._8_4_;
          auVar83._12_4_ = fVar269 * auVar201._12_4_;
          auVar83._16_4_ = fVar270 * auVar201._16_4_;
          auVar83._20_4_ = fVar271 * auVar201._20_4_;
          auVar83._24_4_ = fVar272 * auVar201._24_4_;
          auVar83._28_4_ = auVar201._28_4_;
          auVar192 = vfmadd213ps_avx512vl(auVar192,auVar214,auVar83);
          auVar201 = vpermps_avx512vl(auVar367,auVar193);
          auVar193 = vpermps_avx512vl(auVar374,auVar193);
          auVar222 = vpermps_avx512vl(auVar367,auVar173);
          auVar217 = vpermps_avx512vl(auVar374,auVar173);
          auVar173 = vbroadcastss_avx512vl(auVar173._0_16_);
          auVar84._4_4_ = fVar267 * auVar200._4_4_;
          auVar84._0_4_ = fVar259 * auVar200._0_4_;
          auVar84._8_4_ = fVar268 * auVar200._8_4_;
          auVar84._12_4_ = fVar269 * auVar200._12_4_;
          auVar84._16_4_ = fVar270 * auVar200._16_4_;
          auVar84._20_4_ = fVar271 * auVar200._20_4_;
          auVar84._24_4_ = fVar272 * auVar200._24_4_;
          auVar84._28_4_ = auVar200._28_4_;
          auVar194 = vfmadd213ps_avx512vl(auVar194,auVar214,auVar84);
          auVar85._4_4_ = fVar267 * auVar202._4_4_;
          auVar85._0_4_ = fVar259 * auVar202._0_4_;
          auVar85._8_4_ = fVar268 * auVar202._8_4_;
          auVar85._12_4_ = fVar269 * auVar202._12_4_;
          auVar85._16_4_ = fVar270 * auVar202._16_4_;
          auVar85._20_4_ = fVar271 * auVar202._20_4_;
          auVar85._24_4_ = fVar272 * auVar202._24_4_;
          auVar85._28_4_ = auVar200._28_4_;
          auVar86._4_4_ = fVar267 * auVar203._4_4_;
          auVar86._0_4_ = fVar259 * auVar203._0_4_;
          auVar86._8_4_ = fVar268 * auVar203._8_4_;
          auVar86._12_4_ = fVar269 * auVar203._12_4_;
          auVar86._16_4_ = fVar270 * auVar203._16_4_;
          auVar86._20_4_ = fVar271 * auVar203._20_4_;
          fVar283 = auVar202._28_4_;
          auVar86._24_4_ = fVar272 * auVar203._24_4_;
          auVar86._28_4_ = fVar283;
          auVar87._4_4_ = auVar195._4_4_ * fVar267;
          auVar87._0_4_ = auVar195._0_4_ * fVar259;
          auVar87._8_4_ = auVar195._8_4_ * fVar268;
          auVar87._12_4_ = auVar195._12_4_ * fVar269;
          auVar87._16_4_ = auVar195._16_4_ * fVar270;
          auVar87._20_4_ = auVar195._20_4_ * fVar271;
          auVar87._24_4_ = auVar195._24_4_ * fVar272;
          auVar87._28_4_ = auVar203._28_4_;
          auVar200 = vfmadd213ps_avx512vl(local_2a0,auVar214,auVar85);
          auVar195 = vfmadd213ps_avx512vl(auVar190,auVar214,auVar86);
          auVar196 = vfmadd213ps_avx512vl(auVar196,auVar214,auVar87);
          auVar88._4_4_ = fVar267 * auVar189._4_4_;
          auVar88._0_4_ = fVar259 * auVar189._0_4_;
          auVar88._8_4_ = fVar268 * auVar189._8_4_;
          auVar88._12_4_ = fVar269 * auVar189._12_4_;
          auVar88._16_4_ = fVar270 * auVar189._16_4_;
          auVar88._20_4_ = fVar271 * auVar189._20_4_;
          auVar88._24_4_ = fVar272 * auVar189._24_4_;
          auVar88._28_4_ = auVar189._28_4_;
          auVar89._4_4_ = fVar267 * auVar201._4_4_;
          auVar89._0_4_ = fVar259 * auVar201._0_4_;
          auVar89._8_4_ = fVar268 * auVar201._8_4_;
          auVar89._12_4_ = fVar269 * auVar201._12_4_;
          auVar89._16_4_ = fVar270 * auVar201._16_4_;
          auVar89._20_4_ = fVar271 * auVar201._20_4_;
          auVar89._24_4_ = fVar272 * auVar201._24_4_;
          auVar89._28_4_ = auVar201._28_4_;
          auVar190 = vmulps_avx512vl(auVar191,auVar193);
          auVar193 = vfmadd213ps_avx512vl(local_240,auVar214,auVar88);
          auVar197 = vfmadd213ps_avx512vl(auVar197,auVar214,auVar89);
          auVar198 = vfmadd213ps_avx512vl(auVar198,auVar214,auVar190);
          auVar189 = vmulps_avx512vl(auVar191,auVar173);
          auVar90._4_4_ = auVar222._4_4_ * fVar267;
          auVar90._0_4_ = auVar222._0_4_ * fVar259;
          auVar90._8_4_ = auVar222._8_4_ * fVar268;
          auVar90._12_4_ = auVar222._12_4_ * fVar269;
          auVar90._16_4_ = auVar222._16_4_ * fVar270;
          auVar90._20_4_ = auVar222._20_4_ * fVar271;
          auVar90._24_4_ = auVar222._24_4_ * fVar272;
          auVar90._28_4_ = auVar201._28_4_;
          auVar150._4_4_ = auVar217._4_4_ * fVar267;
          auVar150._0_4_ = auVar217._0_4_ * fVar259;
          auVar150._8_4_ = auVar217._8_4_ * fVar268;
          auVar150._12_4_ = auVar217._12_4_ * fVar269;
          auVar150._16_4_ = auVar217._16_4_ * fVar270;
          auVar150._20_4_ = auVar217._20_4_ * fVar271;
          auVar150._24_4_ = auVar217._24_4_ * fVar272;
          auVar150._28_4_ = auVar191._28_4_;
          auVar201 = vfmadd213ps_avx512vl(local_280,auVar214,auVar189);
          auVar202 = vfmadd213ps_avx512vl(auVar172,auVar214,auVar90);
          auVar199 = vfmadd213ps_avx512vl(auVar199,auVar214,auVar150);
          auVar191 = vmulps_avx512vl(auVar235,auVar235);
          auVar203 = vmulps_avx512vl(auVar236,auVar236);
          auVar262._0_4_ = auVar191._0_4_ + auVar203._0_4_;
          auVar262._4_4_ = auVar191._4_4_ + auVar203._4_4_;
          auVar262._8_4_ = auVar191._8_4_ + auVar203._8_4_;
          auVar262._12_4_ = auVar191._12_4_ + auVar203._12_4_;
          auVar262._16_4_ = auVar191._16_4_ + auVar203._16_4_;
          auVar262._20_4_ = auVar191._20_4_ + auVar203._20_4_;
          auVar262._24_4_ = auVar191._24_4_ + auVar203._24_4_;
          auVar262._28_4_ = auVar191._28_4_ + auVar203._28_4_;
          auVar91._4_4_ = auVar237._4_4_ * auVar237._4_4_;
          auVar91._0_4_ = auVar237._0_4_ * auVar237._0_4_;
          auVar91._8_4_ = auVar237._8_4_ * auVar237._8_4_;
          auVar91._12_4_ = auVar237._12_4_ * auVar237._12_4_;
          auVar91._16_4_ = auVar237._16_4_ * auVar237._16_4_;
          auVar91._20_4_ = auVar237._20_4_ * auVar237._20_4_;
          auVar91._24_4_ = auVar237._24_4_ * auVar237._24_4_;
          auVar91._28_4_ = auVar190._28_4_;
          auVar172 = vsubps_avx(auVar262,auVar91);
          auVar92._4_4_ = auVar238._4_4_ * auVar238._4_4_;
          auVar92._0_4_ = auVar238._0_4_ * auVar238._0_4_;
          auVar92._8_4_ = auVar238._8_4_ * auVar238._8_4_;
          auVar92._12_4_ = auVar238._12_4_ * auVar238._12_4_;
          auVar92._16_4_ = auVar238._16_4_ * auVar238._16_4_;
          auVar92._20_4_ = auVar238._20_4_ * auVar238._20_4_;
          auVar92._24_4_ = auVar238._24_4_ * auVar238._24_4_;
          auVar92._28_4_ = fVar283;
          auVar172 = vsubps_avx(auVar172,auVar92);
          auVar189 = vmulps_avx512vl(auVar236,auVar237);
          auVar214 = vmulps_avx512vl(auVar235,auVar238);
          fVar259 = auVar214._0_4_ + auVar189._0_4_;
          fVar267 = auVar214._4_4_ + auVar189._4_4_;
          fVar268 = auVar214._8_4_ + auVar189._8_4_;
          fVar269 = auVar214._12_4_ + auVar189._12_4_;
          fVar270 = auVar214._16_4_ + auVar189._16_4_;
          fVar271 = auVar214._20_4_ + auVar189._20_4_;
          fVar272 = auVar214._24_4_ + auVar189._24_4_;
          fVar292 = auVar214._28_4_ + auVar189._28_4_;
          auVar263._0_4_ = fVar259 + fVar259;
          auVar263._4_4_ = fVar267 + fVar267;
          auVar263._8_4_ = fVar268 + fVar268;
          auVar263._12_4_ = fVar269 + fVar269;
          auVar263._16_4_ = fVar270 + fVar270;
          auVar263._20_4_ = fVar271 + fVar271;
          auVar263._24_4_ = fVar272 + fVar272;
          auVar263._28_4_ = fVar292 + fVar292;
          auVar222 = vmulps_avx512vl(auVar236,auVar238);
          auVar217 = vmulps_avx512vl(auVar235,auVar237);
          auVar218 = vsubps_avx512vl(auVar222,auVar217);
          auVar218 = vaddps_avx512vl(auVar218,auVar218);
          auVar189 = vsubps_avx(auVar189,auVar214);
          auVar323._0_4_ = auVar189._0_4_ + auVar189._0_4_;
          auVar323._4_4_ = auVar189._4_4_ + auVar189._4_4_;
          auVar323._8_4_ = auVar189._8_4_ + auVar189._8_4_;
          auVar323._12_4_ = auVar189._12_4_ + auVar189._12_4_;
          auVar323._16_4_ = auVar189._16_4_ + auVar189._16_4_;
          auVar323._20_4_ = auVar189._20_4_ + auVar189._20_4_;
          auVar323._24_4_ = auVar189._24_4_ + auVar189._24_4_;
          auVar323._28_4_ = auVar189._28_4_ + auVar189._28_4_;
          auVar189 = vsubps_avx(auVar191,auVar203);
          auVar299._0_4_ = auVar237._0_4_ * auVar237._0_4_ + auVar189._0_4_;
          auVar299._4_4_ = auVar237._4_4_ * auVar237._4_4_ + auVar189._4_4_;
          auVar299._8_4_ = auVar237._8_4_ * auVar237._8_4_ + auVar189._8_4_;
          auVar299._12_4_ = auVar237._12_4_ * auVar237._12_4_ + auVar189._12_4_;
          auVar299._16_4_ = auVar237._16_4_ * auVar237._16_4_ + auVar189._16_4_;
          auVar299._20_4_ = auVar237._20_4_ * auVar237._20_4_ + auVar189._20_4_;
          auVar299._24_4_ = auVar237._24_4_ * auVar237._24_4_ + auVar189._24_4_;
          auVar299._28_4_ = auVar190._28_4_ + auVar189._28_4_;
          auVar190 = vsubps_avx(auVar299,auVar92);
          auVar93._4_4_ = auVar237._4_4_ * auVar238._4_4_;
          auVar93._0_4_ = auVar237._0_4_ * auVar238._0_4_;
          auVar93._8_4_ = auVar237._8_4_ * auVar238._8_4_;
          auVar93._12_4_ = auVar237._12_4_ * auVar238._12_4_;
          auVar93._16_4_ = auVar237._16_4_ * auVar238._16_4_;
          auVar93._20_4_ = auVar237._20_4_ * auVar238._20_4_;
          auVar93._24_4_ = auVar237._24_4_ * auVar238._24_4_;
          auVar93._28_4_ = auVar299._28_4_;
          auVar191 = vmulps_avx512vl(auVar235,auVar236);
          fVar259 = auVar191._0_4_ + auVar237._0_4_ * auVar238._0_4_;
          fVar267 = auVar191._4_4_ + auVar237._4_4_ * auVar238._4_4_;
          fVar268 = auVar191._8_4_ + auVar237._8_4_ * auVar238._8_4_;
          fVar269 = auVar191._12_4_ + auVar237._12_4_ * auVar238._12_4_;
          fVar270 = auVar191._16_4_ + auVar237._16_4_ * auVar238._16_4_;
          fVar271 = auVar191._20_4_ + auVar237._20_4_ * auVar238._20_4_;
          fVar272 = auVar191._24_4_ + auVar237._24_4_ * auVar238._24_4_;
          fVar292 = auVar191._28_4_ + auVar299._28_4_;
          auVar365._0_4_ = fVar259 + fVar259;
          auVar365._4_4_ = fVar267 + fVar267;
          auVar365._8_4_ = fVar268 + fVar268;
          auVar365._12_4_ = fVar269 + fVar269;
          auVar365._16_4_ = fVar270 + fVar270;
          auVar365._20_4_ = fVar271 + fVar271;
          auVar365._24_4_ = fVar272 + fVar272;
          auVar365._28_4_ = fVar292 + fVar292;
          auVar203 = vaddps_avx512vl(auVar222,auVar217);
          auVar203 = vaddps_avx512vl(auVar203,auVar203);
          auVar191 = vsubps_avx(auVar93,auVar191);
          auVar191 = vaddps_avx512vl(auVar191,auVar191);
          auVar189 = vsubps_avx(auVar189,auVar91);
          auVar289._0_4_ = auVar238._0_4_ * auVar238._0_4_ + auVar189._0_4_;
          auVar289._4_4_ = auVar238._4_4_ * auVar238._4_4_ + auVar189._4_4_;
          auVar289._8_4_ = auVar238._8_4_ * auVar238._8_4_ + auVar189._8_4_;
          auVar289._12_4_ = auVar238._12_4_ * auVar238._12_4_ + auVar189._12_4_;
          auVar289._16_4_ = auVar238._16_4_ * auVar238._16_4_ + auVar189._16_4_;
          auVar289._20_4_ = auVar238._20_4_ * auVar238._20_4_ + auVar189._20_4_;
          auVar289._24_4_ = auVar238._24_4_ * auVar238._24_4_ + auVar189._24_4_;
          auVar289._28_4_ = fVar283 + auVar189._28_4_;
          auVar214 = ZEXT1632(auVar170);
          auVar189 = vmulps_avx512vl(auVar218,auVar214);
          auVar166 = vxorps_avx512vl(auVar173._0_16_,auVar173._0_16_);
          auVar173 = vfmadd213ps_avx512vl(ZEXT1632(auVar166),auVar263,auVar189);
          auVar356._0_4_ = auVar263._0_4_ + auVar189._0_4_;
          auVar356._4_4_ = auVar263._4_4_ + auVar189._4_4_;
          auVar356._8_4_ = auVar263._8_4_ + auVar189._8_4_;
          auVar356._12_4_ = auVar263._12_4_ + auVar189._12_4_;
          auVar356._16_4_ = auVar263._16_4_ + auVar189._16_4_;
          auVar356._20_4_ = auVar263._20_4_ + auVar189._20_4_;
          auVar356._24_4_ = auVar263._24_4_ + auVar189._24_4_;
          fVar259 = auVar189._28_4_;
          auVar356._28_4_ = auVar263._28_4_ + fVar259;
          auVar189 = vfmadd213ps_avx512vl(auVar263,auVar214,auVar218);
          auVar167 = vfmadd231ps_fma(auVar356,auVar172,auVar214);
          auVar168 = vfmadd231ps_fma(auVar189,auVar214,auVar172);
          auVar217 = ZEXT1632(auVar170);
          auVar94._4_4_ = auVar365._4_4_ * 0.0;
          auVar94._0_4_ = auVar365._0_4_ * 0.0;
          auVar94._8_4_ = auVar365._8_4_ * 0.0;
          auVar94._12_4_ = auVar365._12_4_ * 0.0;
          auVar94._16_4_ = auVar365._16_4_ * 0.0;
          auVar94._20_4_ = auVar365._20_4_ * 0.0;
          auVar94._24_4_ = auVar365._24_4_ * 0.0;
          auVar94._28_4_ = fVar259;
          auVar166 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar190,auVar94);
          auVar189 = vaddps_avx512vl(auVar190,auVar94);
          auVar171 = vfmadd213ps_fma(auVar190,auVar217,auVar365);
          auVar190 = vaddps_avx512vl(auVar323,ZEXT1632(auVar166));
          auVar189 = vfmadd231ps_avx512vl(auVar189,auVar323,auVar217);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar217,auVar323);
          auVar95._4_4_ = auVar289._4_4_ * 0.0;
          auVar95._0_4_ = auVar289._0_4_ * 0.0;
          auVar95._8_4_ = auVar289._8_4_ * 0.0;
          auVar95._12_4_ = auVar289._12_4_ * 0.0;
          auVar95._16_4_ = auVar289._16_4_ * 0.0;
          auVar95._20_4_ = auVar289._20_4_ * 0.0;
          auVar95._24_4_ = auVar289._24_4_ * 0.0;
          auVar95._28_4_ = fVar259;
          auVar214 = vfmadd213ps_avx512vl(ZEXT832(0) << 0x20,auVar191,auVar95);
          auVar222 = vaddps_avx512vl(auVar191,auVar95);
          auVar191 = vfmadd213ps_avx512vl(auVar191,auVar217,auVar289);
          auVar214 = vaddps_avx512vl(auVar203,auVar214);
          auVar222 = vfmadd231ps_avx512vl(auVar222,auVar203,auVar217);
          auVar191 = vfmadd231ps_avx512vl(auVar191,auVar217,auVar203);
          auVar192 = vaddps_avx512vl(auVar192,auVar217);
          auVar220 = ZEXT1632(auVar170);
          auVar217 = vaddps_avx512vl(auVar194,auVar220);
          auVar196 = vaddps_avx512vl(auVar196,auVar220);
          auVar194 = vmulps_avx512vl(auVar214,auVar220);
          fVar259 = auVar222._0_4_;
          fVar267 = auVar222._4_4_;
          auVar96._4_4_ = fVar267 * 0.0;
          auVar96._0_4_ = fVar259 * 0.0;
          fVar268 = auVar222._8_4_;
          auVar96._8_4_ = fVar268 * 0.0;
          fVar269 = auVar222._12_4_;
          auVar96._12_4_ = fVar269 * 0.0;
          fVar270 = auVar222._16_4_;
          auVar96._16_4_ = fVar270 * 0.0;
          fVar271 = auVar222._20_4_;
          auVar96._20_4_ = fVar271 * 0.0;
          fVar272 = auVar222._24_4_;
          auVar96._24_4_ = fVar272 * 0.0;
          auVar96._28_4_ = auVar365._28_4_;
          auVar218 = vmulps_avx512vl(auVar191,auVar220);
          auVar219 = vfmadd213ps_avx512vl(ZEXT832(0) << 0x20,auVar190,auVar194);
          auVar166 = vxorps_avx512vl(auVar203._0_16_,auVar203._0_16_);
          auVar203 = vfmadd213ps_avx512vl(ZEXT1632(auVar166),auVar189,auVar96);
          auVar166 = vfmadd213ps_fma(auVar220,ZEXT1632(auVar169),auVar218);
          auVar194 = vfmadd231ps_avx512vl(auVar194,auVar195,auVar190);
          auVar220 = vfmadd231ps_avx512vl(auVar96,auVar195,auVar189);
          auVar171 = vfmadd213ps_fma(auVar195,ZEXT1632(auVar169),auVar218);
          auVar97._4_4_ = auVar198._4_4_ * auVar214._4_4_;
          auVar97._0_4_ = auVar198._0_4_ * auVar214._0_4_;
          auVar97._8_4_ = auVar198._8_4_ * auVar214._8_4_;
          auVar97._12_4_ = auVar198._12_4_ * auVar214._12_4_;
          auVar97._16_4_ = auVar198._16_4_ * auVar214._16_4_;
          auVar97._20_4_ = auVar198._20_4_ * auVar214._20_4_;
          auVar97._24_4_ = auVar198._24_4_ * auVar214._24_4_;
          auVar97._28_4_ = auVar218._28_4_;
          auVar98._4_4_ = auVar198._4_4_ * fVar267;
          auVar98._0_4_ = auVar198._0_4_ * fVar259;
          auVar98._8_4_ = auVar198._8_4_ * fVar268;
          auVar98._12_4_ = auVar198._12_4_ * fVar269;
          auVar98._16_4_ = auVar198._16_4_ * fVar270;
          auVar98._20_4_ = auVar198._20_4_ * fVar271;
          auVar98._24_4_ = auVar198._24_4_ * fVar272;
          auVar98._28_4_ = fVar283;
          auVar195 = vmulps_avx512vl(auVar198,auVar191);
          auVar218 = vfmadd231ps_avx512vl(auVar97,auVar197,auVar190);
          auVar223 = vfmadd231ps_avx512vl(auVar98,auVar197,auVar189);
          auVar170 = vfmadd231ps_fma(auVar195,ZEXT1632(auVar169),auVar197);
          auVar99._4_4_ = auVar199._4_4_ * auVar214._4_4_;
          auVar99._0_4_ = auVar199._0_4_ * auVar214._0_4_;
          auVar99._8_4_ = auVar199._8_4_ * auVar214._8_4_;
          auVar99._12_4_ = auVar199._12_4_ * auVar214._12_4_;
          auVar99._16_4_ = auVar199._16_4_ * auVar214._16_4_;
          auVar99._20_4_ = auVar199._20_4_ * auVar214._20_4_;
          auVar99._24_4_ = auVar199._24_4_ * auVar214._24_4_;
          auVar99._28_4_ = auVar214._28_4_;
          auVar100._4_4_ = auVar199._4_4_ * fVar267;
          auVar100._0_4_ = auVar199._0_4_ * fVar259;
          auVar100._8_4_ = auVar199._8_4_ * fVar268;
          auVar100._12_4_ = auVar199._12_4_ * fVar269;
          auVar100._16_4_ = auVar199._16_4_ * fVar270;
          auVar100._20_4_ = auVar199._20_4_ * fVar271;
          auVar100._24_4_ = auVar199._24_4_ * fVar272;
          auVar100._28_4_ = auVar222._28_4_;
          auVar191 = vmulps_avx512vl(auVar199,auVar191);
          auVar190 = vfmadd231ps_avx512vl(auVar99,auVar202,auVar190);
          auVar189 = vfmadd231ps_avx512vl(auVar100,auVar202,auVar189);
          auVar191 = vfmadd231ps_avx512vl(auVar191,auVar202,ZEXT1632(auVar169));
          auVar172 = vaddps_avx512vl(auVar172,auVar173);
          auVar197 = vfmadd231ps_avx512vl(auVar219,auVar221,auVar172);
          auVar173 = vfmadd231ps_avx512vl(auVar203,auVar221,ZEXT1632(auVar167));
          auVar195 = vfmadd231ps_avx512vl(ZEXT1632(auVar166),ZEXT1632(auVar168),auVar221);
          auVar199 = vfmadd231ps_avx512vl(auVar194,auVar200,auVar172);
          auVar202 = vfmadd231ps_avx512vl(auVar220,auVar200,ZEXT1632(auVar167));
          auVar200 = vfmadd231ps_avx512vl(ZEXT1632(auVar171),ZEXT1632(auVar168),auVar200);
          auVar203 = vfmadd231ps_avx512vl(auVar218,auVar193,auVar172);
          auVar214 = vfmadd231ps_avx512vl(auVar223,auVar193,ZEXT1632(auVar167));
          auVar193 = vfmadd231ps_avx512vl(ZEXT1632(auVar170),ZEXT1632(auVar168),auVar193);
          auVar190 = vfmadd231ps_avx512vl(auVar190,auVar201,auVar172);
          auVar194 = vaddps_avx512vl(auVar192,auVar190);
          auVar189 = vfmadd231ps_avx512vl(auVar189,auVar201,ZEXT1632(auVar167));
          auVar221 = vaddps_avx512vl(auVar217,auVar189);
          auVar189 = vfmadd231ps_avx512vl(auVar191,auVar201,ZEXT1632(auVar168));
          auVar196 = vaddps_avx512vl(auVar196,auVar189);
          auVar264._0_4_ = auVar214._0_4_ * auVar200._0_4_;
          auVar264._4_4_ = auVar214._4_4_ * auVar200._4_4_;
          auVar264._8_4_ = auVar214._8_4_ * auVar200._8_4_;
          auVar264._12_4_ = auVar214._12_4_ * auVar200._12_4_;
          auVar264._16_4_ = auVar214._16_4_ * auVar200._16_4_;
          auVar264._20_4_ = auVar214._20_4_ * auVar200._20_4_;
          auVar264._24_4_ = auVar214._24_4_ * auVar200._24_4_;
          auVar264._28_4_ = 0;
          auVar171 = vfmsub231ps_fma(auVar264,auVar202,auVar193);
          auVar190 = vmulps_avx512vl(auVar193,auVar199);
          auVar167 = vfmsub231ps_fma(auVar190,auVar200,auVar203);
          auVar101._4_4_ = auVar202._4_4_ * auVar203._4_4_;
          auVar101._0_4_ = auVar202._0_4_ * auVar203._0_4_;
          auVar101._8_4_ = auVar202._8_4_ * auVar203._8_4_;
          auVar101._12_4_ = auVar202._12_4_ * auVar203._12_4_;
          auVar101._16_4_ = auVar202._16_4_ * auVar203._16_4_;
          auVar101._20_4_ = auVar202._20_4_ * auVar203._20_4_;
          auVar101._24_4_ = auVar202._24_4_ * auVar203._24_4_;
          auVar101._28_4_ = auVar189._28_4_;
          auVar201 = vfmsub231ps_avx512vl(auVar101,auVar199,auVar214);
          fVar259 = auVar195._0_4_;
          fVar267 = auVar195._4_4_;
          auVar102._4_4_ = fVar267 * auVar203._4_4_;
          auVar102._0_4_ = fVar259 * auVar203._0_4_;
          fVar268 = auVar195._8_4_;
          auVar102._8_4_ = fVar268 * auVar203._8_4_;
          fVar269 = auVar195._12_4_;
          auVar102._12_4_ = fVar269 * auVar203._12_4_;
          fVar270 = auVar195._16_4_;
          auVar102._16_4_ = fVar270 * auVar203._16_4_;
          fVar271 = auVar195._20_4_;
          auVar102._20_4_ = fVar271 * auVar203._20_4_;
          fVar272 = auVar195._24_4_;
          auVar102._24_4_ = fVar272 * auVar203._24_4_;
          auVar102._28_4_ = auVar172._28_4_;
          auVar168 = vfmsub231ps_fma(auVar102,auVar197,auVar193);
          auVar172 = vmulps_avx512vl(auVar173,auVar193);
          auVar169 = vfmsub231ps_fma(auVar172,auVar214,auVar195);
          auVar103._4_4_ = auVar197._4_4_ * auVar214._4_4_;
          auVar103._0_4_ = auVar197._0_4_ * auVar214._0_4_;
          auVar103._8_4_ = auVar197._8_4_ * auVar214._8_4_;
          auVar103._12_4_ = auVar197._12_4_ * auVar214._12_4_;
          auVar103._16_4_ = auVar197._16_4_ * auVar214._16_4_;
          auVar103._20_4_ = auVar197._20_4_ * auVar214._20_4_;
          auVar103._24_4_ = auVar197._24_4_ * auVar214._24_4_;
          auVar103._28_4_ = auVar198._28_4_;
          auVar198 = vfmsub231ps_avx512vl(auVar103,auVar173,auVar203);
          auVar104._4_4_ = auVar202._4_4_ * fVar267;
          auVar104._0_4_ = auVar202._0_4_ * fVar259;
          auVar104._8_4_ = auVar202._8_4_ * fVar268;
          auVar104._12_4_ = auVar202._12_4_ * fVar269;
          auVar104._16_4_ = auVar202._16_4_ * fVar270;
          auVar104._20_4_ = auVar202._20_4_ * fVar271;
          auVar104._24_4_ = auVar202._24_4_ * fVar272;
          auVar104._28_4_ = auVar203._28_4_;
          auVar190 = vfmsub231ps_avx512vl(auVar104,auVar173,auVar200);
          auVar105._4_4_ = auVar197._4_4_ * auVar200._4_4_;
          auVar105._0_4_ = auVar197._0_4_ * auVar200._0_4_;
          auVar105._8_4_ = auVar197._8_4_ * auVar200._8_4_;
          auVar105._12_4_ = auVar197._12_4_ * auVar200._12_4_;
          auVar105._16_4_ = auVar197._16_4_ * auVar200._16_4_;
          auVar105._20_4_ = auVar197._20_4_ * auVar200._20_4_;
          auVar105._24_4_ = auVar197._24_4_ * auVar200._24_4_;
          auVar105._28_4_ = auVar214._28_4_;
          auVar200 = vfmsub231ps_avx512vl(auVar105,auVar195,auVar199);
          auVar172 = vmulps_avx512vl(auVar199,auVar173);
          auVar195 = vfmsub231ps_avx512vl(auVar172,auVar197,auVar202);
          auVar106._4_4_ = fVar267 * auVar201._4_4_;
          auVar106._0_4_ = fVar259 * auVar201._0_4_;
          auVar106._8_4_ = fVar268 * auVar201._8_4_;
          auVar106._12_4_ = fVar269 * auVar201._12_4_;
          auVar106._16_4_ = fVar270 * auVar201._16_4_;
          auVar106._20_4_ = fVar271 * auVar201._20_4_;
          auVar106._24_4_ = fVar272 * auVar201._24_4_;
          auVar106._28_4_ = auVar202._28_4_;
          auVar172 = vfmadd231ps_avx512vl(auVar106,ZEXT1632(auVar167),auVar173);
          auVar166 = vfmadd231ps_fma(auVar172,ZEXT1632(auVar171),auVar197);
          auVar172 = vdivps_avx(ZEXT1632(auVar171),ZEXT1632(auVar166));
          auVar189 = vdivps_avx(ZEXT1632(auVar169),ZEXT1632(auVar166));
          auVar193 = ZEXT1632(auVar166);
          auVar190 = vdivps_avx(auVar190,auVar193);
          auVar191 = vdivps_avx(ZEXT1632(auVar167),auVar193);
          auVar192 = vdivps_avx(ZEXT1632(auVar168),auVar193);
          auVar200 = vdivps_avx(auVar200,auVar193);
          auVar199 = ZEXT1632(auVar166);
          auVar193 = vdivps_avx(auVar201,auVar199);
          auVar173 = vdivps_avx(auVar198,auVar199);
          auVar195 = vdivps_avx512vl(auVar195,auVar199);
          fVar259 = auVar196._0_4_;
          fVar267 = auVar196._4_4_;
          auVar107._4_4_ = fVar267 * auVar193._4_4_;
          auVar107._0_4_ = fVar259 * auVar193._0_4_;
          fVar268 = auVar196._8_4_;
          auVar107._8_4_ = fVar268 * auVar193._8_4_;
          fVar269 = auVar196._12_4_;
          auVar107._12_4_ = fVar269 * auVar193._12_4_;
          fVar270 = auVar196._16_4_;
          auVar107._16_4_ = fVar270 * auVar193._16_4_;
          fVar271 = auVar196._20_4_;
          auVar107._20_4_ = fVar271 * auVar193._20_4_;
          fVar272 = auVar196._24_4_;
          auVar107._24_4_ = fVar272 * auVar193._24_4_;
          auVar107._28_4_ = auVar198._28_4_;
          auVar108._4_4_ = fVar267 * auVar173._4_4_;
          auVar108._0_4_ = fVar259 * auVar173._0_4_;
          auVar108._8_4_ = fVar268 * auVar173._8_4_;
          auVar108._12_4_ = fVar269 * auVar173._12_4_;
          auVar108._16_4_ = fVar270 * auVar173._16_4_;
          auVar108._20_4_ = fVar271 * auVar173._20_4_;
          auVar108._24_4_ = fVar272 * auVar173._24_4_;
          auVar108._28_4_ = auVar197._28_4_;
          auVar366._0_4_ = fVar259 * auVar195._0_4_;
          auVar366._4_4_ = fVar267 * auVar195._4_4_;
          auVar366._8_4_ = fVar268 * auVar195._8_4_;
          auVar366._12_4_ = fVar269 * auVar195._12_4_;
          auVar366._16_4_ = fVar270 * auVar195._16_4_;
          auVar366._20_4_ = fVar271 * auVar195._20_4_;
          auVar366._24_4_ = fVar272 * auVar195._24_4_;
          auVar366._28_4_ = 0;
          auVar171 = vfmadd231ps_fma(auVar107,auVar221,auVar191);
          auVar166 = vfmadd231ps_fma(auVar108,auVar221,auVar192);
          auVar167 = vfmadd231ps_fma(auVar366,auVar200,auVar221);
        }
        else {
          lVar8 = *(long *)&pGVar6[1].fnumTimeSegments;
          uVar159 = uVar155;
          do {
            uVar4 = 0;
            for (uVar158 = (uint)uVar159; (uVar158 & 1) == 0; uVar158 = uVar158 >> 1 | 0x80000000) {
              uVar4 = uVar4 + 1;
            }
            lVar160 = (long)*(int *)(local_180 + (ulong)uVar4 * 4) * 0x38;
            plVar1 = (long *)(lVar8 + lVar160);
            iVar5 = *(int *)(lVar8 + 0x20 + lVar160);
            if (iVar5 == 0x9134) {
              lVar161 = *plVar1;
              lVar163 = plVar1[2] * uVar157;
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + lVar163)),
                                       ZEXT416(*(uint *)(lVar161 + 0x10 + lVar163)),0x1c);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x20 + lVar163)),0x28);
              in_ZMM6 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 4 + lVar163)),
                                       ZEXT416(*(uint *)(lVar161 + 0x14 + lVar163)),0x1c);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x24 + lVar163)),0x28);
              in_ZMM9 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 8 + lVar163)),
                                       ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)),0x1c);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x28 + lVar163)),0x28);
              in_ZMM4 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                       ZEXT416(*(uint *)(lVar161 + 0x1c + lVar163)),0x1c);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x2c + lVar163)),0x28);
              in_ZMM10 = ZEXT1664(auVar166);
            }
            else if (iVar5 == 0x9234) {
              lVar161 = *plVar1;
              lVar163 = plVar1[2] * uVar157;
              auVar166._8_8_ = 0;
              auVar166._0_8_ = *(ulong *)(lVar161 + 4 + lVar163);
              auVar171._8_8_ = 0;
              auVar171._0_8_ = *(ulong *)(lVar161 + 0x10 + lVar163);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + lVar163)),_DAT_02060e80,
                                            auVar166);
              in_ZMM6 = ZEXT1664(auVar166);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                            _DAT_02060e80,auVar171);
              in_ZMM9 = ZEXT1664(auVar166);
              auVar167._8_8_ = 0;
              auVar167._0_8_ = *(ulong *)(lVar161 + 0x1c + lVar163);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)),
                                            _DAT_02060e80,auVar167);
              in_ZMM4 = ZEXT1664(auVar166);
              auVar168._8_8_ = 0;
              auVar168._0_8_ = *(ulong *)(lVar161 + 0x28 + lVar163);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0x24 + lVar163)),
                                            _DAT_02060e80,auVar168);
              in_ZMM10 = ZEXT1664(auVar166);
            }
            else if (iVar5 == 0xb001) {
              lVar161 = *plVar1;
              lVar163 = plVar1[2] * uVar157;
              auVar169._8_8_ = 0;
              auVar169._0_8_ = *(ulong *)(lVar161 + 0x10 + lVar163);
              auVar171 = vinsertps_avx512f(auVar169,ZEXT416(*(uint *)(lVar161 + 8 + lVar163)),0x20);
              in_ZMM16 = ZEXT1664(auVar171);
              auVar321._8_8_ = 0;
              auVar321._0_8_ = *(ulong *)(lVar161 + 0x34 + lVar163);
              auVar167 = vpermt2ps_avx512vl(auVar321,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar161 + lVar163)));
              auVar341._8_8_ = 0;
              auVar341._0_8_ = *(ulong *)(lVar161 + 0x1c + lVar163);
              auVar168 = vpermt2ps_avx512vl(auVar341,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)));
              fVar283 = *(float *)(lVar161 + 0x24 + lVar163);
              fVar292 = *(float *)(lVar161 + 0x28 + lVar163);
              fVar293 = *(float *)(lVar161 + 0x2c + lVar163);
              fVar294 = *(float *)(lVar161 + 0x30 + lVar163);
              auVar166 = vfmadd231ss_fma(ZEXT416((uint)(fVar292 * fVar292)),ZEXT416((uint)fVar283),
                                         ZEXT416((uint)fVar283));
              auVar166 = vfmadd231ss_fma(auVar166,ZEXT416((uint)fVar293),ZEXT416((uint)fVar293));
              auVar166 = vfmadd231ss_fma(auVar166,ZEXT416((uint)fVar294),ZEXT416((uint)fVar294));
              auVar170._4_12_ = ZEXT812(0) << 0x20;
              auVar170._0_4_ = auVar166._0_4_;
              auVar169 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              fVar295 = auVar169._0_4_;
              in_ZMM15 = ZEXT464((uint)(fVar295 * 1.5));
              fVar295 = fVar295 * 1.5 + auVar166._0_4_ * -0.5 * fVar295 * fVar295 * fVar295;
              auVar166 = vinsertps_avx(auVar168,ZEXT416((uint)(fVar283 * fVar295)),0x30);
              in_ZMM10 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(auVar167,ZEXT416((uint)(fVar292 * fVar295)),0x30);
              in_ZMM6 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx512f(auVar171,ZEXT416((uint)(fVar294 * fVar295)),0x30);
              in_ZMM4 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                       ZEXT416(*(uint *)(lVar161 + 4 + lVar163)),0x10);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x3c + lVar163)),0x20);
              auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)(fVar293 * fVar295)),0x30);
              in_ZMM9 = ZEXT1664(auVar166);
            }
            else if (iVar5 == 0x9244) {
              lVar161 = *plVar1;
              lVar163 = plVar1[2] * uVar157;
              in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar161 + lVar163));
              in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(lVar161 + 0x10 + lVar163));
              in_ZMM4 = ZEXT1664(*(undefined1 (*) [16])(lVar161 + 0x20 + lVar163));
              in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar161 + 0x30 + lVar163));
            }
            auVar172 = vpbroadcastd_avx512vl();
            uVar18 = vpcmpeqd_avx512vl(auVar172,local_180);
            iVar5 = *(int *)(lVar8 + 0x58 + lVar160);
            if (iVar5 == 0x9134) {
              lVar160 = plVar1[7];
              lVar161 = plVar1[9] * uVar157;
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar160 + lVar161)),
                                       ZEXT416(*(uint *)(lVar160 + 0x10 + lVar161)),0x1c);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar160 + 0x20 + lVar161)),0x28);
              in_ZMM5 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar160 + 4 + lVar161)),
                                       ZEXT416(*(uint *)(lVar160 + 0x14 + lVar161)),0x1c);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar160 + 0x24 + lVar161)),0x28);
              in_ZMM7 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar160 + 8 + lVar161)),
                                       ZEXT416(*(uint *)(lVar160 + 0x18 + lVar161)),0x1c);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar160 + 0x28 + lVar161)),0x28);
              in_ZMM8 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar160 + 0xc + lVar161)),
                                       ZEXT416(*(uint *)(lVar160 + 0x1c + lVar161)),0x1c);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar160 + 0x2c + lVar161)),0x28);
              auVar303 = ZEXT1664(auVar166);
            }
            else if (iVar5 == 0x9234) {
              lVar160 = plVar1[7];
              lVar161 = plVar1[9] * uVar157;
              auVar278._8_8_ = 0;
              auVar278._0_8_ = *(ulong *)(lVar160 + 4 + lVar161);
              auVar330._8_8_ = 0;
              auVar330._0_8_ = *(ulong *)(lVar160 + 0x10 + lVar161);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar160 + lVar161)),_DAT_02060e80,
                                            auVar278);
              in_ZMM5 = ZEXT1664(auVar166);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar160 + 0xc + lVar161)),
                                            _DAT_02060e80,auVar330);
              in_ZMM7 = ZEXT1664(auVar166);
              auVar279._8_8_ = 0;
              auVar279._0_8_ = *(ulong *)(lVar160 + 0x1c + lVar161);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar160 + 0x18 + lVar161)),
                                            _DAT_02060e80,auVar279);
              in_ZMM8 = ZEXT1664(auVar166);
              auVar353._8_8_ = 0;
              auVar353._0_8_ = *(ulong *)(lVar160 + 0x28 + lVar161);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar160 + 0x24 + lVar161)),
                                            _DAT_02060e80,auVar353);
              auVar303 = ZEXT1664(auVar166);
            }
            else if (iVar5 == 0xb001) {
              lVar160 = plVar1[7];
              lVar161 = plVar1[9] * uVar157;
              auVar280._8_8_ = 0;
              auVar280._0_8_ = *(ulong *)(lVar160 + 0x10 + lVar161);
              auVar166 = vinsertps_avx(auVar280,ZEXT416(*(uint *)(lVar160 + 8 + lVar161)),0x20);
              auVar316._8_8_ = 0;
              auVar316._0_8_ = *(ulong *)(lVar160 + 0x34 + lVar161);
              auVar167 = vpermt2ps_avx512vl(auVar316,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar160 + lVar161)));
              auVar281._8_8_ = 0;
              auVar281._0_8_ = *(ulong *)(lVar160 + 0x1c + lVar161);
              auVar168 = vpermt2ps_avx512vl(auVar281,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar160 + 0x18 + lVar161)));
              fVar283 = *(float *)(lVar160 + 0x24 + lVar161);
              fVar292 = *(float *)(lVar160 + 0x28 + lVar161);
              fVar293 = *(float *)(lVar160 + 0x2c + lVar161);
              fVar294 = *(float *)(lVar160 + 0x30 + lVar161);
              auVar171 = vfmadd231ss_fma(ZEXT416((uint)(fVar292 * fVar292)),ZEXT416((uint)fVar283),
                                         ZEXT416((uint)fVar283));
              auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar293),ZEXT416((uint)fVar293));
              auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar294),ZEXT416((uint)fVar294));
              auVar172._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              auVar189._4_28_ = auVar172._4_28_;
              auVar189._0_4_ = auVar171._0_4_;
              auVar169 = vrsqrt14ss_avx512f(auVar172._0_16_,auVar189._0_16_);
              auVar170 = vmulss_avx512f(auVar169,ZEXT416(0x3fc00000));
              in_ZMM16 = ZEXT1664(auVar170);
              fVar296 = auVar169._0_4_;
              fVar295 = auVar171._0_4_ * -0.5 * fVar296;
              in_ZMM15 = ZEXT464((uint)fVar295);
              auVar171 = vaddss_avx512f(auVar170,ZEXT416((uint)(fVar295 * fVar296 * fVar296)));
              fVar295 = auVar171._0_4_;
              auVar171 = vinsertps_avx(auVar168,ZEXT416((uint)(fVar283 * fVar295)),0x30);
              auVar303 = ZEXT1664(auVar171);
              auVar171 = vinsertps_avx(auVar167,ZEXT416((uint)(fVar292 * fVar295)),0x30);
              in_ZMM5 = ZEXT1664(auVar171);
              auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)(fVar294 * fVar295)),0x30);
              in_ZMM8 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar160 + 0xc + lVar161)),
                                       ZEXT416(*(uint *)(lVar160 + 4 + lVar161)),0x10);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar160 + 0x3c + lVar161)),0x20);
              auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)(fVar293 * fVar295)),0x30);
              in_ZMM7 = ZEXT1664(auVar166);
            }
            else if (iVar5 == 0x9244) {
              lVar160 = plVar1[7];
              lVar161 = plVar1[9] * uVar157;
              in_ZMM5 = ZEXT1664(*(undefined1 (*) [16])(lVar160 + lVar161));
              in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(lVar160 + 0x10 + lVar161));
              in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(lVar160 + 0x20 + lVar161));
              auVar303 = ZEXT1664(*(undefined1 (*) [16])(lVar160 + 0x30 + lVar161));
            }
            bVar162 = (byte)uVar159 & (byte)uVar18;
            bVar156 = ~bVar162 & (byte)uVar159;
            uVar159 = (ulong)bVar156;
            auVar172 = vbroadcastss_avx512vl(in_ZMM6._0_16_);
            auVar200._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM18._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar200._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM18._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar200._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM18._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar200._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM18._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar200._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM18._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar200._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM18._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar200._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM18._24_4_;
            auVar200._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM18._28_4_;
            in_ZMM18 = ZEXT3264(auVar200);
            auVar220._8_4_ = 1;
            auVar220._0_8_ = 0x100000001;
            auVar220._12_4_ = 1;
            auVar220._16_4_ = 1;
            auVar220._20_4_ = 1;
            auVar220._24_4_ = 1;
            auVar220._28_4_ = 1;
            auVar189 = in_ZMM6._0_32_;
            auVar172 = vpermps_avx512vl(auVar220,auVar189);
            auVar193._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM17._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar193._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM17._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar193._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM17._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar193._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM17._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar193._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM17._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar193._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM17._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar193._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM17._24_4_;
            auVar193._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM17._28_4_;
            in_ZMM17 = ZEXT3264(auVar193);
            auVar223._8_4_ = 2;
            auVar223._0_8_ = 0x200000002;
            auVar223._12_4_ = 2;
            auVar223._16_4_ = 2;
            auVar223._20_4_ = 2;
            auVar223._24_4_ = 2;
            auVar223._28_4_ = 2;
            auVar172 = vpermps_avx512vl(auVar223,auVar189);
            local_140 = (uint)(bVar162 & 1) * auVar172._0_4_ | !(bool)(bVar162 & 1) * local_140;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            uStack_13c = (uint)bVar9 * auVar172._4_4_ | !bVar9 * uStack_13c;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            uStack_138 = (uint)bVar9 * auVar172._8_4_ | !bVar9 * uStack_138;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            uStack_134 = (uint)bVar9 * auVar172._12_4_ | !bVar9 * uStack_134;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            uStack_130 = (uint)bVar9 * auVar172._16_4_ | !bVar9 * uStack_130;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            uStack_12c = (uint)bVar9 * auVar172._20_4_ | !bVar9 * uStack_12c;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            uStack_128 = (uint)bVar9 * auVar172._24_4_ | !bVar9 * uStack_128;
            uStack_124 = (uint)(bVar162 >> 7) * auVar172._28_4_ | !(bool)(bVar162 >> 7) * uStack_124
            ;
            auVar224._8_4_ = 3;
            auVar224._0_8_ = 0x300000003;
            auVar224._12_4_ = 3;
            auVar224._16_4_ = 3;
            auVar224._20_4_ = 3;
            auVar224._24_4_ = 3;
            auVar224._28_4_ = 3;
            auVar172 = vpermps_avx512vl(auVar224,auVar189);
            auVar173._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM27._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar173._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM27._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar173._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM27._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar173._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM27._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar173._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM27._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar173._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM27._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar173._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM27._24_4_;
            auVar173._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM27._28_4_;
            in_ZMM27 = ZEXT3264(auVar173);
            auVar172 = vbroadcastss_avx512vl(in_ZMM9._0_16_);
            local_1a0 = (uint)(bVar162 & 1) * auVar172._0_4_ | !(bool)(bVar162 & 1) * local_1a0;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            uStack_19c = (uint)bVar9 * auVar172._4_4_ | !bVar9 * uStack_19c;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            uStack_198 = (uint)bVar9 * auVar172._8_4_ | !bVar9 * uStack_198;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            uStack_194 = (uint)bVar9 * auVar172._12_4_ | !bVar9 * uStack_194;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            uStack_190 = (uint)bVar9 * auVar172._16_4_ | !bVar9 * uStack_190;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            uStack_18c = (uint)bVar9 * auVar172._20_4_ | !bVar9 * uStack_18c;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            uStack_188 = (uint)bVar9 * auVar172._24_4_ | !bVar9 * uStack_188;
            uStack_184 = (uint)(bVar162 >> 7) * auVar172._28_4_ | !(bool)(bVar162 >> 7) * uStack_184
            ;
            auVar189 = in_ZMM9._0_32_;
            auVar172 = vpermps_avx512vl(auVar220,auVar189);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            local_260._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * local_260._4_4_;
            local_260._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * local_260._0_4_
            ;
            local_260._8_4_ = (uint)bVar10 * auVar172._8_4_ | (uint)!bVar10 * local_260._8_4_;
            local_260._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * local_260._12_4_;
            local_260._16_4_ = (uint)bVar12 * auVar172._16_4_ | (uint)!bVar12 * local_260._16_4_;
            local_260._20_4_ = (uint)bVar13 * auVar172._20_4_ | (uint)!bVar13 * local_260._20_4_;
            local_260._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * local_260._24_4_;
            local_260._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * local_260._28_4_;
            auVar172 = vpermps_avx512vl(auVar223,auVar189);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            local_200._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * local_200._4_4_;
            local_200._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * local_200._0_4_
            ;
            local_200._8_4_ = (uint)bVar10 * auVar172._8_4_ | (uint)!bVar10 * local_200._8_4_;
            local_200._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * local_200._12_4_;
            local_200._16_4_ = (uint)bVar12 * auVar172._16_4_ | (uint)!bVar12 * local_200._16_4_;
            local_200._20_4_ = (uint)bVar13 * auVar172._20_4_ | (uint)!bVar13 * local_200._20_4_;
            local_200._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * local_200._24_4_;
            local_200._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * local_200._28_4_;
            auVar172 = vpermps_avx512vl(auVar224,auVar189);
            auVar195._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM24._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar195._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM24._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar195._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM24._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar195._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM24._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar195._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM24._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar195._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM24._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar195._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM24._24_4_;
            auVar195._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM24._28_4_;
            in_ZMM24 = ZEXT3264(auVar195);
            auVar172 = vbroadcastss_avx512vl(in_ZMM4._0_16_);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            local_2a0._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * local_2a0._4_4_;
            local_2a0._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * local_2a0._0_4_
            ;
            local_2a0._8_4_ = (uint)bVar10 * auVar172._8_4_ | (uint)!bVar10 * local_2a0._8_4_;
            local_2a0._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * local_2a0._12_4_;
            local_2a0._16_4_ = (uint)bVar12 * auVar172._16_4_ | (uint)!bVar12 * local_2a0._16_4_;
            local_2a0._20_4_ = (uint)bVar13 * auVar172._20_4_ | (uint)!bVar13 * local_2a0._20_4_;
            local_2a0._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * local_2a0._24_4_;
            local_2a0._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * local_2a0._28_4_;
            auVar189 = in_ZMM4._0_32_;
            auVar172 = vpermps_avx512vl(auVar220,auVar189);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            local_220._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * local_220._4_4_;
            local_220._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * local_220._0_4_
            ;
            local_220._8_4_ = (uint)bVar10 * auVar172._8_4_ | (uint)!bVar10 * local_220._8_4_;
            local_220._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * local_220._12_4_;
            local_220._16_4_ = (uint)bVar12 * auVar172._16_4_ | (uint)!bVar12 * local_220._16_4_;
            local_220._20_4_ = (uint)bVar13 * auVar172._20_4_ | (uint)!bVar13 * local_220._20_4_;
            local_220._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * local_220._24_4_;
            local_220._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * local_220._28_4_;
            auVar172 = vpermps_avx512vl(auVar223,auVar189);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            local_1e0._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * local_1e0._4_4_;
            local_1e0._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * local_1e0._0_4_
            ;
            local_1e0._8_4_ = (uint)bVar10 * auVar172._8_4_ | (uint)!bVar10 * local_1e0._8_4_;
            local_1e0._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * local_1e0._12_4_;
            local_1e0._16_4_ = (uint)bVar12 * auVar172._16_4_ | (uint)!bVar12 * local_1e0._16_4_;
            local_1e0._20_4_ = (uint)bVar13 * auVar172._20_4_ | (uint)!bVar13 * local_1e0._20_4_;
            local_1e0._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * local_1e0._24_4_;
            local_1e0._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * local_1e0._28_4_;
            auVar172 = vpermps_avx512vl(auVar224,auVar189);
            auVar196._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM22._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar196._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM22._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar196._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM22._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar196._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM22._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar196._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM22._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar196._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM22._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar196._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM22._24_4_;
            auVar196._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM22._28_4_;
            in_ZMM22 = ZEXT3264(auVar196);
            auVar172 = vbroadcastss_avx512vl(in_ZMM10._0_16_);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            local_280._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * local_280._4_4_;
            local_280._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * local_280._0_4_
            ;
            local_280._8_4_ = (uint)bVar10 * auVar172._8_4_ | (uint)!bVar10 * local_280._8_4_;
            local_280._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * local_280._12_4_;
            local_280._16_4_ = (uint)bVar12 * auVar172._16_4_ | (uint)!bVar12 * local_280._16_4_;
            local_280._20_4_ = (uint)bVar13 * auVar172._20_4_ | (uint)!bVar13 * local_280._20_4_;
            local_280._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * local_280._24_4_;
            local_280._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * local_280._28_4_;
            auVar189 = in_ZMM10._0_32_;
            auVar172 = vpermps_avx512vl(auVar220,auVar189);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            local_240._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * local_240._4_4_;
            local_240._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * local_240._0_4_
            ;
            local_240._8_4_ = (uint)bVar10 * auVar172._8_4_ | (uint)!bVar10 * local_240._8_4_;
            local_240._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * local_240._12_4_;
            local_240._16_4_ = (uint)bVar12 * auVar172._16_4_ | (uint)!bVar12 * local_240._16_4_;
            local_240._20_4_ = (uint)bVar13 * auVar172._20_4_ | (uint)!bVar13 * local_240._20_4_;
            local_240._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * local_240._24_4_;
            local_240._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * local_240._28_4_;
            auVar172 = vpermps_avx512vl(auVar223,auVar189);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            local_2c0._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * local_2c0._4_4_;
            local_2c0._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * local_2c0._0_4_
            ;
            local_2c0._8_4_ = (uint)bVar10 * auVar172._8_4_ | (uint)!bVar10 * local_2c0._8_4_;
            local_2c0._12_4_ = (uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * local_2c0._12_4_;
            local_2c0._16_4_ = (uint)bVar12 * auVar172._16_4_ | (uint)!bVar12 * local_2c0._16_4_;
            local_2c0._20_4_ = (uint)bVar13 * auVar172._20_4_ | (uint)!bVar13 * local_2c0._20_4_;
            local_2c0._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * local_2c0._24_4_;
            local_2c0._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * local_2c0._28_4_;
            auVar172 = vpermps_avx512vl(auVar224,auVar189);
            auVar198._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM23._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar198._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM23._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar198._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM23._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar198._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM23._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar198._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM23._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar198._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM23._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar198._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM23._24_4_;
            auVar198._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM23._28_4_;
            in_ZMM23 = ZEXT3264(auVar198);
            auVar172 = vbroadcastss_avx512vl(in_ZMM5._0_16_);
            auVar199._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM29._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar199._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM29._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar199._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM29._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar199._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM29._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar199._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM29._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar199._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM29._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar199._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM29._24_4_;
            auVar199._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM29._28_4_;
            in_ZMM29 = ZEXT3264(auVar199);
            auVar189 = in_ZMM5._0_32_;
            auVar172 = vpermps_avx512vl(auVar220,auVar189);
            auVar201._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM26._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar201._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM26._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar201._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM26._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar201._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM26._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar201._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM26._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar201._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM26._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar201._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM26._24_4_;
            auVar201._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM26._28_4_;
            in_ZMM26 = ZEXT3264(auVar201);
            auVar172 = vpermps_avx512vl(auVar223,auVar189);
            auVar202._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM25._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar202._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM25._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar202._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM25._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar202._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM25._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar202._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM25._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar202._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM25._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar202._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM25._24_4_;
            auVar202._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM25._28_4_;
            in_ZMM25 = ZEXT3264(auVar202);
            auVar172 = vpermps_avx512vl(auVar224,auVar189);
            auVar203._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * auVar291._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar203._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * auVar291._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar203._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * auVar291._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar203._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * auVar291._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar203._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * auVar291._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar203._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * auVar291._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar203._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * auVar291._24_4_;
            auVar203._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * auVar291._28_4_;
            auVar291 = ZEXT3264(auVar203);
            auVar172 = vbroadcastss_avx512vl(in_ZMM7._0_16_);
            auVar214._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM21._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar214._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM21._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar214._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM21._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar214._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM21._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar214._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM21._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar214._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM21._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar214._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM21._24_4_;
            auVar214._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM21._28_4_;
            in_ZMM21 = ZEXT3264(auVar214);
            auVar189 = in_ZMM7._0_32_;
            auVar172 = vpermps_avx512vl(auVar220,auVar189);
            auVar221._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM20._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar221._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM20._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar221._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM20._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar221._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM20._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar221._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM20._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar221._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM20._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar221._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM20._24_4_;
            auVar221._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM20._28_4_;
            in_ZMM20 = ZEXT3264(auVar221);
            auVar172 = vpermps_avx512vl(auVar223,auVar189);
            auVar222._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM19._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar222._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM19._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar222._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM19._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar222._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM19._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar222._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM19._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar222._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM19._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar222._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM19._24_4_;
            auVar222._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM19._28_4_;
            in_ZMM19 = ZEXT3264(auVar222);
            auVar172 = vpermps_avx512vl(auVar224,auVar189);
            auVar217._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM31._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar217._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM31._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar217._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM31._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar217._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM31._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar217._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM31._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar217._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM31._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar217._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM31._24_4_;
            auVar217._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM31._28_4_;
            in_ZMM31 = ZEXT3264(auVar217);
            auVar172 = vbroadcastss_avx512vl(in_ZMM8._0_16_);
            local_120 = (float)((uint)(bVar162 & 1) * auVar172._0_4_ |
                               (uint)!(bool)(bVar162 & 1) * (int)local_120);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            fStack_11c = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * (int)fStack_11c);
            bVar9 = (bool)(bVar162 >> 2 & 1);
            fStack_118 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * (int)fStack_118);
            bVar9 = (bool)(bVar162 >> 3 & 1);
            fStack_114 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * (int)fStack_114);
            bVar9 = (bool)(bVar162 >> 4 & 1);
            fStack_110 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * (int)fStack_110);
            bVar9 = (bool)(bVar162 >> 5 & 1);
            fStack_10c = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * (int)fStack_10c);
            bVar9 = (bool)(bVar162 >> 6 & 1);
            fStack_108 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * (int)fStack_108);
            uStack_104 = (uint)(bVar162 >> 7) * auVar172._28_4_ | !(bool)(bVar162 >> 7) * uStack_104
            ;
            auVar189 = in_ZMM8._0_32_;
            auVar172 = vpermps_avx512vl(auVar220,auVar189);
            local_100 = (float)((uint)(bVar162 & 1) * auVar172._0_4_ |
                               (uint)!(bool)(bVar162 & 1) * (int)local_100);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            fStack_fc = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * (int)fStack_fc);
            bVar9 = (bool)(bVar162 >> 2 & 1);
            fStack_f8 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * (int)fStack_f8);
            bVar9 = (bool)(bVar162 >> 3 & 1);
            fStack_f4 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * (int)fStack_f4);
            bVar9 = (bool)(bVar162 >> 4 & 1);
            fStack_f0 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * (int)fStack_f0);
            bVar9 = (bool)(bVar162 >> 5 & 1);
            fStack_ec = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * (int)fStack_ec);
            bVar9 = (bool)(bVar162 >> 6 & 1);
            fStack_e8 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * (int)fStack_e8);
            uStack_e4 = (uint)(bVar162 >> 7) * auVar172._28_4_ | !(bool)(bVar162 >> 7) * uStack_e4;
            auVar172 = vpermps_avx512vl(auVar223,auVar189);
            local_e0 = (float)((uint)(bVar162 & 1) * auVar172._0_4_ |
                              (uint)!(bool)(bVar162 & 1) * (int)local_e0);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            fStack_dc = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * (int)fStack_dc);
            bVar9 = (bool)(bVar162 >> 2 & 1);
            fStack_d8 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * (int)fStack_d8);
            bVar9 = (bool)(bVar162 >> 3 & 1);
            fStack_d4 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * (int)fStack_d4);
            bVar9 = (bool)(bVar162 >> 4 & 1);
            fStack_d0 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * (int)fStack_d0);
            bVar9 = (bool)(bVar162 >> 5 & 1);
            fStack_cc = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * (int)fStack_cc);
            bVar9 = (bool)(bVar162 >> 6 & 1);
            fStack_c8 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * (int)fStack_c8);
            uStack_c4 = (uint)(bVar162 >> 7) * auVar172._28_4_ | !(bool)(bVar162 >> 7) * uStack_c4;
            auVar172 = vpermps_avx512vl(auVar224,auVar189);
            auVar218._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM28._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar218._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM28._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar218._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM28._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar218._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM28._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar218._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM28._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar218._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM28._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar218._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM28._24_4_;
            auVar218._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM28._28_4_;
            in_ZMM28 = ZEXT3264(auVar218);
            auVar172 = vbroadcastss_avx512vl(auVar303._0_16_);
            local_c0 = (float)((uint)(bVar162 & 1) * auVar172._0_4_ |
                              (uint)!(bool)(bVar162 & 1) * (int)local_c0);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            fStack_bc = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * (int)fStack_bc);
            bVar9 = (bool)(bVar162 >> 2 & 1);
            fStack_b8 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * (int)fStack_b8);
            bVar9 = (bool)(bVar162 >> 3 & 1);
            fStack_b4 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * (int)fStack_b4);
            bVar9 = (bool)(bVar162 >> 4 & 1);
            fStack_b0 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * (int)fStack_b0);
            bVar9 = (bool)(bVar162 >> 5 & 1);
            fStack_ac = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * (int)fStack_ac);
            bVar9 = (bool)(bVar162 >> 6 & 1);
            fStack_a8 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * (int)fStack_a8);
            uStack_a4 = (uint)(bVar162 >> 7) * auVar172._28_4_ | !(bool)(bVar162 >> 7) * uStack_a4;
            auVar189 = auVar303._0_32_;
            auVar172 = vpermps_avx512vl(auVar220,auVar189);
            local_a0 = (float)((uint)(bVar162 & 1) * auVar172._0_4_ |
                              (uint)!(bool)(bVar162 & 1) * (int)local_a0);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            fStack_9c = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * (int)fStack_9c);
            bVar9 = (bool)(bVar162 >> 2 & 1);
            fStack_98 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * (int)fStack_98);
            bVar9 = (bool)(bVar162 >> 3 & 1);
            fStack_94 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * (int)fStack_94);
            bVar9 = (bool)(bVar162 >> 4 & 1);
            fStack_90 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * (int)fStack_90);
            bVar9 = (bool)(bVar162 >> 5 & 1);
            fStack_8c = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * (int)fStack_8c);
            bVar9 = (bool)(bVar162 >> 6 & 1);
            fStack_88 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * (int)fStack_88);
            uStack_84 = (uint)(bVar162 >> 7) * auVar172._28_4_ | !(bool)(bVar162 >> 7) * uStack_84;
            auVar172 = vpermps_avx512vl(auVar223,auVar189);
            local_160 = (float)((uint)(bVar162 & 1) * auVar172._0_4_ |
                               (uint)!(bool)(bVar162 & 1) * (int)local_160);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            fStack_15c = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * (int)fStack_15c);
            bVar9 = (bool)(bVar162 >> 2 & 1);
            fStack_158 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * (int)fStack_158);
            bVar9 = (bool)(bVar162 >> 3 & 1);
            fStack_154 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * (int)fStack_154);
            bVar9 = (bool)(bVar162 >> 4 & 1);
            fStack_150 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * (int)fStack_150);
            bVar9 = (bool)(bVar162 >> 5 & 1);
            fStack_14c = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * (int)fStack_14c);
            bVar9 = (bool)(bVar162 >> 6 & 1);
            fStack_148 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * (int)fStack_148);
            fStack_144 = (float)((uint)(bVar162 >> 7) * auVar172._28_4_ |
                                (uint)!(bool)(bVar162 >> 7) * (int)fStack_144);
            auVar172 = vpermps_avx512vl(auVar224,auVar189);
            auVar219._0_4_ =
                 (uint)(bVar162 & 1) * auVar172._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM30._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar219._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * in_ZMM30._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar219._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * in_ZMM30._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar219._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * in_ZMM30._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar219._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * in_ZMM30._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar219._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * in_ZMM30._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar219._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * in_ZMM30._24_4_;
            auVar219._28_4_ =
                 (uint)(bVar162 >> 7) * auVar172._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM30._28_4_;
            in_ZMM30 = ZEXT3264(auVar219);
          } while (bVar156 != 0);
          auVar172 = vmulps_avx512vl(auVar219,auVar198);
          auVar189 = vmulps_avx512vl(auVar203,auVar173);
          auVar190 = vmulps_avx512vl(auVar217,auVar195);
          auVar192 = vmulps_avx512vl(auVar218,auVar196);
          fVar283 = auVar192._0_4_;
          auVar282._0_4_ = fVar283 + auVar190._0_4_ + auVar189._0_4_ + auVar172._0_4_;
          fVar292 = auVar192._4_4_;
          auVar282._4_4_ = fVar292 + auVar190._4_4_ + auVar189._4_4_ + auVar172._4_4_;
          fVar293 = auVar192._8_4_;
          auVar282._8_4_ = fVar293 + auVar190._8_4_ + auVar189._8_4_ + auVar172._8_4_;
          fVar294 = auVar192._12_4_;
          auVar282._12_4_ = fVar294 + auVar190._12_4_ + auVar189._12_4_ + auVar172._12_4_;
          fVar295 = auVar192._16_4_;
          auVar282._16_4_ = fVar295 + auVar190._16_4_ + auVar189._16_4_ + auVar172._16_4_;
          fVar296 = auVar192._20_4_;
          auVar282._20_4_ = fVar296 + auVar190._20_4_ + auVar189._20_4_ + auVar172._20_4_;
          fVar297 = auVar192._24_4_;
          auVar282._24_4_ = fVar297 + auVar190._24_4_ + auVar189._24_4_ + auVar172._24_4_;
          auVar282._28_4_ = auVar192._28_4_ + auVar190._28_4_ + auVar189._28_4_ + auVar172._28_4_;
          auVar317._8_4_ = 0x80000000;
          auVar317._0_8_ = 0x8000000080000000;
          auVar317._12_4_ = 0x80000000;
          auVar317._16_4_ = 0x80000000;
          auVar317._20_4_ = 0x80000000;
          auVar317._24_4_ = 0x80000000;
          auVar317._28_4_ = 0x80000000;
          uVar157 = CONCAT44(auVar282._4_4_,auVar282._0_4_);
          auVar300._0_8_ = uVar157 ^ 0x8000000080000000;
          auVar300._8_4_ = -auVar282._8_4_;
          auVar300._12_4_ = -auVar282._12_4_;
          auVar300._16_4_ = -auVar282._16_4_;
          auVar300._20_4_ = -auVar282._20_4_;
          auVar300._24_4_ = -auVar282._24_4_;
          auVar300._28_4_ = -auVar282._28_4_;
          uVar157 = vcmpps_avx512vl(auVar282,auVar300,1);
          auVar189 = vmaxps_avx(auVar300,auVar282);
          auVar225._8_4_ = 0x7fffffff;
          auVar225._0_8_ = 0x7fffffff7fffffff;
          auVar225._12_4_ = 0x7fffffff;
          auVar225._16_4_ = 0x7fffffff;
          auVar225._20_4_ = 0x7fffffff;
          auVar225._24_4_ = 0x7fffffff;
          auVar225._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar282,auVar225);
          auVar301._8_4_ = 0x3f800000;
          auVar301._0_8_ = &DAT_3f8000003f800000;
          auVar301._12_4_ = 0x3f800000;
          auVar301._16_4_ = 0x3f800000;
          auVar301._20_4_ = 0x3f800000;
          auVar301._24_4_ = 0x3f800000;
          auVar301._28_4_ = 0x3f800000;
          uVar159 = vcmpps_avx512vl(auVar192,auVar301,6);
          auVar38._8_4_ = 0xbb8d3753;
          auVar38._0_8_ = 0xbb8d3753bb8d3753;
          auVar38._12_4_ = 0xbb8d3753;
          auVar38._16_4_ = 0xbb8d3753;
          auVar38._20_4_ = 0xbb8d3753;
          auVar38._24_4_ = 0xbb8d3753;
          auVar38._28_4_ = 0xbb8d3753;
          auVar172 = vmulps_avx512vl(auVar192,auVar38);
          auVar39._8_4_ = 0x3c9df1b8;
          auVar39._0_8_ = 0x3c9df1b83c9df1b8;
          auVar39._12_4_ = 0x3c9df1b8;
          auVar39._16_4_ = 0x3c9df1b8;
          auVar39._20_4_ = 0x3c9df1b8;
          auVar39._24_4_ = 0x3c9df1b8;
          auVar39._28_4_ = 0x3c9df1b8;
          auVar172 = vaddps_avx512vl(auVar172,auVar39);
          auVar109._4_4_ = fVar292 * auVar172._4_4_;
          auVar109._0_4_ = fVar283 * auVar172._0_4_;
          auVar109._8_4_ = fVar293 * auVar172._8_4_;
          auVar109._12_4_ = fVar294 * auVar172._12_4_;
          auVar109._16_4_ = fVar295 * auVar172._16_4_;
          auVar109._20_4_ = fVar296 * auVar172._20_4_;
          auVar109._24_4_ = fVar297 * auVar172._24_4_;
          auVar109._28_4_ = auVar172._28_4_;
          auVar40._8_4_ = 0xbd37e81c;
          auVar40._0_8_ = 0xbd37e81cbd37e81c;
          auVar40._12_4_ = 0xbd37e81c;
          auVar40._16_4_ = 0xbd37e81c;
          auVar40._20_4_ = 0xbd37e81c;
          auVar40._24_4_ = 0xbd37e81c;
          auVar40._28_4_ = 0xbd37e81c;
          auVar172 = vaddps_avx512vl(auVar109,auVar40);
          auVar110._4_4_ = fVar292 * auVar172._4_4_;
          auVar110._0_4_ = fVar283 * auVar172._0_4_;
          auVar110._8_4_ = fVar293 * auVar172._8_4_;
          auVar110._12_4_ = fVar294 * auVar172._12_4_;
          auVar110._16_4_ = fVar295 * auVar172._16_4_;
          auVar110._20_4_ = fVar296 * auVar172._20_4_;
          auVar110._24_4_ = fVar297 * auVar172._24_4_;
          auVar110._28_4_ = auVar172._28_4_;
          auVar41._8_4_ = 0x3db3edac;
          auVar41._0_8_ = 0x3db3edac3db3edac;
          auVar41._12_4_ = 0x3db3edac;
          auVar41._16_4_ = 0x3db3edac;
          auVar41._20_4_ = 0x3db3edac;
          auVar41._24_4_ = 0x3db3edac;
          auVar41._28_4_ = 0x3db3edac;
          auVar172 = vaddps_avx512vl(auVar110,auVar41);
          auVar111._4_4_ = fVar292 * auVar172._4_4_;
          auVar111._0_4_ = fVar283 * auVar172._0_4_;
          auVar111._8_4_ = fVar293 * auVar172._8_4_;
          auVar111._12_4_ = fVar294 * auVar172._12_4_;
          auVar111._16_4_ = fVar295 * auVar172._16_4_;
          auVar111._20_4_ = fVar296 * auVar172._20_4_;
          auVar111._24_4_ = fVar297 * auVar172._24_4_;
          auVar111._28_4_ = auVar172._28_4_;
          auVar42._8_4_ = 0xbe5ba881;
          auVar42._0_8_ = 0xbe5ba881be5ba881;
          auVar42._12_4_ = 0xbe5ba881;
          auVar42._16_4_ = 0xbe5ba881;
          auVar42._20_4_ = 0xbe5ba881;
          auVar42._24_4_ = 0xbe5ba881;
          auVar42._28_4_ = 0xbe5ba881;
          auVar172 = vaddps_avx512vl(auVar111,auVar42);
          auVar112._4_4_ = fVar292 * auVar172._4_4_;
          auVar112._0_4_ = fVar283 * auVar172._0_4_;
          auVar112._8_4_ = fVar293 * auVar172._8_4_;
          auVar112._12_4_ = fVar294 * auVar172._12_4_;
          auVar112._16_4_ = fVar295 * auVar172._16_4_;
          auVar112._20_4_ = fVar296 * auVar172._20_4_;
          auVar112._24_4_ = fVar297 * auVar172._24_4_;
          auVar112._28_4_ = auVar172._28_4_;
          auVar43._8_4_ = 0x3fc90fd1;
          auVar43._0_8_ = 0x3fc90fd13fc90fd1;
          auVar43._12_4_ = 0x3fc90fd1;
          auVar43._16_4_ = 0x3fc90fd1;
          auVar43._20_4_ = 0x3fc90fd1;
          auVar43._24_4_ = 0x3fc90fd1;
          auVar43._28_4_ = 0x3fc90fd1;
          auVar190 = vaddps_avx512vl(auVar112,auVar43);
          auVar172 = vsubps_avx(auVar301,auVar192);
          auVar172 = vsqrtps_avx(auVar172);
          auVar113._4_4_ = auVar172._4_4_ * auVar190._4_4_;
          auVar113._0_4_ = auVar172._0_4_ * auVar190._0_4_;
          auVar113._8_4_ = auVar172._8_4_ * auVar190._8_4_;
          auVar113._12_4_ = auVar172._12_4_ * auVar190._12_4_;
          auVar113._16_4_ = auVar172._16_4_ * auVar190._16_4_;
          auVar113._20_4_ = auVar172._20_4_ * auVar190._20_4_;
          auVar113._24_4_ = auVar172._24_4_ * auVar190._24_4_;
          auVar113._28_4_ = auVar190._28_4_;
          uVar17 = vcmpps_avx512vl(auVar189,ZEXT832(0) << 0x20,1);
          auVar326._8_4_ = 0x3fc90fdb;
          auVar326._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar326._12_4_ = 0x3fc90fdb;
          auVar326._16_4_ = 0x3fc90fdb;
          auVar326._20_4_ = 0x3fc90fdb;
          auVar326._24_4_ = 0x3fc90fdb;
          auVar326._28_4_ = 0x3fc90fdb;
          auVar172 = vsubps_avx(auVar326,auVar113);
          auVar172 = vmaxps_avx(ZEXT832(0) << 0x20,auVar172);
          auVar190 = vxorps_avx512vl(auVar172,auVar317);
          bVar9 = (bool)((byte)uVar17 & 1);
          auVar239._0_4_ = (uint)bVar9 * auVar190._0_4_ | (uint)!bVar9 * auVar172._0_4_;
          bVar9 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar239._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * auVar172._4_4_;
          bVar9 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar239._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * auVar172._8_4_;
          bVar9 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar239._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * auVar172._12_4_;
          bVar9 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar239._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * auVar172._16_4_;
          bVar9 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar239._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * auVar172._20_4_;
          bVar9 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar239._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * auVar172._24_4_;
          bVar9 = SUB81(uVar17 >> 7,0);
          auVar239._28_4_ = (uint)bVar9 * auVar190._28_4_ | (uint)!bVar9 * auVar172._28_4_;
          auVar172 = vsubps_avx(auVar326,auVar239);
          auVar190 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar9 = (bool)((byte)uVar159 & 1);
          bVar10 = (bool)((byte)(uVar159 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar159 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar159 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar159 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar159 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar159 >> 6) & 1);
          bVar16 = SUB81(uVar159 >> 7,0);
          auVar114._4_4_ =
               fVar267 * (float)((uint)bVar10 * auVar190._4_4_ | (uint)!bVar10 * auVar172._4_4_);
          auVar114._0_4_ =
               fVar259 * (float)((uint)bVar9 * auVar190._0_4_ | (uint)!bVar9 * auVar172._0_4_);
          auVar114._8_4_ =
               fVar268 * (float)((uint)bVar11 * auVar190._8_4_ | (uint)!bVar11 * auVar172._8_4_);
          auVar114._12_4_ =
               fVar269 * (float)((uint)bVar12 * auVar190._12_4_ | (uint)!bVar12 * auVar172._12_4_);
          auVar114._16_4_ =
               fVar270 * (float)((uint)bVar13 * auVar190._16_4_ | (uint)!bVar13 * auVar172._16_4_);
          auVar114._20_4_ =
               fVar271 * (float)((uint)bVar14 * auVar190._20_4_ | (uint)!bVar14 * auVar172._20_4_);
          auVar114._24_4_ =
               fVar272 * (float)((uint)bVar15 * auVar190._24_4_ | (uint)!bVar15 * auVar172._24_4_);
          auVar114._28_4_ = (uint)bVar16 * auVar190._28_4_ | (uint)!bVar16 * auVar172._28_4_;
          auVar44._8_4_ = 0x3f22f983;
          auVar44._0_8_ = 0x3f22f9833f22f983;
          auVar44._12_4_ = 0x3f22f983;
          auVar44._16_4_ = 0x3f22f983;
          auVar44._20_4_ = 0x3f22f983;
          auVar44._24_4_ = 0x3f22f983;
          auVar44._28_4_ = 0x3f22f983;
          auVar172 = vmulps_avx512vl(auVar114,auVar44);
          auVar172 = vroundps_avx(auVar172,1);
          auVar115._4_4_ = auVar172._4_4_ * 1.5707964;
          auVar115._0_4_ = auVar172._0_4_ * 1.5707964;
          auVar115._8_4_ = auVar172._8_4_ * 1.5707964;
          auVar115._12_4_ = auVar172._12_4_ * 1.5707964;
          auVar115._16_4_ = auVar172._16_4_ * 1.5707964;
          auVar115._20_4_ = auVar172._20_4_ * 1.5707964;
          auVar115._24_4_ = auVar172._24_4_ * 1.5707964;
          auVar115._28_4_ = 0x3fc90fdb;
          auVar190 = vsubps_avx(auVar114,auVar115);
          auVar172 = vcvtps2dq_avx(auVar172);
          auVar343._8_4_ = 1;
          auVar343._0_8_ = 0x100000001;
          auVar343._12_4_ = 1;
          auVar343._16_4_ = 1;
          auVar343._20_4_ = 1;
          auVar343._24_4_ = 1;
          auVar343._28_4_ = 1;
          uVar19 = vptestnmd_avx512vl(auVar172,auVar343);
          auVar45._8_4_ = 3;
          auVar45._0_8_ = 0x300000003;
          auVar45._12_4_ = 3;
          auVar45._16_4_ = 3;
          auVar45._20_4_ = 3;
          auVar45._24_4_ = 3;
          auVar45._28_4_ = 3;
          auVar194 = vpandd_avx512vl(auVar172,auVar45);
          uVar159 = vpcmpgtd_avx512vl(auVar194,auVar343);
          auVar192 = vpcmpeqd_avx2(auVar343,auVar343);
          auVar192 = vpaddd_avx2(auVar194,auVar192);
          auVar46._8_4_ = 2;
          auVar46._0_8_ = 0x200000002;
          auVar46._12_4_ = 2;
          auVar46._16_4_ = 2;
          auVar46._20_4_ = 2;
          auVar46._24_4_ = 2;
          auVar46._28_4_ = 2;
          uVar17 = vpcmpud_avx512vl(auVar192,auVar46,1);
          auVar194 = vpslld_avx2(auVar172,0x1f);
          fVar283 = auVar190._0_4_;
          fVar357 = fVar283 * fVar283;
          fVar292 = auVar190._4_4_;
          fVar360 = fVar292 * fVar292;
          auVar116._4_4_ = fVar360;
          auVar116._0_4_ = fVar357;
          fVar293 = auVar190._8_4_;
          fVar362 = fVar293 * fVar293;
          auVar116._8_4_ = fVar362;
          fVar294 = auVar190._12_4_;
          fVar332 = fVar294 * fVar294;
          auVar116._12_4_ = fVar332;
          fVar295 = auVar190._16_4_;
          fVar334 = fVar295 * fVar295;
          auVar116._16_4_ = fVar334;
          fVar296 = auVar190._20_4_;
          fVar336 = fVar296 * fVar296;
          auVar116._20_4_ = fVar336;
          fVar297 = auVar190._24_4_;
          fVar338 = fVar297 * fVar297;
          auVar116._24_4_ = fVar338;
          auVar116._28_4_ = auVar192._28_4_;
          auVar47._8_4_ = 0xb2d70013;
          auVar47._0_8_ = 0xb2d70013b2d70013;
          auVar47._12_4_ = 0xb2d70013;
          auVar47._16_4_ = 0xb2d70013;
          auVar47._20_4_ = 0xb2d70013;
          auVar47._24_4_ = 0xb2d70013;
          auVar47._28_4_ = 0xb2d70013;
          auVar172 = vmulps_avx512vl(auVar116,auVar47);
          auVar48._8_4_ = 0x363938a8;
          auVar48._0_8_ = 0x363938a8363938a8;
          auVar48._12_4_ = 0x363938a8;
          auVar48._16_4_ = 0x363938a8;
          auVar48._20_4_ = 0x363938a8;
          auVar48._24_4_ = 0x363938a8;
          auVar48._28_4_ = 0x363938a8;
          auVar172 = vaddps_avx512vl(auVar172,auVar48);
          auVar49._8_4_ = 0xb48b634d;
          auVar49._0_8_ = 0xb48b634db48b634d;
          auVar49._12_4_ = 0xb48b634d;
          auVar49._16_4_ = 0xb48b634d;
          auVar49._20_4_ = 0xb48b634d;
          auVar49._24_4_ = 0xb48b634d;
          auVar49._28_4_ = 0xb48b634d;
          auVar190 = vmulps_avx512vl(auVar116,auVar49);
          uVar164 = vpmovd2m_avx512vl(auVar194);
          auVar50._8_4_ = 0x37cfab9c;
          auVar50._0_8_ = 0x37cfab9c37cfab9c;
          auVar50._12_4_ = 0x37cfab9c;
          auVar50._16_4_ = 0x37cfab9c;
          auVar50._20_4_ = 0x37cfab9c;
          auVar50._24_4_ = 0x37cfab9c;
          auVar50._28_4_ = 0x37cfab9c;
          auVar190 = vaddps_avx512vl(auVar190,auVar50);
          auVar117._4_4_ = fVar360 * auVar172._4_4_;
          auVar117._0_4_ = fVar357 * auVar172._0_4_;
          auVar117._8_4_ = fVar362 * auVar172._8_4_;
          auVar117._12_4_ = fVar332 * auVar172._12_4_;
          auVar117._16_4_ = fVar334 * auVar172._16_4_;
          auVar117._20_4_ = fVar336 * auVar172._20_4_;
          auVar117._24_4_ = fVar338 * auVar172._24_4_;
          auVar117._28_4_ = auVar172._28_4_;
          auVar51._8_4_ = 0xb9501096;
          auVar51._0_8_ = 0xb9501096b9501096;
          auVar51._12_4_ = 0xb9501096;
          auVar51._16_4_ = 0xb9501096;
          auVar51._20_4_ = 0xb9501096;
          auVar51._24_4_ = 0xb9501096;
          auVar51._28_4_ = 0xb9501096;
          auVar172 = vaddps_avx512vl(auVar117,auVar51);
          auVar118._4_4_ = fVar360 * auVar190._4_4_;
          auVar118._0_4_ = fVar357 * auVar190._0_4_;
          auVar118._8_4_ = fVar362 * auVar190._8_4_;
          auVar118._12_4_ = fVar332 * auVar190._12_4_;
          auVar118._16_4_ = fVar334 * auVar190._16_4_;
          auVar118._20_4_ = fVar336 * auVar190._20_4_;
          auVar118._24_4_ = fVar338 * auVar190._24_4_;
          auVar118._28_4_ = auVar190._28_4_;
          auVar52._8_4_ = 0xbab60981;
          auVar52._0_8_ = 0xbab60981bab60981;
          auVar52._12_4_ = 0xbab60981;
          auVar52._16_4_ = 0xbab60981;
          auVar52._20_4_ = 0xbab60981;
          auVar52._24_4_ = 0xbab60981;
          auVar52._28_4_ = 0xbab60981;
          auVar190 = vaddps_avx512vl(auVar118,auVar52);
          auVar119._4_4_ = fVar360 * auVar172._4_4_;
          auVar119._0_4_ = fVar357 * auVar172._0_4_;
          auVar119._8_4_ = fVar362 * auVar172._8_4_;
          auVar119._12_4_ = fVar332 * auVar172._12_4_;
          auVar119._16_4_ = fVar334 * auVar172._16_4_;
          auVar119._20_4_ = fVar336 * auVar172._20_4_;
          auVar119._24_4_ = fVar338 * auVar172._24_4_;
          auVar119._28_4_ = auVar172._28_4_;
          auVar53._8_4_ = 0x3c088898;
          auVar53._0_8_ = 0x3c0888983c088898;
          auVar53._12_4_ = 0x3c088898;
          auVar53._16_4_ = 0x3c088898;
          auVar53._20_4_ = 0x3c088898;
          auVar53._24_4_ = 0x3c088898;
          auVar53._28_4_ = 0x3c088898;
          auVar172 = vaddps_avx512vl(auVar119,auVar53);
          auVar120._4_4_ = fVar360 * auVar190._4_4_;
          auVar120._0_4_ = fVar357 * auVar190._0_4_;
          auVar120._8_4_ = fVar362 * auVar190._8_4_;
          auVar120._12_4_ = fVar332 * auVar190._12_4_;
          auVar120._16_4_ = fVar334 * auVar190._16_4_;
          auVar120._20_4_ = fVar336 * auVar190._20_4_;
          auVar120._24_4_ = fVar338 * auVar190._24_4_;
          auVar120._28_4_ = auVar190._28_4_;
          auVar54._8_4_ = 0x3d2aaaa4;
          auVar54._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar54._12_4_ = 0x3d2aaaa4;
          auVar54._16_4_ = 0x3d2aaaa4;
          auVar54._20_4_ = 0x3d2aaaa4;
          auVar54._24_4_ = 0x3d2aaaa4;
          auVar54._28_4_ = 0x3d2aaaa4;
          auVar190 = vaddps_avx512vl(auVar120,auVar54);
          auVar121._4_4_ = fVar360 * auVar172._4_4_;
          auVar121._0_4_ = fVar357 * auVar172._0_4_;
          auVar121._8_4_ = fVar362 * auVar172._8_4_;
          auVar121._12_4_ = fVar332 * auVar172._12_4_;
          auVar121._16_4_ = fVar334 * auVar172._16_4_;
          auVar121._20_4_ = fVar336 * auVar172._20_4_;
          auVar121._24_4_ = fVar338 * auVar172._24_4_;
          auVar121._28_4_ = auVar172._28_4_;
          auVar55._8_4_ = 0xbe2aaaab;
          auVar55._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar55._12_4_ = 0xbe2aaaab;
          auVar55._16_4_ = 0xbe2aaaab;
          auVar55._20_4_ = 0xbe2aaaab;
          auVar55._24_4_ = 0xbe2aaaab;
          auVar55._28_4_ = 0xbe2aaaab;
          auVar172 = vaddps_avx512vl(auVar121,auVar55);
          fVar358 = auVar190._28_4_ + -0.5;
          fVar351 = auVar172._28_4_;
          fVar359 = fVar357 * auVar172._0_4_ + 1.0;
          fVar361 = fVar360 * auVar172._4_4_ + 1.0;
          fVar331 = fVar362 * auVar172._8_4_ + 1.0;
          fVar333 = fVar332 * auVar172._12_4_ + 1.0;
          fVar335 = fVar334 * auVar172._16_4_ + 1.0;
          fVar337 = fVar336 * auVar172._20_4_ + 1.0;
          fVar339 = fVar338 * auVar172._24_4_ + 1.0;
          fVar283 = fVar359 * fVar283;
          fVar292 = fVar361 * fVar292;
          auVar122._4_4_ = fVar292;
          auVar122._0_4_ = fVar283;
          fVar293 = fVar331 * fVar293;
          auVar122._8_4_ = fVar293;
          fVar294 = fVar333 * fVar294;
          auVar122._12_4_ = fVar294;
          fVar295 = fVar335 * fVar295;
          auVar122._16_4_ = fVar295;
          fVar296 = fVar337 * fVar296;
          auVar122._20_4_ = fVar296;
          fVar297 = fVar339 * fVar297;
          auVar122._24_4_ = fVar297;
          auVar122._28_4_ = fVar351;
          auVar324._0_4_ = fVar357 * (fVar357 * auVar190._0_4_ + -0.5) + 1.0;
          auVar324._4_4_ = fVar360 * (fVar360 * auVar190._4_4_ + -0.5) + 1.0;
          auVar324._8_4_ = fVar362 * (fVar362 * auVar190._8_4_ + -0.5) + 1.0;
          auVar324._12_4_ = fVar332 * (fVar332 * auVar190._12_4_ + -0.5) + 1.0;
          auVar324._16_4_ = fVar334 * (fVar334 * auVar190._16_4_ + -0.5) + 1.0;
          auVar324._20_4_ = fVar336 * (fVar336 * auVar190._20_4_ + -0.5) + 1.0;
          auVar324._24_4_ = fVar338 * (fVar338 * auVar190._24_4_ + -0.5) + 1.0;
          auVar324._28_4_ = fVar358 + 1.0;
          auVar172 = vblendmps_avx512vl(auVar122,auVar324);
          bVar9 = (bool)((byte)uVar164 & 1);
          auVar240._0_4_ = (uint)bVar9 * auVar172._0_4_ | (uint)!bVar9 * (int)fVar359;
          bVar9 = (bool)((byte)(uVar164 >> 1) & 1);
          auVar240._4_4_ = (uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * (int)fVar361;
          bVar9 = (bool)((byte)(uVar164 >> 2) & 1);
          auVar240._8_4_ = (uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * (int)fVar331;
          bVar9 = (bool)((byte)(uVar164 >> 3) & 1);
          auVar240._12_4_ = (uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * (int)fVar333;
          bVar9 = (bool)((byte)(uVar164 >> 4) & 1);
          auVar240._16_4_ = (uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * (int)fVar335;
          bVar9 = (bool)((byte)(uVar164 >> 5) & 1);
          auVar240._20_4_ = (uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * (int)fVar337;
          bVar9 = (bool)((byte)(uVar164 >> 6) & 1);
          auVar240._24_4_ = (uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * (int)fVar339;
          bVar9 = (bool)((byte)(uVar164 >> 7) & 1);
          auVar240._28_4_ = (uint)bVar9 * auVar172._28_4_ | (uint)!bVar9 * (int)(fVar351 + 1.0);
          bVar9 = (bool)((byte)uVar19 & 1);
          auVar241._0_4_ = (uint)bVar9 * (int)auVar324._0_4_ | (uint)!bVar9 * (int)fVar283;
          bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
          auVar241._4_4_ = (uint)bVar9 * (int)auVar324._4_4_ | (uint)!bVar9 * (int)fVar292;
          bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
          auVar241._8_4_ = (uint)bVar9 * (int)auVar324._8_4_ | (uint)!bVar9 * (int)fVar293;
          bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
          auVar241._12_4_ = (uint)bVar9 * (int)auVar324._12_4_ | (uint)!bVar9 * (int)fVar294;
          bVar9 = (bool)((byte)(uVar19 >> 4) & 1);
          auVar241._16_4_ = (uint)bVar9 * (int)auVar324._16_4_ | (uint)!bVar9 * (int)fVar295;
          bVar9 = (bool)((byte)(uVar19 >> 5) & 1);
          auVar241._20_4_ = (uint)bVar9 * (int)auVar324._20_4_ | (uint)!bVar9 * (int)fVar296;
          bVar9 = (bool)((byte)(uVar19 >> 6) & 1);
          auVar241._24_4_ = (uint)bVar9 * (int)auVar324._24_4_ | (uint)!bVar9 * (int)fVar297;
          bVar9 = SUB81(uVar19 >> 7,0);
          auVar241._28_4_ = (uint)bVar9 * (int)auVar324._28_4_ | (uint)!bVar9 * (int)fVar351;
          auVar172 = vxorps_avx512vl(auVar219,auVar317);
          bVar156 = (byte)uVar157;
          auVar242._0_4_ =
               (uint)(bVar156 & 1) * auVar172._0_4_ | !(bool)(bVar156 & 1) * auVar219._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar242._4_4_ = (uint)bVar9 * auVar172._4_4_ | !bVar9 * auVar219._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar242._8_4_ = (uint)bVar9 * auVar172._8_4_ | !bVar9 * auVar219._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar242._12_4_ = (uint)bVar9 * auVar172._12_4_ | !bVar9 * auVar219._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar242._16_4_ = (uint)bVar9 * auVar172._16_4_ | !bVar9 * auVar219._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar242._20_4_ = (uint)bVar9 * auVar172._20_4_ | !bVar9 * auVar219._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar242._24_4_ = (uint)bVar9 * auVar172._24_4_ | !bVar9 * auVar219._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar242._28_4_ = (uint)bVar9 * auVar172._28_4_ | !bVar9 * auVar219._28_4_;
          auVar172 = vxorps_avx512vl(auVar203,auVar317);
          auVar243._0_4_ =
               (uint)(bVar156 & 1) * auVar172._0_4_ | !(bool)(bVar156 & 1) * auVar203._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar243._4_4_ = (uint)bVar9 * auVar172._4_4_ | !bVar9 * auVar203._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar243._8_4_ = (uint)bVar9 * auVar172._8_4_ | !bVar9 * auVar203._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar243._12_4_ = (uint)bVar9 * auVar172._12_4_ | !bVar9 * auVar203._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar243._16_4_ = (uint)bVar9 * auVar172._16_4_ | !bVar9 * auVar203._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar243._20_4_ = (uint)bVar9 * auVar172._20_4_ | !bVar9 * auVar203._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar243._24_4_ = (uint)bVar9 * auVar172._24_4_ | !bVar9 * auVar203._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar243._28_4_ = (uint)bVar9 * auVar172._28_4_ | !bVar9 * auVar203._28_4_;
          auVar172 = vxorps_avx512vl(auVar217,auVar317);
          auVar244._0_4_ =
               (uint)(bVar156 & 1) * auVar172._0_4_ | !(bool)(bVar156 & 1) * auVar217._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar244._4_4_ = (uint)bVar9 * auVar172._4_4_ | !bVar9 * auVar217._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar244._8_4_ = (uint)bVar9 * auVar172._8_4_ | !bVar9 * auVar217._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar244._12_4_ = (uint)bVar9 * auVar172._12_4_ | !bVar9 * auVar217._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar244._16_4_ = (uint)bVar9 * auVar172._16_4_ | !bVar9 * auVar217._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar244._20_4_ = (uint)bVar9 * auVar172._20_4_ | !bVar9 * auVar217._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar244._24_4_ = (uint)bVar9 * auVar172._24_4_ | !bVar9 * auVar217._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar244._28_4_ = (uint)bVar9 * auVar172._28_4_ | !bVar9 * auVar217._28_4_;
          auVar172 = vxorps_avx512vl(auVar218,auVar317);
          auVar245._0_4_ =
               (uint)(bVar156 & 1) * auVar172._0_4_ | !(bool)(bVar156 & 1) * auVar218._0_4_;
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar245._4_4_ = (uint)bVar9 * auVar172._4_4_ | !bVar9 * auVar218._4_4_;
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar245._8_4_ = (uint)bVar9 * auVar172._8_4_ | !bVar9 * auVar218._8_4_;
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar245._12_4_ = (uint)bVar9 * auVar172._12_4_ | !bVar9 * auVar218._12_4_;
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          auVar245._16_4_ = (uint)bVar9 * auVar172._16_4_ | !bVar9 * auVar218._16_4_;
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          auVar245._20_4_ = (uint)bVar9 * auVar172._20_4_ | !bVar9 * auVar218._20_4_;
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          auVar245._24_4_ = (uint)bVar9 * auVar172._24_4_ | !bVar9 * auVar218._24_4_;
          bVar9 = SUB81(uVar157 >> 7,0);
          auVar245._28_4_ = (uint)bVar9 * auVar172._28_4_ | !bVar9 * auVar218._28_4_;
          auVar172 = vxorps_avx512vl(auVar240,auVar317);
          bVar9 = (bool)((byte)uVar159 & 1);
          fVar165 = (float)((uint)bVar9 * auVar172._0_4_ | !bVar9 * auVar240._0_4_);
          bVar9 = (bool)((byte)(uVar159 >> 1) & 1);
          fVar247 = (float)((uint)bVar9 * auVar172._4_4_ | !bVar9 * auVar240._4_4_);
          bVar9 = (bool)((byte)(uVar159 >> 2) & 1);
          fVar248 = (float)((uint)bVar9 * auVar172._8_4_ | !bVar9 * auVar240._8_4_);
          bVar9 = (bool)((byte)(uVar159 >> 3) & 1);
          fVar249 = (float)((uint)bVar9 * auVar172._12_4_ | !bVar9 * auVar240._12_4_);
          bVar9 = (bool)((byte)(uVar159 >> 4) & 1);
          fVar250 = (float)((uint)bVar9 * auVar172._16_4_ | !bVar9 * auVar240._16_4_);
          bVar9 = (bool)((byte)(uVar159 >> 5) & 1);
          fVar251 = (float)((uint)bVar9 * auVar172._20_4_ | !bVar9 * auVar240._20_4_);
          bVar9 = (bool)((byte)(uVar159 >> 6) & 1);
          fVar256 = (float)((uint)bVar9 * auVar172._24_4_ | !bVar9 * auVar240._24_4_);
          bVar10 = SUB81(uVar159 >> 7,0);
          auVar190 = vxorps_avx512vl(auVar241,auVar317);
          bVar9 = (bool)((byte)uVar17 & 1);
          auVar246._0_4_ = (uint)bVar9 * auVar190._0_4_ | !bVar9 * auVar241._0_4_;
          bVar9 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar246._4_4_ = (uint)bVar9 * auVar190._4_4_ | !bVar9 * auVar241._4_4_;
          bVar9 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar246._8_4_ = (uint)bVar9 * auVar190._8_4_ | !bVar9 * auVar241._8_4_;
          bVar9 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar246._12_4_ = (uint)bVar9 * auVar190._12_4_ | !bVar9 * auVar241._12_4_;
          bVar9 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar246._16_4_ = (uint)bVar9 * auVar190._16_4_ | !bVar9 * auVar241._16_4_;
          bVar9 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar246._20_4_ = (uint)bVar9 * auVar190._20_4_ | !bVar9 * auVar241._20_4_;
          bVar9 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar246._24_4_ = (uint)bVar9 * auVar190._24_4_ | !bVar9 * auVar241._24_4_;
          bVar9 = SUB81(uVar17 >> 7,0);
          auVar246._28_4_ = (uint)bVar9 * auVar190._28_4_ | !bVar9 * auVar241._28_4_;
          auVar190 = vfmsub213ps_avx512vl(auVar198,auVar189,auVar242);
          auVar166 = vfmsub213ps_fma(auVar173,auVar189,auVar243);
          fVar283 = auVar190._0_4_;
          fVar296 = auVar190._4_4_;
          fVar359 = auVar190._8_4_;
          fVar332 = auVar190._12_4_;
          fVar337 = auVar190._16_4_;
          fVar252 = auVar190._20_4_;
          fVar255 = auVar190._24_4_;
          fVar292 = auVar166._0_4_;
          fVar297 = auVar166._4_4_;
          fVar360 = auVar166._8_4_;
          fVar333 = auVar166._12_4_;
          auVar192 = vfmsub213ps_avx512vl(auVar195,auVar189,auVar244);
          fVar293 = auVar192._0_4_;
          fVar351 = auVar192._4_4_;
          fVar361 = auVar192._8_4_;
          fVar334 = auVar192._12_4_;
          fVar338 = auVar192._16_4_;
          fVar253 = auVar192._20_4_;
          fVar257 = auVar192._24_4_;
          auVar192 = vfmsub213ps_avx512vl(auVar196,auVar189,auVar245);
          fVar294 = auVar192._0_4_;
          fVar357 = auVar192._4_4_;
          fVar362 = auVar192._8_4_;
          fVar335 = auVar192._12_4_;
          fVar339 = auVar192._16_4_;
          fVar254 = auVar192._20_4_;
          fVar258 = auVar192._24_4_;
          auVar327._0_4_ =
               fVar294 * fVar294 + fVar293 * fVar293 + fVar292 * fVar292 + fVar283 * fVar283;
          auVar327._4_4_ =
               fVar357 * fVar357 + fVar351 * fVar351 + fVar297 * fVar297 + fVar296 * fVar296;
          auVar327._8_4_ =
               fVar362 * fVar362 + fVar361 * fVar361 + fVar360 * fVar360 + fVar359 * fVar359;
          auVar327._12_4_ =
               fVar335 * fVar335 + fVar334 * fVar334 + fVar333 * fVar333 + fVar332 * fVar332;
          auVar327._16_4_ = fVar339 * fVar339 + fVar338 * fVar338 + fVar337 * fVar337 + 0.0;
          auVar327._20_4_ = fVar254 * fVar254 + fVar253 * fVar253 + fVar252 * fVar252 + 0.0;
          auVar327._24_4_ = fVar258 * fVar258 + fVar257 * fVar257 + fVar255 * fVar255 + 0.0;
          auVar327._28_4_ = fStack_144 + fVar358 + 1.4013e-45 + 2.8026e-45;
          auVar192 = vrsqrt14ps_avx512vl(auVar327);
          fVar295 = auVar192._0_4_;
          fVar358 = auVar192._4_4_;
          fVar331 = auVar192._8_4_;
          fVar336 = auVar192._12_4_;
          fVar370 = auVar192._16_4_;
          fVar371 = auVar192._20_4_;
          fVar372 = auVar192._24_4_;
          auVar123._4_4_ = fVar358 * fVar358 * fVar358 * auVar327._4_4_ * -0.5;
          auVar123._0_4_ = fVar295 * fVar295 * fVar295 * auVar327._0_4_ * -0.5;
          auVar123._8_4_ = fVar331 * fVar331 * fVar331 * auVar327._8_4_ * -0.5;
          auVar123._12_4_ = fVar336 * fVar336 * fVar336 * auVar327._12_4_ * -0.5;
          auVar123._16_4_ = fVar370 * fVar370 * fVar370 * auVar327._16_4_ * -0.5;
          auVar123._20_4_ = fVar371 * fVar371 * fVar371 * auVar327._20_4_ * -0.5;
          auVar123._24_4_ = fVar372 * fVar372 * fVar372 * auVar327._24_4_ * -0.5;
          auVar123._28_4_ = auVar327._28_4_;
          auVar375._8_4_ = 0x3fc00000;
          auVar375._0_8_ = 0x3fc000003fc00000;
          auVar375._12_4_ = 0x3fc00000;
          auVar375._16_4_ = 0x3fc00000;
          auVar375._20_4_ = 0x3fc00000;
          auVar375._24_4_ = 0x3fc00000;
          auVar375._28_4_ = 0x3fc00000;
          auVar166 = vfmadd231ps_fma(auVar123,auVar375,auVar192);
          fVar295 = auVar166._0_4_;
          fVar358 = auVar166._4_4_;
          fVar331 = auVar166._8_4_;
          fVar336 = auVar166._12_4_;
          auVar124._4_4_ = fVar247 * fVar296 * fVar358;
          auVar124._0_4_ = fVar165 * fVar283 * fVar295;
          auVar124._8_4_ = fVar248 * fVar359 * fVar331;
          auVar124._12_4_ = fVar249 * fVar332 * fVar336;
          auVar124._16_4_ = fVar250 * fVar337 * 0.0;
          auVar124._20_4_ = fVar251 * fVar252 * 0.0;
          auVar124._24_4_ = fVar256 * fVar255 * 0.0;
          auVar124._28_4_ = auVar190._28_4_;
          auVar125._4_4_ = fVar247 * fVar297 * fVar358;
          auVar125._0_4_ = fVar165 * fVar292 * fVar295;
          auVar125._8_4_ = fVar248 * fVar360 * fVar331;
          auVar125._12_4_ = fVar249 * fVar333 * fVar336;
          auVar125._16_4_ = fVar250 * 0.0;
          auVar125._20_4_ = fVar251 * 0.0;
          auVar125._24_4_ = fVar256 * 0.0;
          auVar125._28_4_ = 0;
          auVar328._0_4_ = fVar293 * fVar295 * fVar165;
          auVar328._4_4_ = fVar351 * fVar358 * fVar247;
          auVar328._8_4_ = fVar361 * fVar331 * fVar248;
          auVar328._12_4_ = fVar334 * fVar336 * fVar249;
          auVar328._16_4_ = fVar338 * 0.0 * fVar250;
          auVar328._20_4_ = fVar253 * 0.0 * fVar251;
          auVar328._24_4_ = fVar257 * 0.0 * fVar256;
          auVar328._28_4_ = 0;
          auVar126._4_4_ = fVar357 * fVar358 * fVar247;
          auVar126._0_4_ = fVar294 * fVar295 * fVar165;
          auVar126._8_4_ = fVar362 * fVar331 * fVar248;
          auVar126._12_4_ = fVar335 * fVar336 * fVar249;
          auVar126._16_4_ = fVar339 * 0.0 * fVar250;
          auVar126._20_4_ = fVar254 * 0.0 * fVar251;
          auVar126._24_4_ = fVar258 * 0.0 * fVar256;
          auVar126._28_4_ = (uint)bVar10 * auVar172._28_4_ | !bVar10 * auVar240._28_4_;
          auVar172 = vfmsub231ps_avx512vl(auVar124,auVar246,auVar198);
          auVar190 = vfmsub231ps_avx512vl(auVar125,auVar246,auVar173);
          auVar194 = vfmsub231ps_avx512vl(auVar328,auVar246,auVar195);
          auVar197 = vfmsub231ps_avx512vl(auVar126,auVar196,auVar246);
          auVar203 = vsubps_avx512vl(auVar242,auVar198);
          auVar198 = vfmadd213ps_avx512vl(auVar203,auVar191,auVar198);
          auVar203 = vsubps_avx512vl(auVar243,auVar173);
          auVar173 = vfmadd213ps_avx512vl(auVar203,auVar191,auVar173);
          auVar203 = vsubps_avx512vl(auVar244,auVar195);
          auVar195 = vfmadd213ps_avx512vl(auVar203,auVar191,auVar195);
          auVar203 = vsubps_avx512vl(auVar245,auVar196);
          auVar196 = vfmadd213ps_avx512vl(auVar203,auVar191,auVar196);
          fVar283 = in_ZMM15._28_4_;
          auVar368._0_4_ =
               auVar196._0_4_ * auVar196._0_4_ +
               auVar195._0_4_ * auVar195._0_4_ +
               auVar198._0_4_ * auVar198._0_4_ + auVar173._0_4_ * auVar173._0_4_;
          auVar368._4_4_ =
               auVar196._4_4_ * auVar196._4_4_ +
               auVar195._4_4_ * auVar195._4_4_ +
               auVar198._4_4_ * auVar198._4_4_ + auVar173._4_4_ * auVar173._4_4_;
          auVar368._8_4_ =
               auVar196._8_4_ * auVar196._8_4_ +
               auVar195._8_4_ * auVar195._8_4_ +
               auVar198._8_4_ * auVar198._8_4_ + auVar173._8_4_ * auVar173._8_4_;
          auVar368._12_4_ =
               auVar196._12_4_ * auVar196._12_4_ +
               auVar195._12_4_ * auVar195._12_4_ +
               auVar198._12_4_ * auVar198._12_4_ + auVar173._12_4_ * auVar173._12_4_;
          auVar368._16_4_ =
               auVar196._16_4_ * auVar196._16_4_ +
               auVar195._16_4_ * auVar195._16_4_ +
               auVar198._16_4_ * auVar198._16_4_ + auVar173._16_4_ * auVar173._16_4_;
          auVar368._20_4_ =
               auVar196._20_4_ * auVar196._20_4_ +
               auVar195._20_4_ * auVar195._20_4_ +
               auVar198._20_4_ * auVar198._20_4_ + auVar173._20_4_ * auVar173._20_4_;
          auVar368._24_4_ =
               auVar196._24_4_ * auVar196._24_4_ +
               auVar195._24_4_ * auVar195._24_4_ +
               auVar198._24_4_ * auVar198._24_4_ + auVar173._24_4_ * auVar173._24_4_;
          auVar368._28_4_ = fVar283 + fVar283 + auVar192._28_4_ + fVar283;
          auVar192 = vrsqrt14ps_avx512vl(auVar368);
          fVar283 = auVar192._0_4_;
          fVar292 = auVar192._4_4_;
          fVar293 = auVar192._8_4_;
          fVar294 = auVar192._12_4_;
          fVar295 = auVar192._16_4_;
          fVar296 = auVar192._20_4_;
          fVar297 = auVar192._24_4_;
          auVar127._4_4_ = auVar368._4_4_ * -0.5 * fVar292 * fVar292 * fVar292;
          auVar127._0_4_ = auVar368._0_4_ * -0.5 * fVar283 * fVar283 * fVar283;
          auVar127._8_4_ = auVar368._8_4_ * -0.5 * fVar293 * fVar293 * fVar293;
          auVar127._12_4_ = auVar368._12_4_ * -0.5 * fVar294 * fVar294 * fVar294;
          auVar127._16_4_ = auVar368._16_4_ * -0.5 * fVar295 * fVar295 * fVar295;
          auVar127._20_4_ = auVar368._20_4_ * -0.5 * fVar296 * fVar296 * fVar296;
          auVar127._24_4_ = auVar368._24_4_ * -0.5 * fVar297 * fVar297 * fVar297;
          auVar127._28_4_ = 0xbf000000;
          auVar166 = vfmadd231ps_fma(auVar127,auVar192,auVar375);
          auVar56._8_4_ = 0x3f7fdf3b;
          auVar56._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar56._12_4_ = 0x3f7fdf3b;
          auVar56._16_4_ = 0x3f7fdf3b;
          auVar56._20_4_ = 0x3f7fdf3b;
          auVar56._24_4_ = 0x3f7fdf3b;
          auVar56._28_4_ = 0x3f7fdf3b;
          uVar157 = vcmpps_avx512vl(auVar189,auVar56,6);
          auVar189 = vmulps_avx512vl(auVar198,ZEXT1632(auVar166));
          bVar156 = (byte)uVar157;
          fVar294 = (float)((uint)(bVar156 & 1) * auVar189._0_4_ |
                           (uint)!(bool)(bVar156 & 1) * auVar172._0_4_);
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          fVar351 = (float)((uint)bVar9 * auVar189._4_4_ | (uint)!bVar9 * auVar172._4_4_);
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          fVar360 = (float)((uint)bVar9 * auVar189._8_4_ | (uint)!bVar9 * auVar172._8_4_);
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          fVar332 = (float)((uint)bVar9 * auVar189._12_4_ | (uint)!bVar9 * auVar172._12_4_);
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          fVar336 = (float)((uint)bVar9 * auVar189._16_4_ | (uint)!bVar9 * auVar172._16_4_);
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          fVar252 = (float)((uint)bVar9 * auVar189._20_4_ | (uint)!bVar9 * auVar172._20_4_);
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          fVar257 = (float)((uint)bVar9 * auVar189._24_4_ | (uint)!bVar9 * auVar172._24_4_);
          bVar9 = SUB81(uVar157 >> 7,0);
          fVar248 = (float)((uint)bVar9 * auVar189._28_4_ | (uint)!bVar9 * auVar172._28_4_);
          auVar172 = vmulps_avx512vl(auVar173,ZEXT1632(auVar166));
          fVar295 = (float)((uint)(bVar156 & 1) * auVar172._0_4_ |
                           (uint)!(bool)(bVar156 & 1) * auVar190._0_4_);
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          fVar357 = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * auVar190._4_4_);
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          fVar361 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * auVar190._8_4_);
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          fVar333 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * auVar190._12_4_);
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          fVar337 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * auVar190._16_4_);
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          fVar253 = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * auVar190._20_4_);
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          fVar258 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * auVar190._24_4_);
          auVar172 = vmulps_avx512vl(auVar195,ZEXT1632(auVar166));
          fVar296 = (float)((uint)(bVar156 & 1) * auVar172._0_4_ |
                           (uint)!(bool)(bVar156 & 1) * auVar194._0_4_);
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          fVar358 = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * auVar194._4_4_);
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          fVar362 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * auVar194._8_4_);
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          fVar334 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * auVar194._12_4_);
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          fVar338 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * auVar194._16_4_);
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          fVar254 = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * auVar194._20_4_);
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          fVar165 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * auVar194._24_4_);
          auVar172 = vmulps_avx512vl(auVar196,ZEXT1632(auVar166));
          fVar297 = (float)((uint)(bVar156 & 1) * auVar172._0_4_ |
                           (uint)!(bool)(bVar156 & 1) * auVar197._0_4_);
          bVar9 = (bool)((byte)(uVar157 >> 1) & 1);
          fVar359 = (float)((uint)bVar9 * auVar172._4_4_ | (uint)!bVar9 * auVar197._4_4_);
          bVar9 = (bool)((byte)(uVar157 >> 2) & 1);
          fVar331 = (float)((uint)bVar9 * auVar172._8_4_ | (uint)!bVar9 * auVar197._8_4_);
          bVar9 = (bool)((byte)(uVar157 >> 3) & 1);
          fVar335 = (float)((uint)bVar9 * auVar172._12_4_ | (uint)!bVar9 * auVar197._12_4_);
          bVar9 = (bool)((byte)(uVar157 >> 4) & 1);
          fVar339 = (float)((uint)bVar9 * auVar172._16_4_ | (uint)!bVar9 * auVar197._16_4_);
          bVar9 = (bool)((byte)(uVar157 >> 5) & 1);
          fVar255 = (float)((uint)bVar9 * auVar172._20_4_ | (uint)!bVar9 * auVar197._20_4_);
          bVar9 = (bool)((byte)(uVar157 >> 6) & 1);
          fVar247 = (float)((uint)bVar9 * auVar172._24_4_ | (uint)!bVar9 * auVar197._24_4_);
          auVar172 = vsubps_avx(auVar301,auVar191);
          auVar189 = vmulps_avx512vl(auVar191,auVar199);
          auVar200 = vfmadd213ps_avx512vl(auVar200,auVar172,auVar189);
          auVar189 = vmulps_avx512vl(auVar191,auVar201);
          auVar193 = vfmadd213ps_avx512vl(auVar193,auVar172,auVar189);
          auVar189 = vmulps_avx512vl(auVar191,auVar202);
          auVar154._4_4_ = uStack_13c;
          auVar154._0_4_ = local_140;
          auVar154._8_4_ = uStack_138;
          auVar154._12_4_ = uStack_134;
          auVar154._16_4_ = uStack_130;
          auVar154._20_4_ = uStack_12c;
          auVar154._24_4_ = uStack_128;
          auVar154._28_4_ = uStack_124;
          auVar173 = vfmadd213ps_avx512vl(auVar154,auVar172,auVar189);
          auVar189 = vmulps_avx512vl(auVar191,auVar214);
          auVar190 = vmulps_avx512vl(auVar191,auVar221);
          auVar194 = vmulps_avx512vl(auVar191,auVar222);
          auVar153._4_4_ = uStack_19c;
          auVar153._0_4_ = local_1a0;
          auVar153._8_4_ = uStack_198;
          auVar153._12_4_ = uStack_194;
          auVar153._16_4_ = uStack_190;
          auVar153._20_4_ = uStack_18c;
          auVar153._24_4_ = uStack_188;
          auVar153._28_4_ = uStack_184;
          auVar197 = vfmadd213ps_avx512vl(auVar153,auVar172,auVar189);
          auVar199 = vfmadd213ps_avx512vl(local_260,auVar172,auVar190);
          auVar201 = vfmadd213ps_avx512vl(local_200,auVar172,auVar194);
          auVar128._4_4_ = fVar267 * fStack_11c;
          auVar128._0_4_ = fVar259 * local_120;
          auVar128._8_4_ = fVar268 * fStack_118;
          auVar128._12_4_ = fVar269 * fStack_114;
          auVar128._16_4_ = fVar270 * fStack_110;
          auVar128._20_4_ = fVar271 * fStack_10c;
          fVar283 = auVar189._28_4_;
          auVar128._24_4_ = fVar272 * fStack_108;
          auVar128._28_4_ = fVar283;
          auVar129._4_4_ = fVar267 * fStack_fc;
          auVar129._0_4_ = fVar259 * local_100;
          auVar129._8_4_ = fVar268 * fStack_f8;
          auVar129._12_4_ = fVar269 * fStack_f4;
          auVar129._16_4_ = fVar270 * fStack_f0;
          auVar129._20_4_ = fVar271 * fStack_ec;
          fVar292 = auVar190._28_4_;
          auVar129._24_4_ = fVar272 * fStack_e8;
          auVar129._28_4_ = fVar292;
          auVar130._4_4_ = fVar267 * fStack_dc;
          auVar130._0_4_ = fVar259 * local_e0;
          auVar130._8_4_ = fVar268 * fStack_d8;
          auVar130._12_4_ = fVar269 * fStack_d4;
          auVar130._16_4_ = fVar270 * fStack_d0;
          auVar130._20_4_ = fVar271 * fStack_cc;
          fVar293 = auVar194._28_4_;
          auVar130._24_4_ = fVar272 * fStack_c8;
          auVar130._28_4_ = fVar293;
          auVar194 = vfmadd213ps_avx512vl(local_2a0,auVar172,auVar128);
          auVar202 = vfmadd213ps_avx512vl(local_220,auVar172,auVar129);
          auVar203 = vfmadd213ps_avx512vl(local_1e0,auVar172,auVar130);
          auVar131._4_4_ = fVar267 * fStack_bc;
          auVar131._0_4_ = fVar259 * local_c0;
          auVar131._8_4_ = fVar268 * fStack_b8;
          auVar131._12_4_ = fVar269 * fStack_b4;
          auVar131._16_4_ = fVar270 * fStack_b0;
          auVar131._20_4_ = fVar271 * fStack_ac;
          auVar131._24_4_ = fVar272 * fStack_a8;
          auVar131._28_4_ = fVar283;
          auVar132._4_4_ = fVar267 * fStack_9c;
          auVar132._0_4_ = fVar259 * local_a0;
          auVar132._8_4_ = fVar268 * fStack_98;
          auVar132._12_4_ = fVar269 * fStack_94;
          auVar132._16_4_ = fVar270 * fStack_90;
          auVar132._20_4_ = fVar271 * fStack_8c;
          auVar132._24_4_ = fVar272 * fStack_88;
          auVar132._28_4_ = fVar292;
          auVar151._4_4_ = fVar267 * fStack_15c;
          auVar151._0_4_ = fVar259 * local_160;
          auVar151._8_4_ = fVar268 * fStack_158;
          auVar151._12_4_ = fVar269 * fStack_154;
          auVar151._16_4_ = fVar270 * fStack_150;
          auVar151._20_4_ = fVar271 * fStack_14c;
          auVar151._24_4_ = fVar272 * fStack_148;
          auVar151._28_4_ = auVar191._28_4_;
          auVar214 = vfmadd213ps_avx512vl(local_280,auVar172,auVar131);
          auVar221 = vfmadd213ps_avx512vl(local_240,auVar172,auVar132);
          auVar222 = vfmadd213ps_avx512vl(local_2c0,auVar172,auVar151);
          auVar133._4_4_ = fVar351 * fVar351;
          auVar133._0_4_ = fVar294 * fVar294;
          auVar133._8_4_ = fVar360 * fVar360;
          auVar133._12_4_ = fVar332 * fVar332;
          auVar133._16_4_ = fVar336 * fVar336;
          auVar133._20_4_ = fVar252 * fVar252;
          auVar133._24_4_ = fVar257 * fVar257;
          auVar133._28_4_ = fVar283;
          auVar134._4_4_ = fVar357 * fVar357;
          auVar134._0_4_ = fVar295 * fVar295;
          auVar134._8_4_ = fVar361 * fVar361;
          auVar134._12_4_ = fVar333 * fVar333;
          auVar134._16_4_ = fVar337 * fVar337;
          auVar134._20_4_ = fVar253 * fVar253;
          auVar134._24_4_ = fVar258 * fVar258;
          auVar134._28_4_ = fVar292;
          auVar265._0_4_ = fVar294 * fVar294 + fVar295 * fVar295;
          auVar265._4_4_ = fVar351 * fVar351 + fVar357 * fVar357;
          auVar265._8_4_ = fVar360 * fVar360 + fVar361 * fVar361;
          auVar265._12_4_ = fVar332 * fVar332 + fVar333 * fVar333;
          auVar265._16_4_ = fVar336 * fVar336 + fVar337 * fVar337;
          auVar265._20_4_ = fVar252 * fVar252 + fVar253 * fVar253;
          auVar265._24_4_ = fVar257 * fVar257 + fVar258 * fVar258;
          auVar265._28_4_ = fVar283 + fVar292;
          auVar135._4_4_ = fVar358 * fVar358;
          auVar135._0_4_ = fVar296 * fVar296;
          auVar135._8_4_ = fVar362 * fVar362;
          auVar135._12_4_ = fVar334 * fVar334;
          auVar135._16_4_ = fVar338 * fVar338;
          auVar135._20_4_ = fVar254 * fVar254;
          auVar135._24_4_ = fVar165 * fVar165;
          auVar135._28_4_ = auVar195._28_4_;
          auVar172 = vsubps_avx(auVar265,auVar135);
          auVar136._4_4_ = fVar359 * fVar359;
          auVar136._0_4_ = fVar297 * fVar297;
          auVar136._8_4_ = fVar331 * fVar331;
          auVar136._12_4_ = fVar335 * fVar335;
          auVar136._16_4_ = fVar339 * fVar339;
          auVar136._20_4_ = fVar255 * fVar255;
          auVar136._24_4_ = fVar247 * fVar247;
          auVar136._28_4_ = auVar196._28_4_;
          auVar172 = vsubps_avx(auVar172,auVar136);
          auVar137._4_4_ = fVar357 * fVar358;
          auVar137._0_4_ = fVar295 * fVar296;
          auVar137._8_4_ = fVar361 * fVar362;
          auVar137._12_4_ = fVar333 * fVar334;
          auVar137._16_4_ = fVar337 * fVar338;
          auVar137._20_4_ = fVar253 * fVar254;
          auVar137._24_4_ = fVar258 * fVar165;
          auVar137._28_4_ = fVar293;
          auVar138._4_4_ = fVar359 * fVar351;
          auVar138._0_4_ = fVar297 * fVar294;
          auVar138._8_4_ = fVar331 * fVar360;
          auVar138._12_4_ = fVar335 * fVar332;
          auVar138._16_4_ = fVar339 * fVar336;
          auVar138._20_4_ = fVar255 * fVar252;
          auVar138._24_4_ = fVar247 * fVar257;
          auVar138._28_4_ = auVar198._28_4_;
          fVar259 = fVar295 * fVar296 + fVar297 * fVar294;
          fVar267 = fVar357 * fVar358 + fVar359 * fVar351;
          fVar268 = fVar361 * fVar362 + fVar331 * fVar360;
          fVar269 = fVar333 * fVar334 + fVar335 * fVar332;
          fVar270 = fVar337 * fVar338 + fVar339 * fVar336;
          fVar271 = fVar253 * fVar254 + fVar255 * fVar252;
          fVar272 = fVar258 * fVar165 + fVar247 * fVar257;
          fVar293 = fVar293 + auVar198._28_4_;
          auVar266._0_4_ = fVar259 + fVar259;
          auVar266._4_4_ = fVar267 + fVar267;
          auVar266._8_4_ = fVar268 + fVar268;
          auVar266._12_4_ = fVar269 + fVar269;
          auVar266._16_4_ = fVar270 + fVar270;
          auVar266._20_4_ = fVar271 + fVar271;
          auVar266._24_4_ = fVar272 + fVar272;
          auVar266._28_4_ = fVar293 + fVar293;
          auVar139._4_4_ = fVar359 * fVar357;
          auVar139._0_4_ = fVar297 * fVar295;
          auVar139._8_4_ = fVar331 * fVar361;
          auVar139._12_4_ = fVar335 * fVar333;
          auVar139._16_4_ = fVar339 * fVar337;
          auVar139._20_4_ = fVar255 * fVar253;
          auVar139._24_4_ = fVar247 * fVar258;
          auVar139._28_4_ = auVar192._28_4_;
          auVar140._4_4_ = fVar351 * fVar358;
          auVar140._0_4_ = fVar294 * fVar296;
          auVar140._8_4_ = fVar360 * fVar362;
          auVar140._12_4_ = fVar332 * fVar334;
          auVar140._16_4_ = fVar336 * fVar338;
          auVar140._20_4_ = fVar252 * fVar254;
          auVar140._24_4_ = fVar257 * fVar165;
          auVar140._28_4_ = 0x3fc00000;
          auVar189 = vsubps_avx(auVar139,auVar140);
          auVar377._0_4_ = auVar189._0_4_ + auVar189._0_4_;
          auVar377._4_4_ = auVar189._4_4_ + auVar189._4_4_;
          auVar377._8_4_ = auVar189._8_4_ + auVar189._8_4_;
          auVar377._12_4_ = auVar189._12_4_ + auVar189._12_4_;
          auVar377._16_4_ = auVar189._16_4_ + auVar189._16_4_;
          auVar377._20_4_ = auVar189._20_4_ + auVar189._20_4_;
          auVar377._24_4_ = auVar189._24_4_ + auVar189._24_4_;
          auVar377._28_4_ = auVar189._28_4_ + auVar189._28_4_;
          auVar189 = vsubps_avx(auVar137,auVar138);
          auVar198 = vaddps_avx512vl(auVar189,auVar189);
          auVar189 = vsubps_avx(auVar133,auVar134);
          auVar309._0_4_ = fVar296 * fVar296 + auVar189._0_4_;
          auVar309._4_4_ = fVar358 * fVar358 + auVar189._4_4_;
          auVar309._8_4_ = fVar362 * fVar362 + auVar189._8_4_;
          auVar309._12_4_ = fVar334 * fVar334 + auVar189._12_4_;
          auVar309._16_4_ = fVar338 * fVar338 + auVar189._16_4_;
          auVar309._20_4_ = fVar254 * fVar254 + auVar189._20_4_;
          auVar309._24_4_ = fVar165 * fVar165 + auVar189._24_4_;
          auVar309._28_4_ = auVar195._28_4_ + auVar189._28_4_;
          auVar190 = vsubps_avx(auVar309,auVar136);
          auVar141._4_4_ = fVar359 * fVar358;
          auVar141._0_4_ = fVar297 * fVar296;
          auVar141._8_4_ = fVar331 * fVar362;
          auVar141._12_4_ = fVar335 * fVar334;
          auVar141._16_4_ = fVar339 * fVar338;
          auVar141._20_4_ = fVar255 * fVar254;
          auVar141._24_4_ = fVar247 * fVar165;
          auVar141._28_4_ = auVar309._28_4_;
          auVar142._4_4_ = fVar351 * fVar357;
          auVar142._0_4_ = fVar294 * fVar295;
          auVar142._8_4_ = fVar360 * fVar361;
          auVar142._12_4_ = fVar332 * fVar333;
          auVar142._16_4_ = fVar336 * fVar337;
          auVar142._20_4_ = fVar252 * fVar253;
          auVar142._24_4_ = fVar257 * fVar258;
          auVar142._28_4_ = fVar248;
          fVar259 = fVar297 * fVar296 + fVar294 * fVar295;
          fVar267 = fVar359 * fVar358 + fVar351 * fVar357;
          fVar268 = fVar331 * fVar362 + fVar360 * fVar361;
          fVar269 = fVar335 * fVar334 + fVar332 * fVar333;
          fVar270 = fVar339 * fVar338 + fVar336 * fVar337;
          fVar271 = fVar255 * fVar254 + fVar252 * fVar253;
          fVar272 = fVar247 * fVar165 + fVar257 * fVar258;
          auVar325._0_4_ = fVar259 + fVar259;
          auVar325._4_4_ = fVar267 + fVar267;
          auVar325._8_4_ = fVar268 + fVar268;
          auVar325._12_4_ = fVar269 + fVar269;
          auVar325._16_4_ = fVar270 + fVar270;
          auVar325._20_4_ = fVar271 + fVar271;
          auVar325._24_4_ = fVar272 + fVar272;
          auVar325._28_4_ = auVar309._28_4_ + fVar248 + auVar309._28_4_ + fVar248;
          fVar259 = fVar297 * fVar295 + fVar294 * fVar296;
          fVar267 = fVar359 * fVar357 + fVar351 * fVar358;
          fVar268 = fVar331 * fVar361 + fVar360 * fVar362;
          fVar269 = fVar335 * fVar333 + fVar332 * fVar334;
          fVar270 = fVar339 * fVar337 + fVar336 * fVar338;
          fVar271 = fVar255 * fVar253 + fVar252 * fVar254;
          fVar272 = fVar247 * fVar258 + fVar257 * fVar165;
          fVar283 = auVar192._28_4_ + 1.5;
          auVar329._0_4_ = fVar259 + fVar259;
          auVar329._4_4_ = fVar267 + fVar267;
          auVar329._8_4_ = fVar268 + fVar268;
          auVar329._12_4_ = fVar269 + fVar269;
          auVar329._16_4_ = fVar270 + fVar270;
          auVar329._20_4_ = fVar271 + fVar271;
          auVar329._24_4_ = fVar272 + fVar272;
          auVar329._28_4_ = fVar283 + fVar283;
          auVar191 = vsubps_avx(auVar141,auVar142);
          auVar350._0_4_ = auVar191._0_4_ + auVar191._0_4_;
          auVar350._4_4_ = auVar191._4_4_ + auVar191._4_4_;
          auVar350._8_4_ = auVar191._8_4_ + auVar191._8_4_;
          auVar350._12_4_ = auVar191._12_4_ + auVar191._12_4_;
          auVar350._16_4_ = auVar191._16_4_ + auVar191._16_4_;
          auVar350._20_4_ = auVar191._20_4_ + auVar191._20_4_;
          auVar350._24_4_ = auVar191._24_4_ + auVar191._24_4_;
          fVar259 = auVar191._28_4_;
          auVar350._28_4_ = fVar259 + fVar259;
          auVar189 = vsubps_avx(auVar189,auVar135);
          auVar302._0_4_ = fVar297 * fVar297 + auVar189._0_4_;
          auVar302._4_4_ = fVar359 * fVar359 + auVar189._4_4_;
          auVar302._8_4_ = fVar331 * fVar331 + auVar189._8_4_;
          auVar302._12_4_ = fVar335 * fVar335 + auVar189._12_4_;
          auVar302._16_4_ = fVar339 * fVar339 + auVar189._16_4_;
          auVar302._20_4_ = fVar255 * fVar255 + auVar189._20_4_;
          auVar302._24_4_ = fVar247 * fVar247 + auVar189._24_4_;
          auVar302._28_4_ = auVar196._28_4_ + auVar189._28_4_;
          auVar189 = ZEXT832(0) << 0x20;
          auVar143._4_4_ = auVar377._4_4_ * 0.0;
          auVar143._0_4_ = auVar377._0_4_ * 0.0;
          auVar143._8_4_ = auVar377._8_4_ * 0.0;
          auVar143._12_4_ = auVar377._12_4_ * 0.0;
          auVar143._16_4_ = auVar377._16_4_ * 0.0;
          auVar143._20_4_ = auVar377._20_4_ * 0.0;
          auVar143._24_4_ = auVar377._24_4_ * 0.0;
          auVar143._28_4_ = fVar259;
          auVar166 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar266,auVar143);
          auVar310._0_4_ = auVar266._0_4_ + auVar377._0_4_ * 0.0;
          auVar310._4_4_ = auVar266._4_4_ + auVar377._4_4_ * 0.0;
          auVar310._8_4_ = auVar266._8_4_ + auVar377._8_4_ * 0.0;
          auVar310._12_4_ = auVar266._12_4_ + auVar377._12_4_ * 0.0;
          auVar310._16_4_ = auVar266._16_4_ + auVar377._16_4_ * 0.0;
          auVar310._20_4_ = auVar266._20_4_ + auVar377._20_4_ * 0.0;
          auVar310._24_4_ = auVar266._24_4_ + auVar377._24_4_ * 0.0;
          auVar310._28_4_ = auVar266._28_4_ + fVar259;
          auVar171 = vfmadd213ps_fma(auVar266,auVar189,auVar377);
          auVar168 = vfmadd231ps_fma(auVar310,auVar172,auVar189);
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar189,auVar172);
          auVar196 = ZEXT832(0) << 0x20;
          auVar144._4_4_ = auVar325._4_4_ * 0.0;
          auVar144._0_4_ = auVar325._0_4_ * 0.0;
          auVar144._8_4_ = auVar325._8_4_ * 0.0;
          auVar144._12_4_ = auVar325._12_4_ * 0.0;
          auVar144._16_4_ = auVar325._16_4_ * 0.0;
          auVar144._20_4_ = auVar325._20_4_ * 0.0;
          auVar144._24_4_ = auVar325._24_4_ * 0.0;
          auVar144._28_4_ = fVar248;
          auVar171 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar190,auVar144);
          auVar369._0_4_ = auVar190._0_4_ + auVar325._0_4_ * 0.0;
          auVar369._4_4_ = auVar190._4_4_ + auVar325._4_4_ * 0.0;
          auVar369._8_4_ = auVar190._8_4_ + auVar325._8_4_ * 0.0;
          auVar369._12_4_ = auVar190._12_4_ + auVar325._12_4_ * 0.0;
          auVar369._16_4_ = auVar190._16_4_ + auVar325._16_4_ * 0.0;
          auVar369._20_4_ = auVar190._20_4_ + auVar325._20_4_ * 0.0;
          auVar369._24_4_ = auVar190._24_4_ + auVar325._24_4_ * 0.0;
          auVar369._28_4_ = auVar190._28_4_ + fVar248;
          auVar167 = vfmadd213ps_fma(auVar190,auVar196,auVar325);
          auVar189 = vaddps_avx512vl(auVar198,ZEXT1632(auVar171));
          auVar190 = vfmadd231ps_avx512vl(auVar369,auVar198,auVar196);
          auVar191 = vfmadd231ps_avx512vl(ZEXT1632(auVar167),auVar196,auVar198);
          auVar145._4_4_ = auVar302._4_4_ * 0.0;
          auVar145._0_4_ = auVar302._0_4_ * 0.0;
          auVar145._8_4_ = auVar302._8_4_ * 0.0;
          auVar145._12_4_ = auVar302._12_4_ * 0.0;
          auVar145._16_4_ = auVar302._16_4_ * 0.0;
          auVar145._20_4_ = auVar302._20_4_ * 0.0;
          auVar145._24_4_ = auVar302._24_4_ * 0.0;
          auVar145._28_4_ = fVar248;
          auVar171 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar350,auVar145);
          auVar192 = vaddps_avx512vl(auVar350,auVar145);
          auVar167 = vfmadd213ps_fma(auVar350,auVar196,auVar302);
          auVar195 = vaddps_avx512vl(auVar329,ZEXT1632(auVar171));
          auVar192 = vfmadd231ps_avx512vl(auVar192,auVar329,auVar196);
          auVar170 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar196,auVar329);
          auVar218 = ZEXT832(0) << 0x20;
          auVar193 = vaddps_avx512vl(auVar193,auVar218);
          auVar173 = vaddps_avx512vl(auVar173,auVar218);
          auVar196 = vaddps_avx512vl(auVar201,auVar218);
          auVar198 = vmulps_avx512vl(auVar195,auVar218);
          auVar201 = vmulps_avx512vl(auVar192,auVar218);
          auVar217 = vmulps_avx512vl(ZEXT1632(auVar170),auVar218);
          auVar171 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar189,auVar198);
          auVar167 = vfmadd213ps_fma(ZEXT832(0) << 0x20,auVar190,auVar201);
          auVar218 = vfmadd213ps_avx512vl(auVar218,auVar191,auVar217);
          auVar198 = vfmadd231ps_avx512vl(auVar198,auVar199,auVar189);
          auVar201 = vfmadd231ps_avx512vl(auVar201,auVar199,auVar190);
          auVar199 = vfmadd213ps_avx512vl(auVar199,auVar191,auVar217);
          auVar217 = vmulps_avx512vl(auVar203,auVar195);
          auVar219 = vmulps_avx512vl(auVar203,auVar192);
          auVar203 = vmulps_avx512vl(auVar203,ZEXT1632(auVar170));
          auVar217 = vfmadd231ps_avx512vl(auVar217,auVar202,auVar189);
          auVar219 = vfmadd231ps_avx512vl(auVar219,auVar202,auVar190);
          auVar202 = vfmadd231ps_avx512vl(auVar203,auVar191,auVar202);
          auVar195 = vmulps_avx512vl(auVar222,auVar195);
          auVar192 = vmulps_avx512vl(auVar222,auVar192);
          auVar203 = vmulps_avx512vl(auVar222,ZEXT1632(auVar170));
          auVar189 = vfmadd231ps_avx512vl(auVar195,auVar221,auVar189);
          auVar190 = vfmadd231ps_avx512vl(auVar192,auVar221,auVar190);
          auVar191 = vfmadd231ps_avx512vl(auVar203,auVar221,auVar191);
          auVar290._0_4_ = auVar166._0_4_ + auVar172._0_4_;
          auVar290._4_4_ = auVar166._4_4_ + auVar172._4_4_;
          auVar290._8_4_ = auVar166._8_4_ + auVar172._8_4_;
          auVar290._12_4_ = auVar166._12_4_ + auVar172._12_4_;
          auVar290._16_4_ = auVar172._16_4_ + 0.0;
          auVar290._20_4_ = auVar172._20_4_ + 0.0;
          auVar290._24_4_ = auVar172._24_4_ + 0.0;
          auVar290._28_4_ = auVar172._28_4_ + 0.0;
          auVar172 = vfmadd231ps_avx512vl(ZEXT1632(auVar171),auVar200,auVar290);
          auVar192 = vfmadd231ps_avx512vl(ZEXT1632(auVar167),auVar200,ZEXT1632(auVar168));
          auVar200 = vfmadd231ps_avx512vl(auVar218,ZEXT1632(auVar169),auVar200);
          auVar195 = vfmadd231ps_avx512vl(auVar198,auVar197,auVar290);
          auVar198 = vfmadd231ps_avx512vl(auVar201,auVar197,ZEXT1632(auVar168));
          auVar197 = vfmadd231ps_avx512vl(auVar199,ZEXT1632(auVar169),auVar197);
          auVar199 = vfmadd231ps_avx512vl(auVar217,auVar194,auVar290);
          auVar201 = vfmadd231ps_avx512vl(auVar219,auVar194,ZEXT1632(auVar168));
          auVar202 = vfmadd231ps_avx512vl(auVar202,ZEXT1632(auVar169),auVar194);
          auVar189 = vfmadd231ps_avx512vl(auVar189,auVar214,auVar290);
          auVar194 = vaddps_avx512vl(auVar193,auVar189);
          auVar189 = vfmadd231ps_avx512vl(auVar190,auVar214,ZEXT1632(auVar168));
          auVar203 = vaddps_avx512vl(auVar173,auVar189);
          auVar189 = vfmadd231ps_avx512vl(auVar191,auVar214,ZEXT1632(auVar169));
          fVar259 = auVar196._0_4_ + auVar189._0_4_;
          fVar267 = auVar196._4_4_ + auVar189._4_4_;
          fVar268 = auVar196._8_4_ + auVar189._8_4_;
          fVar269 = auVar196._12_4_ + auVar189._12_4_;
          fVar270 = auVar196._16_4_ + auVar189._16_4_;
          fVar271 = auVar196._20_4_ + auVar189._20_4_;
          fVar272 = auVar196._24_4_ + auVar189._24_4_;
          auVar189 = vmulps_avx512vl(auVar201,auVar197);
          auVar189 = vfmsub231ps_avx512vl(auVar189,auVar198,auVar202);
          auVar190 = vmulps_avx512vl(auVar202,auVar195);
          auVar191 = vfmsub231ps_avx512vl(auVar190,auVar197,auVar199);
          auVar190 = vmulps_avx512vl(auVar199,auVar198);
          auVar193 = vfmsub231ps_avx512vl(auVar190,auVar195,auVar201);
          auVar190 = vmulps_avx512vl(auVar200,auVar199);
          auVar196 = vfmsub231ps_avx512vl(auVar190,auVar172,auVar202);
          auVar190 = vmulps_avx512vl(auVar192,auVar202);
          auVar190 = vfmsub231ps_avx512vl(auVar190,auVar201,auVar200);
          auVar201 = vmulps_avx512vl(auVar172,auVar201);
          auVar199 = vfmsub231ps_avx512vl(auVar201,auVar192,auVar199);
          auVar146._4_4_ = auVar198._4_4_ * auVar200._4_4_;
          auVar146._0_4_ = auVar198._0_4_ * auVar200._0_4_;
          auVar146._8_4_ = auVar198._8_4_ * auVar200._8_4_;
          auVar146._12_4_ = auVar198._12_4_ * auVar200._12_4_;
          auVar146._16_4_ = auVar198._16_4_ * auVar200._16_4_;
          auVar146._20_4_ = auVar198._20_4_ * auVar200._20_4_;
          auVar146._24_4_ = auVar198._24_4_ * auVar200._24_4_;
          auVar146._28_4_ = auVar173._28_4_;
          auVar201 = vfmsub231ps_avx512vl(auVar146,auVar192,auVar197);
          auVar173 = vmulps_avx512vl(auVar197,auVar172);
          auVar166 = vfmsub231ps_fma(auVar173,auVar200,auVar195);
          auVar173 = vmulps_avx512vl(auVar195,auVar192);
          auVar195 = vfmsub231ps_avx512vl(auVar173,auVar172,auVar198);
          auVar200 = vmulps_avx512vl(auVar200,auVar193);
          auVar192 = vfmadd231ps_avx512vl(auVar200,auVar191,auVar192);
          auVar197 = vfmadd231ps_avx512vl(auVar192,auVar189,auVar172);
          auVar172 = vdivps_avx512vl(auVar189,auVar197);
          auVar189 = vdivps_avx512vl(auVar190,auVar197);
          auVar190 = vdivps_avx512vl(auVar201,auVar197);
          auVar191 = vdivps_avx512vl(auVar191,auVar197);
          auVar192 = vdivps_avx512vl(auVar196,auVar197);
          auVar200 = vdivps_avx512vl(ZEXT1632(auVar166),auVar197);
          auVar193 = vdivps_avx512vl(auVar193,auVar197);
          auVar173 = vdivps_avx512vl(auVar199,auVar197);
          auVar195 = vdivps_avx512vl(auVar195,auVar197);
          auVar147._4_4_ = fVar267 * auVar193._4_4_;
          auVar147._0_4_ = fVar259 * auVar193._0_4_;
          auVar147._8_4_ = fVar268 * auVar193._8_4_;
          auVar147._12_4_ = fVar269 * auVar193._12_4_;
          auVar147._16_4_ = fVar270 * auVar193._16_4_;
          auVar147._20_4_ = fVar271 * auVar193._20_4_;
          auVar147._24_4_ = fVar272 * auVar193._24_4_;
          auVar147._28_4_ = auVar196._28_4_;
          auVar148._4_4_ = fVar267 * auVar173._4_4_;
          auVar148._0_4_ = fVar259 * auVar173._0_4_;
          auVar148._8_4_ = fVar268 * auVar173._8_4_;
          auVar148._12_4_ = fVar269 * auVar173._12_4_;
          auVar148._16_4_ = fVar270 * auVar173._16_4_;
          auVar148._20_4_ = fVar271 * auVar173._20_4_;
          auVar148._24_4_ = fVar272 * auVar173._24_4_;
          auVar148._28_4_ = auVar199._28_4_;
          auVar149._4_4_ = fVar267 * auVar195._4_4_;
          auVar149._0_4_ = fVar259 * auVar195._0_4_;
          auVar149._8_4_ = fVar268 * auVar195._8_4_;
          auVar149._12_4_ = fVar269 * auVar195._12_4_;
          auVar149._16_4_ = fVar270 * auVar195._16_4_;
          auVar149._20_4_ = fVar271 * auVar195._20_4_;
          auVar149._24_4_ = fVar272 * auVar195._24_4_;
          auVar149._28_4_ = auVar201._28_4_;
          auVar171 = vfmadd231ps_fma(auVar147,auVar203,auVar191);
          auVar166 = vfmadd231ps_fma(auVar148,auVar203,auVar192);
          auVar167 = vfmadd231ps_fma(auVar149,auVar200,auVar203);
        }
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar194,auVar172);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar194,auVar189);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar190,auVar194);
      }
      else {
        fVar259 = (pGVar6->time_range).lower;
        auVar260._4_4_ = fVar259;
        auVar260._0_4_ = fVar259;
        auVar260._8_4_ = fVar259;
        auVar260._12_4_ = fVar259;
        auVar260._16_4_ = fVar259;
        auVar260._20_4_ = fVar259;
        auVar260._24_4_ = fVar259;
        auVar260._28_4_ = fVar259;
        fVar267 = pGVar6->fnumTimeSegments;
        auVar189 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar260);
        auVar303 = ZEXT3264(auVar189);
        fVar259 = (pGVar6->time_range).upper - fVar259;
        auVar261._4_4_ = fVar259;
        auVar261._0_4_ = fVar259;
        auVar261._8_4_ = fVar259;
        auVar261._12_4_ = fVar259;
        auVar261._16_4_ = fVar259;
        auVar261._20_4_ = fVar259;
        auVar261._24_4_ = fVar259;
        auVar261._28_4_ = fVar259;
        auVar172 = vdivps_avx(auVar189,auVar261);
        auVar57._4_4_ = fVar267 * auVar172._4_4_;
        auVar57._0_4_ = fVar267 * auVar172._0_4_;
        auVar57._8_4_ = fVar267 * auVar172._8_4_;
        auVar57._12_4_ = fVar267 * auVar172._12_4_;
        auVar57._16_4_ = fVar267 * auVar172._16_4_;
        auVar57._20_4_ = fVar267 * auVar172._20_4_;
        auVar57._24_4_ = fVar267 * auVar172._24_4_;
        auVar57._28_4_ = auVar172._28_4_;
        auVar172 = vroundps_avx(auVar57,1);
        fVar267 = fVar267 + -1.0;
        auVar287._4_4_ = fVar267;
        auVar287._0_4_ = fVar267;
        auVar287._8_4_ = fVar267;
        auVar287._12_4_ = fVar267;
        auVar287._16_4_ = fVar267;
        auVar287._20_4_ = fVar267;
        auVar287._24_4_ = fVar267;
        auVar287._28_4_ = fVar267;
        auVar172 = vminps_avx(auVar172,auVar287);
        auVar152 = ZEXT412(0);
        auVar291 = ZEXT1264(auVar152) << 0x20;
        auVar193 = ZEXT1232(auVar152) << 0x20;
        auVar172 = vmaxps_avx(auVar172,ZEXT1232(auVar152) << 0x20);
        auVar200 = vsubps_avx(auVar57,auVar172);
        auVar172 = vcvtps2dq_avx512vl(auVar172);
        local_180 = vmovdqa64_avx512vl(auVar172);
        uVar4 = 0;
        for (uVar158 = (uint)bVar156; (uVar158 & 1) == 0; uVar158 = uVar158 >> 1 | 0x80000000) {
          uVar4 = uVar4 + 1;
        }
        auVar173 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpeqd_avx512vl(auVar172,auVar173);
        if ((byte)(~bVar156 | (byte)uVar18) == 0xff) {
          lVar8 = *(long *)&pGVar6[1].fnumTimeSegments;
          lVar160 = (long)*(int *)(local_180 + (ulong)uVar4 * 4) * 0x38;
          plVar1 = (long *)(lVar8 + lVar160);
          iVar5 = *(int *)(lVar8 + 0x20 + lVar160);
          if (iVar5 == 0x9134) {
            lVar161 = *plVar1;
            lVar163 = plVar1[2] * uVar157;
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 0x10 + lVar163)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x20 + lVar163)),0x28);
            auVar173 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 4 + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 0x14 + lVar163)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x24 + lVar163)),0x28);
            auVar193 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 8 + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x28 + lVar163)),0x28);
            auVar189 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 0x1c + lVar163)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x2c + lVar163)),0x28);
            auVar190 = ZEXT1632(auVar166);
          }
          else if (iVar5 == 0x9234) {
            lVar161 = *plVar1;
            lVar163 = plVar1[2] * uVar157;
            auVar298._8_8_ = 0;
            auVar298._0_8_ = *(ulong *)(lVar161 + 4 + lVar163);
            auVar311._8_8_ = 0;
            auVar311._0_8_ = *(ulong *)(lVar161 + 0x10 + lVar163);
            auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + lVar163)),_DAT_02060e80,
                                          auVar298);
            auVar173 = ZEXT1632(auVar166);
            auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),_DAT_02060e80,
                                          auVar311);
            auVar193 = ZEXT1632(auVar166);
            auVar312._8_8_ = 0;
            auVar312._0_8_ = *(ulong *)(lVar161 + 0x1c + lVar163);
            auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)),_DAT_02060e80
                                          ,auVar312);
            auVar189 = ZEXT1632(auVar166);
            auVar313._8_8_ = 0;
            auVar313._0_8_ = *(ulong *)(lVar161 + 0x28 + lVar163);
            auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0x24 + lVar163)),_DAT_02060e80
                                          ,auVar313);
            auVar190 = ZEXT1632(auVar166);
          }
          else if (iVar5 == 0xb001) {
            lVar161 = *plVar1;
            lVar163 = plVar1[2] * uVar157;
            auVar274._8_8_ = 0;
            auVar274._0_8_ = *(ulong *)(lVar161 + 0x10 + lVar163);
            auVar166 = vinsertps_avx(auVar274,ZEXT416(*(uint *)(lVar161 + 8 + lVar163)),0x20);
            auVar275._8_8_ = 0;
            auVar275._0_8_ = *(ulong *)(lVar161 + 0x34 + lVar163);
            auVar167 = vpermt2ps_avx512vl(auVar275,_DAT_02060e90,
                                          ZEXT416(*(uint *)(lVar161 + lVar163)));
            auVar318._8_8_ = 0;
            auVar318._0_8_ = *(ulong *)(lVar161 + 0x1c + lVar163);
            fVar259 = *(float *)(lVar161 + 0x24 + lVar163);
            fVar267 = *(float *)(lVar161 + 0x28 + lVar163);
            fVar268 = *(float *)(lVar161 + 0x2c + lVar163);
            auVar168 = vpermt2ps_avx512vl(auVar318,_DAT_02060e90,
                                          ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)));
            fVar269 = *(float *)(lVar161 + 0x30 + lVar163);
            auVar171 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar267)),ZEXT416((uint)fVar259),
                                       ZEXT416((uint)fVar259));
            auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar268),ZEXT416((uint)fVar268));
            auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar269),ZEXT416((uint)fVar269));
            auVar169 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar171._0_4_));
            fVar270 = auVar169._0_4_;
            fVar270 = fVar270 * 1.5 + fVar270 * fVar270 * fVar270 * auVar171._0_4_ * -0.5;
            auVar171 = vinsertps_avx(auVar168,ZEXT416((uint)(fVar259 * fVar270)),0x30);
            auVar190 = ZEXT1632(auVar171);
            auVar171 = vinsertps_avx(auVar167,ZEXT416((uint)(fVar267 * fVar270)),0x30);
            auVar173 = ZEXT1632(auVar171);
            auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)(fVar269 * fVar270)),0x30);
            auVar189 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                     ZEXT416(*(uint *)(lVar161 + 4 + lVar163)),0x10);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar161 + 0x3c + lVar163)),0x20);
            auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)(fVar268 * fVar270)),0x30);
            auVar193 = ZEXT1632(auVar166);
          }
          else if (iVar5 == 0x9244) {
            lVar161 = *plVar1;
            lVar163 = plVar1[2] * uVar157;
            auVar173 = ZEXT1632(*(undefined1 (*) [16])(lVar161 + lVar163));
            auVar193 = ZEXT1632(*(undefined1 (*) [16])(lVar161 + 0x10 + lVar163));
            auVar189 = ZEXT1632(*(undefined1 (*) [16])(lVar161 + 0x20 + lVar163));
            auVar190 = ZEXT1632(*(undefined1 (*) [16])(lVar161 + 0x30 + lVar163));
          }
          auVar373._8_4_ = 1;
          auVar373._0_8_ = 0x100000001;
          auVar373._12_4_ = 1;
          auVar373._16_4_ = 1;
          auVar373._20_4_ = 1;
          auVar373._24_4_ = 1;
          auVar373._28_4_ = 1;
          auVar172 = vbroadcastss_avx512vl(ZEXT416(2));
          iVar5 = *(int *)(lVar8 + 0x58 + lVar160);
          if (iVar5 == 0x9134) {
            lVar8 = plVar1[7];
            lVar160 = uVar157 * plVar1[9];
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + lVar160)),
                                     ZEXT416(*(uint *)(lVar8 + 0x10 + lVar160)),0x1c);
            auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar8 + 0x20 + lVar160)),0x28);
            auVar191 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 4 + lVar160)),
                                     ZEXT416(*(uint *)(lVar8 + 0x14 + lVar160)),0x1c);
            auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar8 + 0x24 + lVar160)),0x28);
            auVar192 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 8 + lVar160)),
                                     ZEXT416(*(uint *)(lVar8 + 0x18 + lVar160)),0x1c);
            auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar8 + 0x28 + lVar160)),0x28);
            auVar196 = ZEXT1632(auVar166);
            auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 0xc + lVar160)),
                                     ZEXT416(*(uint *)(lVar8 + 0x1c + lVar160)),0x1c);
            auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar8 + 0x2c + lVar160)),0x28);
            auVar194 = ZEXT1632(auVar166);
          }
          else {
            auVar175._16_16_ = auVar172._16_16_;
            if (iVar5 == 0x9234) {
              lVar8 = plVar1[7];
              lVar160 = uVar157 * plVar1[9];
              auVar304._8_8_ = 0;
              auVar304._0_8_ = *(ulong *)(lVar8 + 4 + lVar160);
              auVar319._8_8_ = 0;
              auVar319._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar160);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar8 + lVar160)),_DAT_02060e80,
                                            auVar304);
              auVar191 = ZEXT1632(auVar166);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar8 + 0xc + lVar160)),_DAT_02060e80,
                                            auVar319);
              auVar192 = ZEXT1632(auVar166);
              auVar305._8_8_ = 0;
              auVar305._0_8_ = *(ulong *)(lVar8 + 0x1c + lVar160);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar8 + 0x18 + lVar160)),_DAT_02060e80
                                            ,auVar305);
              auVar196 = ZEXT1632(auVar166);
              auVar306._8_8_ = 0;
              auVar306._0_8_ = *(ulong *)(lVar8 + 0x28 + lVar160);
              auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar8 + 0x24 + lVar160)),_DAT_02060e80
                                            ,auVar306);
              auVar194 = ZEXT1632(auVar166);
            }
            else if (iVar5 == 0xb001) {
              lVar8 = plVar1[7];
              lVar160 = uVar157 * plVar1[9];
              auVar307._8_8_ = 0;
              auVar307._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar160);
              auVar166 = vinsertps_avx(auVar307,ZEXT416(*(uint *)(lVar8 + 8 + lVar160)),0x20);
              auVar314._8_8_ = 0;
              auVar314._0_8_ = *(ulong *)(lVar8 + 0x34 + lVar160);
              auVar167 = vpermt2ps_avx512vl(auVar314,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar8 + lVar160)));
              auVar340._8_8_ = 0;
              auVar340._0_8_ = *(ulong *)(lVar8 + 0x1c + lVar160);
              fVar259 = *(float *)(lVar8 + 0x24 + lVar160);
              fVar267 = *(float *)(lVar8 + 0x28 + lVar160);
              fVar268 = *(float *)(lVar8 + 0x2c + lVar160);
              auVar168 = vpermt2ps_avx512vl(auVar340,_DAT_02060e90,
                                            ZEXT416(*(uint *)(lVar8 + 0x18 + lVar160)));
              fVar269 = *(float *)(lVar8 + 0x30 + lVar160);
              auVar171 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar267)),ZEXT416((uint)fVar259),
                                         ZEXT416((uint)fVar259));
              auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar268),ZEXT416((uint)fVar268));
              auVar171 = vfmadd231ss_fma(auVar171,ZEXT416((uint)fVar269),ZEXT416((uint)fVar269));
              auVar175._0_16_ = ZEXT816(0) << 0x40;
              auVar174._4_28_ = auVar175._4_28_;
              auVar174._0_4_ = auVar171._0_4_;
              auVar169 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174._0_16_);
              auVar170 = vmulss_avx512f(auVar169,ZEXT416(0x3fc00000));
              fVar270 = auVar169._0_4_;
              auVar171 = vaddss_avx512f(auVar170,ZEXT416((uint)(fVar270 * fVar270 *
                                                               fVar270 * auVar171._0_4_ * -0.5)));
              fVar270 = auVar171._0_4_;
              auVar171 = vinsertps_avx512f(auVar168,ZEXT416((uint)(fVar259 * fVar270)),0x30);
              auVar194 = ZEXT1632(auVar171);
              auVar171 = vinsertps_avx(auVar167,ZEXT416((uint)(fVar267 * fVar270)),0x30);
              auVar191 = ZEXT1632(auVar171);
              auVar166 = vinsertps_avx512f(auVar166,ZEXT416((uint)(fVar269 * fVar270)),0x30);
              auVar196 = ZEXT1632(auVar166);
              auVar166 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 0xc + lVar160)),
                                       ZEXT416(*(uint *)(lVar8 + 4 + lVar160)),0x10);
              auVar166 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(lVar8 + 0x3c + lVar160)),0x20);
              auVar166 = vinsertps_avx512f(auVar166,ZEXT416((uint)(fVar268 * fVar270)),0x30);
              auVar192 = ZEXT1632(auVar166);
            }
            else if (iVar5 == 0x9244) {
              lVar8 = plVar1[7];
              lVar160 = uVar157 * plVar1[9];
              auVar191 = ZEXT1632(*(undefined1 (*) [16])(lVar8 + lVar160));
              auVar192 = ZEXT1632(*(undefined1 (*) [16])(lVar8 + 0x10 + lVar160));
              auVar196 = ZEXT1632(*(undefined1 (*) [16])(lVar8 + 0x20 + lVar160));
              auVar194 = ZEXT1632(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar160));
            }
          }
          uVar273 = auVar173._0_4_;
          auVar208._4_4_ = uVar273;
          auVar208._0_4_ = uVar273;
          auVar208._8_4_ = uVar273;
          auVar208._12_4_ = uVar273;
          auVar208._16_4_ = uVar273;
          auVar208._20_4_ = uVar273;
          auVar208._24_4_ = uVar273;
          auVar208._28_4_ = uVar273;
          auVar209 = vpermps_avx2(auVar373,auVar173);
          auVar176 = vpermps_avx512vl(auVar172,auVar173);
          uVar273 = auVar193._0_4_;
          auVar210._4_4_ = uVar273;
          auVar210._0_4_ = uVar273;
          auVar210._8_4_ = uVar273;
          auVar210._12_4_ = uVar273;
          auVar210._16_4_ = uVar273;
          auVar210._20_4_ = uVar273;
          auVar210._24_4_ = uVar273;
          auVar210._28_4_ = uVar273;
          auVar211 = vpermps_avx2(auVar373,auVar193);
          auVar177 = vpermps_avx512vl(auVar172,auVar193);
          uVar273 = auVar189._0_4_;
          in_ZMM6 = ZEXT3264(CONCAT428(uVar273,CONCAT424(uVar273,CONCAT420(uVar273,CONCAT416(uVar273
                                                  ,CONCAT412(uVar273,CONCAT48(uVar273,CONCAT44(
                                                  uVar273,uVar273))))))));
          auVar212 = vpermps_avx2(auVar373,auVar189);
          auVar178 = vpermps_avx512vl(auVar172,auVar189);
          uVar273 = auVar190._0_4_;
          auVar303 = ZEXT3264(CONCAT428(uVar273,CONCAT424(uVar273,CONCAT420(uVar273,CONCAT416(
                                                  uVar273,CONCAT412(uVar273,CONCAT48(uVar273,
                                                  CONCAT44(uVar273,uVar273))))))));
          auVar213 = vpermps_avx2(auVar373,auVar190);
          auVar179 = vpermps_avx512vl(auVar172,auVar190);
          auVar180 = vbroadcastss_avx512vl(auVar191._0_16_);
          auVar181 = vpermps_avx512vl(auVar373,auVar191);
          auVar182 = vpermps_avx512vl(auVar172,auVar191);
          auVar183 = vbroadcastss_avx512vl(auVar192._0_16_);
          auVar184 = vpermps_avx512vl(auVar373,auVar192);
          auVar185 = vpermps_avx512vl(auVar172,auVar192);
          auVar186 = vbroadcastss_avx512vl(auVar196._0_16_);
          auVar187 = vpermps_avx512vl(auVar373,auVar196);
          auVar188 = vpermps_avx512vl(auVar172,auVar196);
          auVar189 = vbroadcastss_avx512vl(auVar194._0_16_);
          in_ZMM15 = ZEXT3264(auVar189);
          auVar189 = vpermps_avx512vl(auVar373,auVar194);
          in_ZMM14 = ZEXT3264(auVar189);
          auVar172 = vpermps_avx512vl(auVar172,auVar194);
          in_ZMM13 = ZEXT3264(auVar172);
        }
        else {
          auVar189 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar393 = ZEXT3264(auVar189);
          lVar8 = *(long *)&pGVar6[1].fnumTimeSegments;
          uVar159 = uVar155;
          local_2c0 = auVar194;
          local_2a0 = auVar194;
          local_280 = auVar194;
          local_260 = auVar194;
          local_240 = auVar194;
          do {
            uVar4 = 0;
            for (uVar158 = (uint)uVar159; (uVar158 & 1) == 0; uVar158 = uVar158 >> 1 | 0x80000000) {
              uVar4 = uVar4 + 1;
            }
            lVar160 = (long)*(int *)(local_180 + (ulong)uVar4 * 4) * 0x38;
            plVar1 = (long *)(lVar8 + lVar160);
            iVar5 = *(int *)(lVar8 + 0x20 + lVar160);
            if (iVar5 == 0x9134) {
              lVar161 = *plVar1;
              lVar163 = plVar1[2] * uVar157;
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar161 + lVar163)),
                                           ZEXT416(*(uint *)(lVar161 + 0x10 + lVar163)),0x1c);
              auVar171 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar161 + 0x20 + lVar163)),
                                           0x28);
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar161 + 4 + lVar163)),
                                           ZEXT416(*(uint *)(lVar161 + 0x14 + lVar163)),0x1c);
              auVar167 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar161 + 0x24 + lVar163)),
                                           0x28);
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar161 + 8 + lVar163)),
                                           ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)),0x1c);
              auVar168 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar161 + 0x28 + lVar163)),
                                           0x28);
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                           ZEXT416(*(uint *)(lVar161 + 0x1c + lVar163)),0x1c);
              auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar161 + 0x2c + lVar163)),
                                           0x28);
LAB_009c390d:
              local_260 = ZEXT1632(auVar171);
              local_280 = ZEXT1632(auVar167);
              local_2a0 = ZEXT1632(auVar168);
              local_240 = ZEXT1632(auVar166);
            }
            else {
              auVar205._16_16_ = in_ZMM30._16_16_;
              if (iVar5 == 0x9234) {
                lVar161 = *plVar1;
                lVar163 = plVar1[2] * uVar157;
                auVar390._8_8_ = 0;
                auVar390._0_8_ = *(ulong *)(lVar161 + 4 + lVar163);
                auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + lVar163)),_DAT_02060e80,
                                              auVar390);
                local_260 = ZEXT1632(auVar166);
                auVar383._8_8_ = 0;
                auVar383._0_8_ = *(ulong *)(lVar161 + 0x10 + lVar163);
                auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                              _DAT_02060e80,auVar383);
                local_280 = ZEXT1632(auVar166);
                auVar380._8_8_ = 0;
                auVar380._0_8_ = *(ulong *)(lVar161 + 0x1c + lVar163);
                auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)),
                                              _DAT_02060e80,auVar380);
                local_2a0 = ZEXT1632(auVar166);
                auVar381._8_8_ = 0;
                auVar381._0_8_ = *(ulong *)(lVar161 + 0x28 + lVar163);
                auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar161 + 0x24 + lVar163)),
                                              _DAT_02060e80,auVar381);
                local_240 = ZEXT1632(auVar166);
              }
              else if (iVar5 == 0xb001) {
                lVar161 = *plVar1;
                lVar163 = plVar1[2] * uVar157;
                auVar384._8_8_ = 0;
                auVar384._0_8_ = *(ulong *)(lVar161 + 0x10 + lVar163);
                auVar166 = vinsertps_avx512f(auVar384,ZEXT416(*(uint *)(lVar161 + 8 + lVar163)),0x20
                                            );
                auVar387._8_8_ = 0;
                auVar387._0_8_ = *(ulong *)(lVar161 + 0x34 + lVar163);
                auVar167 = vpermt2ps_avx512vl(auVar387,_DAT_02060e90,
                                              ZEXT416(*(uint *)(lVar161 + lVar163)));
                auVar391._8_8_ = 0;
                auVar391._0_8_ = *(ulong *)(lVar161 + 0x1c + lVar163);
                auVar171 = vpermt2ps_avx512vl(auVar391,_DAT_02060e90,
                                              ZEXT416(*(uint *)(lVar161 + 0x18 + lVar163)));
                uVar4 = *(uint *)(lVar161 + 0x24 + lVar163);
                uVar158 = *(uint *)(lVar161 + 0x28 + lVar163);
                local_140 = *(uint *)(lVar161 + 0x2c + lVar163);
                local_160 = *(float *)(lVar161 + 0x30 + lVar163);
                auVar168 = vmulss_avx512f(ZEXT416(uVar158),ZEXT416(uVar158));
                auVar168 = vfmadd231ss_avx512f(auVar168,ZEXT416(uVar4),ZEXT416(uVar4));
                auVar168 = vfmadd231ss_avx512f(auVar168,ZEXT416(local_140),ZEXT416(local_140));
                auVar169 = ZEXT416((uint)local_160);
                auVar168 = vfmadd231ss_avx512f(auVar168,auVar169,auVar169);
                auVar205._0_16_ = vxorps_avx512vl(auVar169,auVar169);
                auVar204._4_28_ = auVar205._4_28_;
                auVar204._0_4_ = auVar168._0_4_;
                auVar169 = vrsqrt14ss_avx512f(auVar205._0_16_,auVar204._0_16_);
                auVar170 = vmulss_avx512f(auVar169,ZEXT416(0x3fc00000));
                auVar168 = vmulss_avx512f(auVar168,ZEXT416(0xbf000000));
                auVar168 = vmulss_avx512f(auVar169,auVar168);
                auVar169 = vmulss_avx512f(auVar169,auVar169);
                auVar168 = vmulss_avx512f(auVar169,auVar168);
                auVar189 = vbroadcastss_avx512vl(ZEXT416(2));
                auVar393 = ZEXT3264(auVar189);
                auVar168 = vaddss_avx512f(auVar170,auVar168);
                auVar169 = vmulss_avx512f(ZEXT416(uVar4),auVar168);
                auVar171 = vinsertps_avx512f(auVar171,auVar169,0x30);
                local_240 = ZEXT1632(auVar171);
                auVar171 = vmulss_avx512f(auVar168,ZEXT416(uVar158));
                auVar171 = vinsertps_avx512f(auVar167,auVar171,0x30);
                local_260 = ZEXT1632(auVar171);
                auVar171 = vmulss_avx512f(auVar168,ZEXT416(local_140));
                auVar167 = vmulss_avx512f(auVar168,ZEXT416((uint)local_160));
                auVar166 = vinsertps_avx512f(auVar166,auVar167,0x30);
                local_2a0 = ZEXT1632(auVar166);
                auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar161 + 0xc + lVar163)),
                                             ZEXT416(*(uint *)(lVar161 + 4 + lVar163)),0x10);
                auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar161 + 0x3c + lVar163)),
                                             0x20);
                auVar166 = vinsertps_avx512f(auVar166,auVar171,0x30);
                local_280 = ZEXT1632(auVar166);
              }
              else if (iVar5 == 0x9244) {
                lVar161 = *plVar1;
                lVar163 = plVar1[2] * uVar157;
                auVar171 = *(undefined1 (*) [16])(lVar161 + lVar163);
                auVar167 = *(undefined1 (*) [16])(lVar161 + 0x10 + lVar163);
                auVar168 = *(undefined1 (*) [16])(lVar161 + 0x20 + lVar163);
                auVar166 = *(undefined1 (*) [16])(lVar161 + 0x30 + lVar163);
                goto LAB_009c390d;
              }
            }
            auVar189 = vpbroadcastd_avx512vl();
            uVar18 = vpcmpeqd_avx512vl(auVar189,auVar172);
            iVar5 = *(int *)(lVar8 + 0x58 + lVar160);
            if (iVar5 == 0x9134) {
              lVar160 = plVar1[7];
              lVar161 = plVar1[9] * uVar157;
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar160 + lVar161)),
                                           ZEXT416(*(uint *)(lVar160 + 0x10 + lVar161)),0x1c);
              auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar160 + 0x20 + lVar161)),
                                           0x28);
              in_ZMM28 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar160 + 4 + lVar161)),
                                           ZEXT416(*(uint *)(lVar160 + 0x14 + lVar161)),0x1c);
              auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar160 + 0x24 + lVar161)),
                                           0x28);
              in_ZMM27 = ZEXT1664(auVar166);
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar160 + 8 + lVar161)),
                                           ZEXT416(*(uint *)(lVar160 + 0x18 + lVar161)),0x1c);
              auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar160 + 0x28 + lVar161)),
                                           0x28);
              local_2c0 = ZEXT1632(auVar166);
              auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar160 + 0xc + lVar161)),
                                           ZEXT416(*(uint *)(lVar160 + 0x1c + lVar161)),0x1c);
              auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar160 + 0x2c + lVar161)),
                                           0x28);
              in_ZMM30 = ZEXT1664(auVar166);
            }
            else {
              auVar207._16_16_ = auVar189._16_16_;
              if (iVar5 == 0x9234) {
                lVar160 = plVar1[7];
                lVar161 = plVar1[9] * uVar157;
                local_2c0._8_8_ = 0;
                local_2c0._0_8_ = *(ulong *)(lVar160 + 4 + lVar161);
                auVar166 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar160 + lVar161)),_DAT_02060e80,
                                              local_2c0._0_16_);
                auVar388._8_8_ = 0;
                auVar388._0_8_ = *(ulong *)(lVar160 + 0x10 + lVar161);
                auVar171 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar160 + 0xc + lVar161)),
                                              _DAT_02060e80,auVar388);
                in_ZMM27 = ZEXT1664(auVar171);
                auVar385._8_8_ = 0;
                auVar385._0_8_ = *(ulong *)(lVar160 + 0x1c + lVar161);
                auVar171 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar160 + 0x18 + lVar161)),
                                              _DAT_02060e80,auVar385);
                local_2c0 = ZEXT1632(auVar171);
                auVar386._8_8_ = 0;
                auVar386._0_8_ = *(ulong *)(lVar160 + 0x28 + lVar161);
                auVar171 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar160 + 0x24 + lVar161)),
                                              _DAT_02060e80,auVar386);
                in_ZMM30 = ZEXT1664(auVar171);
                in_ZMM28 = ZEXT1664(auVar166);
              }
              else if (iVar5 == 0xb001) {
                lVar160 = plVar1[7];
                lVar161 = plVar1[9] * uVar157;
                auVar382._8_8_ = 0;
                auVar382._0_8_ = *(ulong *)(lVar160 + 0x10 + lVar161);
                auVar166 = vinsertps_avx512f(auVar382,ZEXT416(*(uint *)(lVar160 + 8 + lVar161)),0x20
                                            );
                auVar389._8_8_ = 0;
                auVar389._0_8_ = *(ulong *)(lVar160 + 0x34 + lVar161);
                auVar167 = vpermt2ps_avx512vl(auVar389,_DAT_02060e90,
                                              ZEXT416(*(uint *)(lVar160 + lVar161)));
                auVar392._8_8_ = 0;
                auVar392._0_8_ = *(ulong *)(lVar160 + 0x1c + lVar161);
                auVar171 = vpermt2ps_avx512vl(auVar392,_DAT_02060e90,
                                              ZEXT416(*(uint *)(lVar160 + 0x18 + lVar161)));
                uVar4 = *(uint *)(lVar160 + 0x24 + lVar161);
                uVar158 = *(uint *)(lVar160 + 0x28 + lVar161);
                uVar2 = *(uint *)(lVar160 + 0x2c + lVar161);
                uVar3 = *(uint *)(lVar160 + 0x30 + lVar161);
                auVar168 = vmulss_avx512f(ZEXT416(uVar158),ZEXT416(uVar158));
                auVar168 = vfmadd231ss_avx512f(auVar168,ZEXT416(uVar4),ZEXT416(uVar4));
                auVar168 = vfmadd231ss_avx512f(auVar168,ZEXT416(uVar2),ZEXT416(uVar2));
                auVar169 = ZEXT416(uVar3);
                auVar168 = vfmadd231ss_avx512f(auVar168,auVar169,auVar169);
                auVar207._0_16_ = vxorps_avx512vl(auVar169,auVar169);
                auVar206._4_28_ = auVar207._4_28_;
                auVar206._0_4_ = auVar168._0_4_;
                auVar169 = vrsqrt14ss_avx512f(auVar207._0_16_,auVar206._0_16_);
                auVar170 = vmulss_avx512f(auVar169,ZEXT416(0x3fc00000));
                auVar168 = vmulss_avx512f(auVar168,ZEXT416(0xbf000000));
                auVar168 = vmulss_avx512f(auVar169,auVar168);
                auVar169 = vmulss_avx512f(auVar169,auVar169);
                auVar168 = vmulss_avx512f(auVar169,auVar168);
                auVar168 = vaddss_avx512f(auVar170,auVar168);
                auVar169 = vmulss_avx512f(ZEXT416(uVar4),auVar168);
                auVar171 = vinsertps_avx512f(auVar171,auVar169,0x30);
                in_ZMM30 = ZEXT1664(auVar171);
                auVar189 = vbroadcastss_avx512vl(ZEXT416(2));
                auVar393 = ZEXT3264(auVar189);
                auVar171 = vmulss_avx512f(auVar168,ZEXT416(uVar158));
                auVar171 = vinsertps_avx512f(auVar167,auVar171,0x30);
                in_ZMM28 = ZEXT1664(auVar171);
                auVar171 = vmulss_avx512f(auVar168,ZEXT416(uVar2));
                auVar167 = vmulss_avx512f(auVar168,ZEXT416(uVar3));
                auVar166 = vinsertps_avx512f(auVar166,auVar167,0x30);
                local_2c0 = ZEXT1632(auVar166);
                auVar166 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar160 + 0xc + lVar161)),
                                             ZEXT416(*(uint *)(lVar160 + 4 + lVar161)),0x10);
                auVar166 = vinsertps_avx512f(auVar166,ZEXT416(*(uint *)(lVar160 + 0x3c + lVar161)),
                                             0x20);
                auVar166 = vinsertps_avx512f(auVar166,auVar171,0x30);
                in_ZMM27 = ZEXT1664(auVar166);
              }
              else {
                in_ZMM28 = ZEXT3264(in_ZMM28._0_32_);
                in_ZMM27 = ZEXT3264(in_ZMM27._0_32_);
                in_ZMM30 = ZEXT3264(in_ZMM30._0_32_);
                if (iVar5 == 0x9244) {
                  lVar160 = plVar1[7];
                  lVar161 = plVar1[9] * uVar157;
                  in_ZMM28 = ZEXT1664(*(undefined1 (*) [16])(lVar160 + lVar161));
                  in_ZMM27 = ZEXT1664(*(undefined1 (*) [16])(lVar160 + 0x10 + lVar161));
                  auVar166 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(lVar160 + 0x20 + lVar161));
                  local_2c0 = vmovdqa64_avx512vl(ZEXT1632(auVar166));
                  in_ZMM30 = ZEXT1664(*(undefined1 (*) [16])(lVar160 + 0x30 + lVar161));
                }
              }
            }
            bVar162 = (byte)uVar159 & (byte)uVar18;
            bVar156 = ~bVar162 & (byte)uVar159;
            uVar159 = (ulong)bVar156;
            auVar189 = vbroadcastss_avx512vl(local_260._0_16_);
            auVar208._0_4_ =
                 (uint)(bVar162 & 1) * auVar189._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM12._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar208._4_4_ = (uint)bVar9 * auVar189._4_4_ | (uint)!bVar9 * in_ZMM12._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar208._8_4_ = (uint)bVar9 * auVar189._8_4_ | (uint)!bVar9 * in_ZMM12._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar208._12_4_ = (uint)bVar9 * auVar189._12_4_ | (uint)!bVar9 * in_ZMM12._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar208._16_4_ = (uint)bVar9 * auVar189._16_4_ | (uint)!bVar9 * in_ZMM12._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar208._20_4_ = (uint)bVar9 * auVar189._20_4_ | (uint)!bVar9 * in_ZMM12._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar208._24_4_ = (uint)bVar9 * auVar189._24_4_ | (uint)!bVar9 * in_ZMM12._24_4_;
            auVar208._28_4_ =
                 (uint)(bVar162 >> 7) * auVar189._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM12._28_4_;
            in_ZMM12 = ZEXT3264(auVar208);
            auVar189 = vbroadcastss_avx512vl(ZEXT416(1));
            auVar190 = vpermps_avx512vl(auVar189,local_260);
            auVar209._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM11._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar209._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM11._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar209._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM11._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar209._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM11._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar209._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM11._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar209._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM11._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar209._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM11._24_4_;
            auVar209._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM11._28_4_;
            in_ZMM11 = ZEXT3264(auVar209);
            auVar191 = auVar393._0_32_;
            auVar190 = vpermps_avx512vl(auVar191,local_260);
            auVar176._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM10._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar176._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM10._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar176._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM10._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar176._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM10._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar176._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM10._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar176._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM10._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar176._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM10._24_4_;
            auVar176._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM10._28_4_;
            in_ZMM10 = ZEXT3264(auVar176);
            auVar190 = vbroadcastss_avx512vl(local_280._0_16_);
            auVar210._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM9._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar210._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM9._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar210._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM9._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar210._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM9._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar210._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM9._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar210._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM9._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar210._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM9._24_4_;
            auVar210._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM9._28_4_;
            in_ZMM9 = ZEXT3264(auVar210);
            auVar190 = vpermps_avx512vl(auVar189,local_280);
            auVar211._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM8._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar211._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM8._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar211._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM8._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar211._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM8._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar211._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM8._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar211._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM8._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar211._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM8._24_4_;
            auVar211._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM8._28_4_;
            in_ZMM8 = ZEXT3264(auVar211);
            auVar190 = vpermps_avx512vl(auVar191,local_280);
            auVar177._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM7._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar177._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM7._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar177._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM7._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar177._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM7._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar177._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM7._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar177._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM7._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar177._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM7._24_4_;
            auVar177._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM7._28_4_;
            in_ZMM7 = ZEXT3264(auVar177);
            auVar190 = vbroadcastss_avx512vl(local_2a0._0_16_);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            in_ZMM6 = ZEXT3264(CONCAT428((uint)(bVar162 >> 7) * auVar190._28_4_ |
                                         (uint)!(bool)(bVar162 >> 7) * in_ZMM6._28_4_,
                                         CONCAT424((uint)bVar14 * auVar190._24_4_ |
                                                   (uint)!bVar14 * in_ZMM6._24_4_,
                                                   CONCAT420((uint)bVar13 * auVar190._20_4_ |
                                                             (uint)!bVar13 * in_ZMM6._20_4_,
                                                             CONCAT416((uint)bVar12 *
                                                                       auVar190._16_4_ |
                                                                       (uint)!bVar12 *
                                                                       in_ZMM6._16_4_,
                                                                       CONCAT412((uint)bVar11 *
                                                                                 auVar190._12_4_ |
                                                                                 (uint)!bVar11 *
                                                                                 in_ZMM6._12_4_,
                                                                                 CONCAT48((uint)
                                                  bVar10 * auVar190._8_4_ |
                                                  (uint)!bVar10 * in_ZMM6._8_4_,
                                                  CONCAT44((uint)bVar9 * auVar190._4_4_ |
                                                           (uint)!bVar9 * in_ZMM6._4_4_,
                                                           (uint)(bVar162 & 1) * auVar190._0_4_ |
                                                           (uint)!(bool)(bVar162 & 1) *
                                                           in_ZMM6._0_4_))))))));
            auVar190 = vpermps_avx512vl(auVar189,local_2a0);
            auVar212._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM5._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar212._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM5._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar212._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM5._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar212._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM5._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar212._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM5._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar212._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM5._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar212._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM5._24_4_;
            auVar212._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM5._28_4_;
            in_ZMM5 = ZEXT3264(auVar212);
            auVar190 = vpermps_avx512vl(auVar191,local_2a0);
            auVar178._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM4._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar178._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM4._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar178._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM4._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar178._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM4._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar178._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM4._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar178._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM4._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar178._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM4._24_4_;
            auVar178._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM4._28_4_;
            in_ZMM4 = ZEXT3264(auVar178);
            auVar190 = vbroadcastss_avx512vl(local_240._0_16_);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            auVar303 = ZEXT3264(CONCAT428((uint)(bVar162 >> 7) * auVar190._28_4_ |
                                          (uint)!(bool)(bVar162 >> 7) * auVar303._28_4_,
                                          CONCAT424((uint)bVar14 * auVar190._24_4_ |
                                                    (uint)!bVar14 * auVar303._24_4_,
                                                    CONCAT420((uint)bVar13 * auVar190._20_4_ |
                                                              (uint)!bVar13 * auVar303._20_4_,
                                                              CONCAT416((uint)bVar12 *
                                                                        auVar190._16_4_ |
                                                                        (uint)!bVar12 *
                                                                        auVar303._16_4_,
                                                                        CONCAT412((uint)bVar11 *
                                                                                  auVar190._12_4_ |
                                                                                  (uint)!bVar11 *
                                                                                  auVar303._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar10 * auVar190._8_4_ |
                                                  (uint)!bVar10 * auVar303._8_4_,
                                                  CONCAT44((uint)bVar9 * auVar190._4_4_ |
                                                           (uint)!bVar9 * auVar303._4_4_,
                                                           (uint)(bVar162 & 1) * auVar190._0_4_ |
                                                           (uint)!(bool)(bVar162 & 1) *
                                                           auVar303._0_4_))))))));
            auVar190 = vpermps_avx512vl(auVar189,local_240);
            auVar213._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * auVar291._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar213._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * auVar291._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar213._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * auVar291._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar213._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * auVar291._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar213._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * auVar291._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar213._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * auVar291._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar213._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * auVar291._24_4_;
            auVar213._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * auVar291._28_4_;
            auVar291 = ZEXT3264(auVar213);
            auVar190 = vpermps_avx512vl(auVar191,local_240);
            auVar179._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * auVar173._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar179._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * auVar173._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar179._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * auVar173._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar179._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * auVar173._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar179._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * auVar173._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar179._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * auVar173._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar179._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * auVar173._24_4_;
            auVar179._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * auVar173._28_4_;
            auVar190 = vbroadcastss_avx512vl(in_ZMM28._0_16_);
            auVar180._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM24._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar180._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM24._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar180._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM24._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar180._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM24._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar180._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM24._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar180._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM24._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar180._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM24._24_4_;
            auVar180._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM24._28_4_;
            in_ZMM24 = ZEXT3264(auVar180);
            auVar190 = vpermps_avx512vl(auVar189,in_ZMM28._0_32_);
            auVar181._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM23._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar181._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM23._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar181._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM23._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar181._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM23._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar181._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM23._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar181._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM23._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar181._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM23._24_4_;
            auVar181._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM23._28_4_;
            in_ZMM23 = ZEXT3264(auVar181);
            auVar190 = vpermps_avx512vl(auVar191,in_ZMM28._0_32_);
            auVar182._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM22._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar182._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM22._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar182._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM22._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar182._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM22._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar182._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM22._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar182._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM22._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar182._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM22._24_4_;
            auVar182._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM22._28_4_;
            in_ZMM22 = ZEXT3264(auVar182);
            auVar190 = vbroadcastss_avx512vl(in_ZMM27._0_16_);
            auVar183._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM21._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar183._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM21._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar183._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM21._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar183._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM21._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar183._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM21._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar183._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM21._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar183._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM21._24_4_;
            auVar183._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM21._28_4_;
            in_ZMM21 = ZEXT3264(auVar183);
            auVar190 = vpermps_avx512vl(auVar189,in_ZMM27._0_32_);
            auVar184._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM20._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar184._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM20._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar184._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM20._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar184._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM20._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar184._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM20._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar184._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM20._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar184._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM20._24_4_;
            auVar184._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM20._28_4_;
            in_ZMM20 = ZEXT3264(auVar184);
            auVar190 = vpermps_avx512vl(auVar191,in_ZMM27._0_32_);
            auVar185._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM19._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar185._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM19._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar185._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM19._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar185._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM19._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar185._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM19._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar185._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM19._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar185._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM19._24_4_;
            auVar185._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM19._28_4_;
            in_ZMM19 = ZEXT3264(auVar185);
            auVar190 = vbroadcastss_avx512vl(local_2c0._0_16_);
            auVar186._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM18._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar186._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM18._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar186._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM18._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar186._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM18._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar186._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM18._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar186._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM18._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar186._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM18._24_4_;
            auVar186._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM18._28_4_;
            in_ZMM18 = ZEXT3264(auVar186);
            auVar190 = vpermps_avx512vl(auVar189,local_2c0);
            auVar187._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM17._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar187._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM17._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar187._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM17._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar187._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM17._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar187._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM17._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar187._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM17._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar187._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM17._24_4_;
            auVar187._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM17._28_4_;
            in_ZMM17 = ZEXT3264(auVar187);
            auVar190 = vpermps_avx512vl(auVar191,local_2c0);
            auVar188._0_4_ =
                 (uint)(bVar162 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar162 & 1) * in_ZMM16._0_4_;
            bVar9 = (bool)(bVar162 >> 1 & 1);
            auVar188._4_4_ = (uint)bVar9 * auVar190._4_4_ | (uint)!bVar9 * in_ZMM16._4_4_;
            bVar9 = (bool)(bVar162 >> 2 & 1);
            auVar188._8_4_ = (uint)bVar9 * auVar190._8_4_ | (uint)!bVar9 * in_ZMM16._8_4_;
            bVar9 = (bool)(bVar162 >> 3 & 1);
            auVar188._12_4_ = (uint)bVar9 * auVar190._12_4_ | (uint)!bVar9 * in_ZMM16._12_4_;
            bVar9 = (bool)(bVar162 >> 4 & 1);
            auVar188._16_4_ = (uint)bVar9 * auVar190._16_4_ | (uint)!bVar9 * in_ZMM16._16_4_;
            bVar9 = (bool)(bVar162 >> 5 & 1);
            auVar188._20_4_ = (uint)bVar9 * auVar190._20_4_ | (uint)!bVar9 * in_ZMM16._20_4_;
            bVar9 = (bool)(bVar162 >> 6 & 1);
            auVar188._24_4_ = (uint)bVar9 * auVar190._24_4_ | (uint)!bVar9 * in_ZMM16._24_4_;
            auVar188._28_4_ =
                 (uint)(bVar162 >> 7) * auVar190._28_4_ |
                 (uint)!(bool)(bVar162 >> 7) * in_ZMM16._28_4_;
            in_ZMM16 = ZEXT3264(auVar188);
            auVar190 = vbroadcastss_avx512vl(in_ZMM30._0_16_);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            in_ZMM15 = ZEXT3264(CONCAT428((uint)(bVar162 >> 7) * auVar190._28_4_ |
                                          (uint)!(bool)(bVar162 >> 7) * in_ZMM15._28_4_,
                                          CONCAT424((uint)bVar14 * auVar190._24_4_ |
                                                    (uint)!bVar14 * in_ZMM15._24_4_,
                                                    CONCAT420((uint)bVar13 * auVar190._20_4_ |
                                                              (uint)!bVar13 * in_ZMM15._20_4_,
                                                              CONCAT416((uint)bVar12 *
                                                                        auVar190._16_4_ |
                                                                        (uint)!bVar12 *
                                                                        in_ZMM15._16_4_,
                                                                        CONCAT412((uint)bVar11 *
                                                                                  auVar190._12_4_ |
                                                                                  (uint)!bVar11 *
                                                                                  in_ZMM15._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar10 * auVar190._8_4_ |
                                                  (uint)!bVar10 * in_ZMM15._8_4_,
                                                  CONCAT44((uint)bVar9 * auVar190._4_4_ |
                                                           (uint)!bVar9 * in_ZMM15._4_4_,
                                                           (uint)(bVar162 & 1) * auVar190._0_4_ |
                                                           (uint)!(bool)(bVar162 & 1) *
                                                           in_ZMM15._0_4_))))))));
            auVar189 = vpermps_avx512vl(auVar189,in_ZMM30._0_32_);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            in_ZMM14 = ZEXT3264(CONCAT428((uint)(bVar162 >> 7) * auVar189._28_4_ |
                                          (uint)!(bool)(bVar162 >> 7) * in_ZMM14._28_4_,
                                          CONCAT424((uint)bVar14 * auVar189._24_4_ |
                                                    (uint)!bVar14 * in_ZMM14._24_4_,
                                                    CONCAT420((uint)bVar13 * auVar189._20_4_ |
                                                              (uint)!bVar13 * in_ZMM14._20_4_,
                                                              CONCAT416((uint)bVar12 *
                                                                        auVar189._16_4_ |
                                                                        (uint)!bVar12 *
                                                                        in_ZMM14._16_4_,
                                                                        CONCAT412((uint)bVar11 *
                                                                                  auVar189._12_4_ |
                                                                                  (uint)!bVar11 *
                                                                                  in_ZMM14._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar10 * auVar189._8_4_ |
                                                  (uint)!bVar10 * in_ZMM14._8_4_,
                                                  CONCAT44((uint)bVar9 * auVar189._4_4_ |
                                                           (uint)!bVar9 * in_ZMM14._4_4_,
                                                           (uint)(bVar162 & 1) * auVar189._0_4_ |
                                                           (uint)!(bool)(bVar162 & 1) *
                                                           in_ZMM14._0_4_))))))));
            auVar189 = vpermps_avx512vl(auVar191,in_ZMM30._0_32_);
            bVar9 = (bool)(bVar162 >> 1 & 1);
            bVar10 = (bool)(bVar162 >> 2 & 1);
            bVar11 = (bool)(bVar162 >> 3 & 1);
            bVar12 = (bool)(bVar162 >> 4 & 1);
            bVar13 = (bool)(bVar162 >> 5 & 1);
            bVar14 = (bool)(bVar162 >> 6 & 1);
            in_ZMM13 = ZEXT3264(CONCAT428((uint)(bVar162 >> 7) * auVar189._28_4_ |
                                          (uint)!(bool)(bVar162 >> 7) * in_ZMM13._28_4_,
                                          CONCAT424((uint)bVar14 * auVar189._24_4_ |
                                                    (uint)!bVar14 * in_ZMM13._24_4_,
                                                    CONCAT420((uint)bVar13 * auVar189._20_4_ |
                                                              (uint)!bVar13 * in_ZMM13._20_4_,
                                                              CONCAT416((uint)bVar12 *
                                                                        auVar189._16_4_ |
                                                                        (uint)!bVar12 *
                                                                        in_ZMM13._16_4_,
                                                                        CONCAT412((uint)bVar11 *
                                                                                  auVar189._12_4_ |
                                                                                  (uint)!bVar11 *
                                                                                  in_ZMM13._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar10 * auVar189._8_4_ |
                                                  (uint)!bVar10 * in_ZMM13._8_4_,
                                                  CONCAT44((uint)bVar9 * auVar189._4_4_ |
                                                           (uint)!bVar9 * in_ZMM13._4_4_,
                                                           (uint)(bVar162 & 1) * auVar189._0_4_ |
                                                           (uint)!(bool)(bVar162 & 1) *
                                                           in_ZMM13._0_4_))))))));
            auVar173 = auVar179;
          } while (bVar156 != 0);
        }
        auVar172 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar172 = vsubps_avx512vl(auVar172,auVar200);
        auVar189 = vmulps_avx512vl(auVar200,auVar180);
        auVar190 = vmulps_avx512vl(auVar200,auVar181);
        auVar191 = vmulps_avx512vl(auVar200,auVar182);
        auVar189 = vfmadd231ps_avx512vl(auVar189,auVar172,auVar208);
        auVar190 = vfmadd231ps_avx512vl(auVar190,auVar172,auVar209);
        auVar191 = vfmadd231ps_avx512vl(auVar191,auVar172,auVar176);
        auVar192 = vmulps_avx512vl(auVar200,auVar183);
        auVar193 = vmulps_avx512vl(auVar200,auVar184);
        auVar173 = vmulps_avx512vl(auVar200,auVar185);
        auVar192 = vfmadd231ps_avx512vl(auVar192,auVar172,auVar210);
        auVar193 = vfmadd231ps_avx512vl(auVar193,auVar172,auVar211);
        auVar194 = vfmadd231ps_avx512vl(auVar173,auVar172,auVar177);
        auVar173 = vmulps_avx512vl(auVar200,auVar186);
        auVar195 = vmulps_avx512vl(auVar200,auVar187);
        auVar196 = vmulps_avx512vl(auVar200,auVar188);
        auVar173 = vfmadd231ps_avx512vl(auVar173,auVar172,in_ZMM6._0_32_);
        auVar195 = vfmadd231ps_avx512vl(auVar195,auVar172,auVar212);
        auVar196 = vfmadd231ps_avx512vl(auVar196,auVar172,auVar178);
        fVar259 = auVar200._0_4_;
        auVar378._0_4_ = in_ZMM15._0_4_ * fVar259;
        fVar267 = auVar200._4_4_;
        auVar378._4_4_ = in_ZMM15._4_4_ * fVar267;
        fVar268 = auVar200._8_4_;
        auVar378._8_4_ = in_ZMM15._8_4_ * fVar268;
        fVar269 = auVar200._12_4_;
        auVar378._12_4_ = in_ZMM15._12_4_ * fVar269;
        fVar270 = auVar200._16_4_;
        auVar378._16_4_ = in_ZMM15._16_4_ * fVar270;
        fVar271 = auVar200._20_4_;
        auVar378._20_4_ = in_ZMM15._20_4_ * fVar271;
        fVar272 = auVar200._24_4_;
        auVar378._28_36_ = in_ZMM15._28_36_;
        auVar378._24_4_ = in_ZMM15._24_4_ * fVar272;
        auVar376._0_4_ = in_ZMM14._0_4_ * fVar259;
        auVar376._4_4_ = in_ZMM14._4_4_ * fVar267;
        auVar376._8_4_ = in_ZMM14._8_4_ * fVar268;
        auVar376._12_4_ = in_ZMM14._12_4_ * fVar269;
        auVar376._16_4_ = in_ZMM14._16_4_ * fVar270;
        auVar376._20_4_ = in_ZMM14._20_4_ * fVar271;
        auVar376._28_36_ = in_ZMM14._28_36_;
        auVar376._24_4_ = in_ZMM14._24_4_ * fVar272;
        auVar393._0_4_ = in_ZMM13._0_4_ * fVar259;
        auVar393._4_4_ = in_ZMM13._4_4_ * fVar267;
        auVar393._8_4_ = in_ZMM13._8_4_ * fVar268;
        auVar393._12_4_ = in_ZMM13._12_4_ * fVar269;
        auVar393._16_4_ = in_ZMM13._16_4_ * fVar270;
        auVar393._20_4_ = in_ZMM13._20_4_ * fVar271;
        auVar393._28_36_ = in_ZMM13._28_36_;
        auVar393._24_4_ = in_ZMM13._24_4_ * fVar272;
        auVar197 = vfmadd231ps_avx512vl(auVar378._0_32_,auVar172,auVar303._0_32_);
        auVar198 = vfmadd231ps_avx512vl(auVar376._0_32_,auVar172,auVar213);
        auVar199 = vfmadd231ps_avx512vl(auVar393._0_32_,auVar172,auVar179);
        auVar58._4_4_ = auVar195._4_4_ * auVar194._4_4_;
        auVar58._0_4_ = auVar195._0_4_ * auVar194._0_4_;
        auVar58._8_4_ = auVar195._8_4_ * auVar194._8_4_;
        auVar58._12_4_ = auVar195._12_4_ * auVar194._12_4_;
        auVar58._16_4_ = auVar195._16_4_ * auVar194._16_4_;
        auVar58._20_4_ = auVar195._20_4_ * auVar194._20_4_;
        auVar58._24_4_ = auVar195._24_4_ * auVar194._24_4_;
        auVar58._28_4_ = auVar200._28_4_;
        auVar166 = vfmsub231ps_fma(auVar58,auVar193,auVar196);
        auVar291._0_4_ = auVar196._0_4_ * auVar192._0_4_;
        auVar291._4_4_ = auVar196._4_4_ * auVar192._4_4_;
        auVar291._8_4_ = auVar196._8_4_ * auVar192._8_4_;
        auVar291._12_4_ = auVar196._12_4_ * auVar192._12_4_;
        auVar291._16_4_ = auVar196._16_4_ * auVar192._16_4_;
        auVar291._20_4_ = auVar196._20_4_ * auVar192._20_4_;
        auVar291._28_36_ = auVar303._28_36_;
        auVar291._24_4_ = auVar196._24_4_ * auVar192._24_4_;
        auVar171 = vfmsub231ps_fma(auVar291._0_32_,auVar194,auVar173);
        auVar303._0_4_ = auVar193._0_4_ * auVar173._0_4_;
        auVar303._4_4_ = auVar193._4_4_ * auVar173._4_4_;
        auVar303._8_4_ = auVar193._8_4_ * auVar173._8_4_;
        auVar303._12_4_ = auVar193._12_4_ * auVar173._12_4_;
        auVar303._16_4_ = auVar193._16_4_ * auVar173._16_4_;
        auVar303._20_4_ = auVar193._20_4_ * auVar173._20_4_;
        auVar303._28_36_ = in_ZMM6._28_36_;
        auVar303._24_4_ = auVar193._24_4_ * auVar173._24_4_;
        auVar167 = vfmsub231ps_fma(auVar303._0_32_,auVar192,auVar195);
        auVar172 = vmulps_avx512vl(auVar190,auVar196);
        auVar200 = vfmsub231ps_avx512vl(auVar172,auVar195,auVar191);
        auVar172 = vmulps_avx512vl(auVar191,auVar173);
        auVar196 = vfmsub231ps_avx512vl(auVar172,auVar189,auVar196);
        auVar172 = vmulps_avx512vl(auVar189,auVar195);
        auVar173 = vfmsub231ps_avx512vl(auVar172,auVar190,auVar173);
        auVar172 = vmulps_avx512vl(auVar193,auVar191);
        auVar195 = vfmsub231ps_avx512vl(auVar172,auVar190,auVar194);
        auVar172 = vmulps_avx512vl(auVar194,auVar189);
        auVar201 = vfmsub231ps_avx512vl(auVar172,auVar191,auVar192);
        auVar172 = vmulps_avx512vl(auVar192,auVar190);
        auVar202 = vfmsub231ps_avx512vl(auVar172,auVar189,auVar193);
        auVar172 = vmulps_avx512vl(auVar191,ZEXT1632(auVar167));
        auVar172 = vfmadd231ps_avx512vl(auVar172,ZEXT1632(auVar171),auVar190);
        auVar203 = vfmadd231ps_avx512vl(auVar172,ZEXT1632(auVar166),auVar189);
        auVar172 = vdivps_avx(ZEXT1632(auVar166),auVar203);
        auVar189 = vdivps_avx(auVar200,auVar203);
        auVar190 = vdivps_avx(auVar195,auVar203);
        auVar191 = vdivps_avx(ZEXT1632(auVar171),auVar203);
        auVar192 = vdivps_avx(auVar196,auVar203);
        auVar200 = vdivps_avx(auVar201,auVar203);
        auVar193 = vdivps_avx(ZEXT1632(auVar167),auVar203);
        auVar173 = vdivps_avx(auVar173,auVar203);
        auVar195 = vdivps_avx(auVar202,auVar203);
        fVar259 = auVar199._0_4_;
        fVar267 = auVar199._4_4_;
        auVar59._4_4_ = fVar267 * auVar193._4_4_;
        auVar59._0_4_ = fVar259 * auVar193._0_4_;
        fVar268 = auVar199._8_4_;
        auVar59._8_4_ = fVar268 * auVar193._8_4_;
        fVar269 = auVar199._12_4_;
        auVar59._12_4_ = fVar269 * auVar193._12_4_;
        fVar270 = auVar199._16_4_;
        auVar59._16_4_ = fVar270 * auVar193._16_4_;
        fVar271 = auVar199._20_4_;
        auVar59._20_4_ = fVar271 * auVar193._20_4_;
        fVar272 = auVar199._24_4_;
        auVar59._24_4_ = fVar272 * auVar193._24_4_;
        auVar59._28_4_ = auVar202._28_4_;
        auVar60._4_4_ = fVar267 * auVar173._4_4_;
        auVar60._0_4_ = fVar259 * auVar173._0_4_;
        auVar60._8_4_ = fVar268 * auVar173._8_4_;
        auVar60._12_4_ = fVar269 * auVar173._12_4_;
        auVar60._16_4_ = fVar270 * auVar173._16_4_;
        auVar60._20_4_ = fVar271 * auVar173._20_4_;
        auVar60._24_4_ = fVar272 * auVar173._24_4_;
        auVar60._28_4_ = auVar203._28_4_;
        auVar61._4_4_ = fVar267 * auVar195._4_4_;
        auVar61._0_4_ = fVar259 * auVar195._0_4_;
        auVar61._8_4_ = fVar268 * auVar195._8_4_;
        auVar61._12_4_ = fVar269 * auVar195._12_4_;
        auVar61._16_4_ = fVar270 * auVar195._16_4_;
        auVar61._20_4_ = fVar271 * auVar195._20_4_;
        auVar61._24_4_ = fVar272 * auVar195._24_4_;
        auVar61._28_4_ = auVar194._28_4_;
        auVar166 = vfmadd231ps_fma(auVar59,auVar198,auVar191);
        auVar171 = vfmadd231ps_fma(auVar60,auVar198,auVar192);
        auVar167 = vfmadd231ps_fma(auVar61,auVar200,auVar198);
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar197,auVar172);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar197,auVar189);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar190,auVar197);
      }
      auVar354._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
      auVar354._8_4_ = auVar168._8_4_ ^ 0x80000000;
      auVar354._12_4_ = auVar168._12_4_ ^ 0x80000000;
      auVar354._16_4_ = 0x80000000;
      auVar354._20_4_ = 0x80000000;
      auVar354._24_4_ = 0x80000000;
      auVar354._28_4_ = 0x80000000;
      auVar342._0_8_ = auVar166._0_8_ ^ 0x8000000080000000;
      auVar342._8_4_ = auVar166._8_4_ ^ 0x80000000;
      auVar342._12_4_ = auVar166._12_4_ ^ 0x80000000;
      auVar342._16_4_ = 0x80000000;
      auVar342._20_4_ = 0x80000000;
      auVar342._24_4_ = 0x80000000;
      auVar342._28_4_ = 0x80000000;
      auVar348._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
      auVar348._8_4_ = auVar171._8_4_ ^ 0x80000000;
      auVar348._12_4_ = auVar171._12_4_ ^ 0x80000000;
      auVar348._16_4_ = 0x80000000;
      auVar348._20_4_ = 0x80000000;
      auVar348._24_4_ = 0x80000000;
      auVar348._28_4_ = 0x80000000;
      auVar194 = *(undefined1 (*) [32])ray;
      auVar196 = *(undefined1 (*) [32])(ray + 0x20);
      auVar197 = *(undefined1 (*) [32])(ray + 0x40);
      auVar198 = *(undefined1 (*) [32])(ray + 0x80);
      auVar199 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar201 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar166 = vfmadd231ps_fma(auVar354,auVar197,auVar193);
      auVar171 = vfmadd231ps_fma(auVar342,auVar197,auVar173);
      auVar167 = vfmadd231ps_fma(auVar348,auVar197,auVar195);
      auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar196,auVar191);
      auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar196,auVar192);
      auVar167 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar196,auVar200);
      auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar194,auVar172);
      auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar194,auVar189);
      *(undefined1 (*) [32])ray = ZEXT1632(auVar166);
      auVar166 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar194,auVar190);
      *(undefined1 (*) [32])(ray + 0x20) = ZEXT1632(auVar171);
      *(undefined1 (*) [32])(ray + 0x40) = ZEXT1632(auVar166);
      auVar193 = vmulps_avx512vl(auVar193,auVar201);
      auVar173 = vmulps_avx512vl(auVar173,auVar201);
      auVar195 = vmulps_avx512vl(auVar195,auVar201);
      auVar191 = vfmadd231ps_avx512vl(auVar193,auVar199,auVar191);
      auVar192 = vfmadd231ps_avx512vl(auVar173,auVar199,auVar192);
      auVar200 = vfmadd231ps_avx512vl(auVar195,auVar199,auVar200);
      auVar166 = vfmadd231ps_fma(auVar191,auVar198,auVar172);
      auVar171 = vfmadd231ps_fma(auVar192,auVar198,auVar189);
      auVar167 = vfmadd231ps_fma(auVar200,auVar198,auVar190);
      *(undefined1 (*) [32])(ray + 0x80) = ZEXT1632(auVar166);
      *(undefined1 (*) [32])(ray + 0xa0) = ZEXT1632(auVar171);
      *(undefined1 (*) [32])(ray + 0xc0) = ZEXT1632(auVar167);
      local_58 = context->args;
      local_180 = vpmovm2d_avx512vl(uVar155);
      local_60 = pRVar7;
      (**(code **)(local_68 + 0xe0))(local_180,local_68 + 0x58,ray);
      local_2a0._0_8_ = auVar194._0_8_;
      local_2a0._8_8_ = auVar194._8_8_;
      local_2a0._16_8_ = auVar194._16_8_;
      local_2a0._24_8_ = auVar194._24_8_;
      *(undefined8 *)ray = local_2a0._0_8_;
      *(undefined8 *)(ray + 8) = local_2a0._8_8_;
      *(undefined8 *)(ray + 0x10) = local_2a0._16_8_;
      *(undefined8 *)(ray + 0x18) = local_2a0._24_8_;
      local_280._0_8_ = auVar196._0_8_;
      local_280._8_8_ = auVar196._8_8_;
      local_280._16_8_ = auVar196._16_8_;
      local_280._24_8_ = auVar196._24_8_;
      *(undefined8 *)(ray + 0x20) = local_280._0_8_;
      *(undefined8 *)(ray + 0x28) = local_280._8_8_;
      *(undefined8 *)(ray + 0x30) = local_280._16_8_;
      *(undefined8 *)(ray + 0x38) = local_280._24_8_;
      local_260._0_8_ = auVar197._0_8_;
      local_260._8_8_ = auVar197._8_8_;
      local_260._16_8_ = auVar197._16_8_;
      local_260._24_8_ = auVar197._24_8_;
      *(undefined8 *)(ray + 0x40) = local_260._0_8_;
      *(undefined8 *)(ray + 0x48) = local_260._8_8_;
      *(undefined8 *)(ray + 0x50) = local_260._16_8_;
      *(undefined8 *)(ray + 0x58) = local_260._24_8_;
      local_220._0_8_ = auVar198._0_8_;
      local_220._8_8_ = auVar198._8_8_;
      local_220._16_8_ = auVar198._16_8_;
      local_220._24_8_ = auVar198._24_8_;
      *(undefined8 *)(ray + 0x80) = local_220._0_8_;
      *(undefined8 *)(ray + 0x88) = local_220._8_8_;
      *(undefined8 *)(ray + 0x90) = local_220._16_8_;
      *(undefined8 *)(ray + 0x98) = local_220._24_8_;
      local_2c0._0_8_ = auVar199._0_8_;
      local_2c0._8_8_ = auVar199._8_8_;
      local_2c0._16_8_ = auVar199._16_8_;
      local_2c0._24_8_ = auVar199._24_8_;
      *(undefined8 *)(ray + 0xa0) = local_2c0._0_8_;
      *(undefined8 *)(ray + 0xa8) = local_2c0._8_8_;
      *(undefined8 *)(ray + 0xb0) = local_2c0._16_8_;
      *(undefined8 *)(ray + 0xb8) = local_2c0._24_8_;
      local_240._0_8_ = auVar201._0_8_;
      local_240._8_8_ = auVar201._8_8_;
      local_240._16_8_ = auVar201._16_8_;
      local_240._24_8_ = auVar201._24_8_;
      *(undefined8 *)(ray + 0xc0) = local_240._0_8_;
      *(undefined8 *)(ray + 200) = local_240._8_8_;
      *(undefined8 *)(ray + 0xd0) = local_240._16_8_;
      *(undefined8 *)(ray + 0xd8) = local_240._24_8_;
      pRVar7->instID[0] = 0xffffffff;
      pRVar7->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }